

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Primitive PVar27;
  Geometry *pGVar28;
  __int_type_conflict _Var29;
  long lVar30;
  long lVar31;
  RTCFilterFunctionN p_Var32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  bool bVar93;
  bool bVar94;
  bool bVar95;
  bool bVar96;
  bool bVar97;
  bool bVar98;
  bool bVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  uint uVar110;
  uint uVar111;
  ulong uVar112;
  long lVar113;
  uint uVar114;
  long lVar115;
  long lVar116;
  ulong uVar117;
  ulong uVar118;
  byte bVar119;
  ulong uVar120;
  bool bVar121;
  float fVar122;
  float fVar153;
  float fVar154;
  __m128 a;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar155;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [60];
  float fVar159;
  float fVar193;
  float fVar194;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar197;
  float fVar198;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar195;
  float fVar196;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar168 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar199;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  float fVar222;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar223;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar206 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar211 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar224;
  float fVar243;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar246;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar247;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar262 [32];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [64];
  float fVar270;
  float fVar287;
  float fVar288;
  undefined1 auVar271 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar277 [32];
  float fVar289;
  undefined1 auVar272 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar281 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar310;
  float fVar312;
  float fVar316;
  float fVar319;
  float fVar323;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar314;
  float fVar317;
  float fVar320;
  float fVar321;
  float fVar324;
  float fVar325;
  float fVar327;
  undefined1 auVar303 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar318;
  float fVar322;
  float fVar326;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar328;
  float fVar337;
  float fVar338;
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar348;
  float fVar349;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar360;
  float fVar362;
  float fVar366;
  float fVar368;
  float fVar370;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar367;
  float fVar369;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar383;
  float fVar384;
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [64];
  undefined1 auVar393 [16];
  float fVar392;
  float fVar401;
  float fVar402;
  float fVar404;
  float fVar405;
  float fVar406;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar403;
  float fVar407;
  undefined1 auVar399 [32];
  undefined1 auVar409 [16];
  float fVar408;
  float fVar416;
  float fVar417;
  float fVar419;
  float fVar420;
  float fVar421;
  float in_register_0000151c;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar418;
  undefined1 auVar414 [32];
  float fVar422;
  float fVar423;
  undefined1 auVar424 [16];
  float fVar430;
  float fVar432;
  float fVar436;
  float fVar438;
  float fVar440;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  float fVar431;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar437;
  float fVar439;
  float fVar441;
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  float fVar442;
  undefined1 auVar429 [32];
  float fVar443;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar454;
  float in_register_0000159c;
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  float fVar455;
  undefined1 auVar456 [28];
  float fVar459;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float in_register_000015dc;
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_ba9;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  float local_ac8;
  float local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined8 *local_9a0;
  ulong local_998;
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint uStack_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  ulong local_5e0;
  undefined1 auStack_5d8 [24];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar286 [64];
  undefined1 auVar400 [64];
  undefined1 auVar415 [64];
  
  PVar27 = prim[1];
  uVar118 = (ulong)(byte)PVar27;
  lVar113 = uVar118 * 0x25;
  fVar224 = *(float *)(prim + lVar113 + 0x12);
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar163 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar132 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar163 = vsubps_avx(auVar163,*(undefined1 (*) [16])(prim + lVar113 + 6));
  auVar160._0_4_ = fVar224 * auVar163._0_4_;
  auVar160._4_4_ = fVar224 * auVar163._4_4_;
  auVar160._8_4_ = fVar224 * auVar163._8_4_;
  auVar160._12_4_ = fVar224 * auVar163._12_4_;
  auVar271._0_4_ = fVar224 * auVar132._0_4_;
  auVar271._4_4_ = fVar224 * auVar132._4_4_;
  auVar271._8_4_ = fVar224 * auVar132._8_4_;
  auVar271._12_4_ = fVar224 * auVar132._12_4_;
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 10)));
  auVar145._16_16_ = auVar132;
  auVar145._0_16_ = auVar163;
  lVar30 = uVar118 * 5;
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar30 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar30 + 10)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar212._16_16_ = auVar132;
  auVar212._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar212);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 10)));
  auVar232._16_16_ = auVar132;
  auVar232._0_16_ = auVar163;
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 6)));
  auVar34 = vcvtdq2ps_avx(auVar232);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 10)));
  auVar233._16_16_ = auVar132;
  auVar233._0_16_ = auVar163;
  lVar115 = (ulong)(byte)PVar27 * 0x10;
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar115 + 6)));
  auVar283 = vcvtdq2ps_avx(auVar233);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar115 + 10)));
  auVar301._16_16_ = auVar132;
  auVar301._0_16_ = auVar163;
  auVar35 = vcvtdq2ps_avx(auVar301);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar115 + uVar118 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar115 + uVar118 + 10)));
  auVar329._16_16_ = auVar132;
  auVar329._0_16_ = auVar163;
  auVar236 = vcvtdq2ps_avx(auVar329);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 10)));
  auVar352._16_16_ = auVar132;
  auVar352._0_16_ = auVar163;
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 10)));
  auVar36 = vcvtdq2ps_avx(auVar352);
  auVar374._16_16_ = auVar132;
  auVar374._0_16_ = auVar163;
  auVar180 = vcvtdq2ps_avx(auVar374);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 10)));
  auVar385._16_16_ = auVar132;
  auVar385._0_16_ = auVar163;
  auVar37 = vcvtdq2ps_avx(auVar385);
  auVar163 = vshufps_avx(auVar271,auVar271,0);
  auVar132 = vshufps_avx(auVar271,auVar271,0x55);
  auVar127 = vshufps_avx(auVar271,auVar271,0xaa);
  fVar224 = auVar127._0_4_;
  fVar159 = auVar127._4_4_;
  fVar241 = auVar127._8_4_;
  fVar195 = auVar127._12_4_;
  fVar242 = auVar132._0_4_;
  fVar197 = auVar132._4_4_;
  fVar243 = auVar132._8_4_;
  fVar198 = auVar132._12_4_;
  fVar244 = auVar163._0_4_;
  fVar245 = auVar163._4_4_;
  fVar246 = auVar163._8_4_;
  fVar247 = auVar163._12_4_;
  auVar410._0_4_ = fVar244 * auVar145._0_4_ + fVar242 * auVar33._0_4_ + fVar224 * auVar34._0_4_;
  auVar410._4_4_ = fVar245 * auVar145._4_4_ + fVar197 * auVar33._4_4_ + fVar159 * auVar34._4_4_;
  auVar410._8_4_ = fVar246 * auVar145._8_4_ + fVar243 * auVar33._8_4_ + fVar241 * auVar34._8_4_;
  auVar410._12_4_ = fVar247 * auVar145._12_4_ + fVar198 * auVar33._12_4_ + fVar195 * auVar34._12_4_;
  auVar410._16_4_ = fVar244 * auVar145._16_4_ + fVar242 * auVar33._16_4_ + fVar224 * auVar34._16_4_;
  auVar410._20_4_ = fVar245 * auVar145._20_4_ + fVar197 * auVar33._20_4_ + fVar159 * auVar34._20_4_;
  auVar410._24_4_ = fVar246 * auVar145._24_4_ + fVar243 * auVar33._24_4_ + fVar241 * auVar34._24_4_;
  auVar410._28_4_ = fVar198 + in_register_000015dc + in_register_0000151c;
  auVar394._0_4_ = fVar244 * auVar283._0_4_ + fVar242 * auVar35._0_4_ + fVar224 * auVar236._0_4_;
  auVar394._4_4_ = fVar245 * auVar283._4_4_ + fVar197 * auVar35._4_4_ + fVar159 * auVar236._4_4_;
  auVar394._8_4_ = fVar246 * auVar283._8_4_ + fVar243 * auVar35._8_4_ + fVar241 * auVar236._8_4_;
  auVar394._12_4_ = fVar247 * auVar283._12_4_ + fVar198 * auVar35._12_4_ + fVar195 * auVar236._12_4_
  ;
  auVar394._16_4_ = fVar244 * auVar283._16_4_ + fVar242 * auVar35._16_4_ + fVar224 * auVar236._16_4_
  ;
  auVar394._20_4_ = fVar245 * auVar283._20_4_ + fVar197 * auVar35._20_4_ + fVar159 * auVar236._20_4_
  ;
  auVar394._24_4_ = fVar246 * auVar283._24_4_ + fVar243 * auVar35._24_4_ + fVar241 * auVar236._24_4_
  ;
  auVar394._28_4_ = fVar198 + in_register_000015dc + in_register_0000159c;
  auVar277._0_4_ = fVar244 * auVar36._0_4_ + fVar242 * auVar180._0_4_ + auVar37._0_4_ * fVar224;
  auVar277._4_4_ = fVar245 * auVar36._4_4_ + fVar197 * auVar180._4_4_ + auVar37._4_4_ * fVar159;
  auVar277._8_4_ = fVar246 * auVar36._8_4_ + fVar243 * auVar180._8_4_ + auVar37._8_4_ * fVar241;
  auVar277._12_4_ = fVar247 * auVar36._12_4_ + fVar198 * auVar180._12_4_ + auVar37._12_4_ * fVar195;
  auVar277._16_4_ = fVar244 * auVar36._16_4_ + fVar242 * auVar180._16_4_ + auVar37._16_4_ * fVar224;
  auVar277._20_4_ = fVar245 * auVar36._20_4_ + fVar197 * auVar180._20_4_ + auVar37._20_4_ * fVar159;
  auVar277._24_4_ = fVar246 * auVar36._24_4_ + fVar243 * auVar180._24_4_ + auVar37._24_4_ * fVar241;
  auVar277._28_4_ = fVar247 + fVar198 + fVar195;
  auVar163 = vshufps_avx(auVar160,auVar160,0);
  auVar132 = vshufps_avx(auVar160,auVar160,0x55);
  auVar127 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar159 = auVar127._0_4_;
  fVar241 = auVar127._4_4_;
  fVar195 = auVar127._8_4_;
  fVar242 = auVar127._12_4_;
  fVar245 = auVar132._0_4_;
  fVar246 = auVar132._4_4_;
  fVar247 = auVar132._8_4_;
  fVar264 = auVar132._12_4_;
  fVar197 = auVar163._0_4_;
  fVar243 = auVar163._4_4_;
  fVar198 = auVar163._8_4_;
  fVar244 = auVar163._12_4_;
  fVar224 = auVar145._28_4_;
  auVar213._0_4_ = fVar197 * auVar145._0_4_ + fVar245 * auVar33._0_4_ + fVar159 * auVar34._0_4_;
  auVar213._4_4_ = fVar243 * auVar145._4_4_ + fVar246 * auVar33._4_4_ + fVar241 * auVar34._4_4_;
  auVar213._8_4_ = fVar198 * auVar145._8_4_ + fVar247 * auVar33._8_4_ + fVar195 * auVar34._8_4_;
  auVar213._12_4_ = fVar244 * auVar145._12_4_ + fVar264 * auVar33._12_4_ + fVar242 * auVar34._12_4_;
  auVar213._16_4_ = fVar197 * auVar145._16_4_ + fVar245 * auVar33._16_4_ + fVar159 * auVar34._16_4_;
  auVar213._20_4_ = fVar243 * auVar145._20_4_ + fVar246 * auVar33._20_4_ + fVar241 * auVar34._20_4_;
  auVar213._24_4_ = fVar198 * auVar145._24_4_ + fVar247 * auVar33._24_4_ + fVar195 * auVar34._24_4_;
  auVar213._28_4_ = fVar224 + auVar33._28_4_ + auVar34._28_4_;
  auVar175._0_4_ = fVar197 * auVar283._0_4_ + fVar245 * auVar35._0_4_ + fVar159 * auVar236._0_4_;
  auVar175._4_4_ = fVar243 * auVar283._4_4_ + fVar246 * auVar35._4_4_ + fVar241 * auVar236._4_4_;
  auVar175._8_4_ = fVar198 * auVar283._8_4_ + fVar247 * auVar35._8_4_ + fVar195 * auVar236._8_4_;
  auVar175._12_4_ = fVar244 * auVar283._12_4_ + fVar264 * auVar35._12_4_ + fVar242 * auVar236._12_4_
  ;
  auVar175._16_4_ = fVar197 * auVar283._16_4_ + fVar245 * auVar35._16_4_ + fVar159 * auVar236._16_4_
  ;
  auVar175._20_4_ = fVar243 * auVar283._20_4_ + fVar246 * auVar35._20_4_ + fVar241 * auVar236._20_4_
  ;
  auVar175._24_4_ = fVar198 * auVar283._24_4_ + fVar247 * auVar35._24_4_ + fVar195 * auVar236._24_4_
  ;
  auVar175._28_4_ = fVar224 + auVar34._28_4_ + auVar236._28_4_;
  auVar138._0_4_ = fVar197 * auVar36._0_4_ + fVar245 * auVar180._0_4_ + auVar37._0_4_ * fVar159;
  auVar138._4_4_ = fVar243 * auVar36._4_4_ + fVar246 * auVar180._4_4_ + auVar37._4_4_ * fVar241;
  auVar138._8_4_ = fVar198 * auVar36._8_4_ + fVar247 * auVar180._8_4_ + auVar37._8_4_ * fVar195;
  auVar138._12_4_ = fVar244 * auVar36._12_4_ + fVar264 * auVar180._12_4_ + auVar37._12_4_ * fVar242;
  auVar138._16_4_ = fVar197 * auVar36._16_4_ + fVar245 * auVar180._16_4_ + auVar37._16_4_ * fVar159;
  auVar138._20_4_ = fVar243 * auVar36._20_4_ + fVar246 * auVar180._20_4_ + auVar37._20_4_ * fVar241;
  auVar138._24_4_ = fVar198 * auVar36._24_4_ + fVar247 * auVar180._24_4_ + auVar37._24_4_ * fVar195;
  auVar138._28_4_ = fVar224 + auVar35._28_4_ + fVar242;
  auVar302._8_4_ = 0x7fffffff;
  auVar302._0_8_ = 0x7fffffff7fffffff;
  auVar302._12_4_ = 0x7fffffff;
  auVar302._16_4_ = 0x7fffffff;
  auVar302._20_4_ = 0x7fffffff;
  auVar302._24_4_ = 0x7fffffff;
  auVar302._28_4_ = 0x7fffffff;
  auVar330._8_4_ = 0x219392ef;
  auVar330._0_8_ = 0x219392ef219392ef;
  auVar330._12_4_ = 0x219392ef;
  auVar330._16_4_ = 0x219392ef;
  auVar330._20_4_ = 0x219392ef;
  auVar330._24_4_ = 0x219392ef;
  auVar330._28_4_ = 0x219392ef;
  auVar145 = vandps_avx(auVar410,auVar302);
  auVar145 = vcmpps_avx(auVar145,auVar330,1);
  auVar33 = vblendvps_avx(auVar410,auVar330,auVar145);
  auVar145 = vandps_avx(auVar394,auVar302);
  auVar145 = vcmpps_avx(auVar145,auVar330,1);
  auVar34 = vblendvps_avx(auVar394,auVar330,auVar145);
  auVar145 = vandps_avx(auVar277,auVar302);
  auVar145 = vcmpps_avx(auVar145,auVar330,1);
  auVar145 = vblendvps_avx(auVar277,auVar330,auVar145);
  auVar283 = vrcpps_avx(auVar33);
  fVar224 = auVar283._0_4_;
  fVar241 = auVar283._4_4_;
  auVar35._4_4_ = auVar33._4_4_ * fVar241;
  auVar35._0_4_ = auVar33._0_4_ * fVar224;
  fVar242 = auVar283._8_4_;
  auVar35._8_4_ = auVar33._8_4_ * fVar242;
  fVar243 = auVar283._12_4_;
  auVar35._12_4_ = auVar33._12_4_ * fVar243;
  fVar244 = auVar283._16_4_;
  auVar35._16_4_ = auVar33._16_4_ * fVar244;
  fVar245 = auVar283._20_4_;
  auVar35._20_4_ = auVar33._20_4_ * fVar245;
  fVar246 = auVar283._24_4_;
  auVar35._24_4_ = auVar33._24_4_ * fVar246;
  auVar35._28_4_ = auVar33._28_4_;
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = &DAT_3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar236 = vsubps_avx(auVar331,auVar35);
  fVar224 = fVar224 + fVar224 * auVar236._0_4_;
  fVar241 = fVar241 + fVar241 * auVar236._4_4_;
  fVar242 = fVar242 + fVar242 * auVar236._8_4_;
  fVar243 = fVar243 + fVar243 * auVar236._12_4_;
  fVar244 = fVar244 + fVar244 * auVar236._16_4_;
  fVar245 = fVar245 + fVar245 * auVar236._20_4_;
  fVar246 = fVar246 + fVar246 * auVar236._24_4_;
  auVar35 = vrcpps_avx(auVar34);
  fVar247 = auVar35._0_4_;
  fVar264 = auVar35._4_4_;
  auVar33._4_4_ = fVar264 * auVar34._4_4_;
  auVar33._0_4_ = fVar247 * auVar34._0_4_;
  fVar265 = auVar35._8_4_;
  auVar33._8_4_ = fVar265 * auVar34._8_4_;
  fVar266 = auVar35._12_4_;
  auVar33._12_4_ = fVar266 * auVar34._12_4_;
  fVar267 = auVar35._16_4_;
  auVar33._16_4_ = fVar267 * auVar34._16_4_;
  fVar268 = auVar35._20_4_;
  auVar33._20_4_ = fVar268 * auVar34._20_4_;
  fVar269 = auVar35._24_4_;
  auVar33._24_4_ = fVar269 * auVar34._24_4_;
  auVar33._28_4_ = auVar34._28_4_;
  auVar34 = vsubps_avx(auVar331,auVar33);
  fVar247 = fVar247 + fVar247 * auVar34._0_4_;
  fVar264 = fVar264 + fVar264 * auVar34._4_4_;
  fVar265 = fVar265 + fVar265 * auVar34._8_4_;
  fVar266 = fVar266 + fVar266 * auVar34._12_4_;
  fVar267 = fVar267 + fVar267 * auVar34._16_4_;
  fVar268 = fVar268 + fVar268 * auVar34._20_4_;
  fVar269 = fVar269 + fVar269 * auVar34._24_4_;
  auVar33 = vrcpps_avx(auVar145);
  fVar270 = auVar33._0_4_;
  fVar287 = auVar33._4_4_;
  auVar36._4_4_ = fVar287 * auVar145._4_4_;
  auVar36._0_4_ = fVar270 * auVar145._0_4_;
  fVar288 = auVar33._8_4_;
  auVar36._8_4_ = fVar288 * auVar145._8_4_;
  fVar289 = auVar33._12_4_;
  auVar36._12_4_ = fVar289 * auVar145._12_4_;
  fVar290 = auVar33._16_4_;
  auVar36._16_4_ = fVar290 * auVar145._16_4_;
  fVar292 = auVar33._20_4_;
  auVar36._20_4_ = fVar292 * auVar145._20_4_;
  fVar294 = auVar33._24_4_;
  auVar36._24_4_ = fVar294 * auVar145._24_4_;
  auVar36._28_4_ = auVar145._28_4_;
  auVar145 = vsubps_avx(auVar331,auVar36);
  fVar270 = fVar270 + fVar270 * auVar145._0_4_;
  fVar287 = fVar287 + fVar287 * auVar145._4_4_;
  fVar288 = fVar288 + fVar288 * auVar145._8_4_;
  fVar289 = fVar289 + fVar289 * auVar145._12_4_;
  fVar290 = fVar290 + fVar290 * auVar145._16_4_;
  fVar292 = fVar292 + fVar292 * auVar145._20_4_;
  fVar294 = fVar294 + fVar294 * auVar145._24_4_;
  auVar163 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar113 + 0x16)) *
                           *(float *)(prim + lVar113 + 0x1a)));
  auVar126 = vshufps_avx(auVar163,auVar163,0);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar163 = vpmovsxwd_avx(auVar163);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar118 * 7 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar132);
  auVar332._16_16_ = auVar132;
  auVar332._0_16_ = auVar163;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 6);
  auVar163 = vpmovsxwd_avx(auVar127);
  auVar145 = vcvtdq2ps_avx(auVar332);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 0xe);
  auVar132 = vpmovsxwd_avx(auVar134);
  auVar353._16_16_ = auVar132;
  auVar353._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar353);
  auVar33 = vsubps_avx(auVar33,auVar145);
  fVar159 = auVar126._0_4_;
  fVar195 = auVar126._4_4_;
  fVar197 = auVar126._8_4_;
  fVar198 = auVar126._12_4_;
  auVar333._0_4_ = auVar33._0_4_ * fVar159 + auVar145._0_4_;
  auVar333._4_4_ = auVar33._4_4_ * fVar195 + auVar145._4_4_;
  auVar333._8_4_ = auVar33._8_4_ * fVar197 + auVar145._8_4_;
  auVar333._12_4_ = auVar33._12_4_ * fVar198 + auVar145._12_4_;
  auVar333._16_4_ = auVar33._16_4_ * fVar159 + auVar145._16_4_;
  auVar333._20_4_ = auVar33._20_4_ * fVar195 + auVar145._20_4_;
  auVar333._24_4_ = auVar33._24_4_ * fVar197 + auVar145._24_4_;
  auVar333._28_4_ = auVar33._28_4_ + auVar145._28_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar163 = vpmovsxwd_avx(auVar126);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar118 * 9 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar133);
  auVar354._16_16_ = auVar132;
  auVar354._0_16_ = auVar163;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 6);
  auVar163 = vpmovsxwd_avx(auVar171);
  auVar145 = vcvtdq2ps_avx(auVar354);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 0xe);
  auVar132 = vpmovsxwd_avx(auVar10);
  auVar375._16_16_ = auVar132;
  auVar375._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar375);
  auVar33 = vsubps_avx(auVar33,auVar145);
  auVar355._0_4_ = auVar145._0_4_ + auVar33._0_4_ * fVar159;
  auVar355._4_4_ = auVar145._4_4_ + auVar33._4_4_ * fVar195;
  auVar355._8_4_ = auVar145._8_4_ + auVar33._8_4_ * fVar197;
  auVar355._12_4_ = auVar145._12_4_ + auVar33._12_4_ * fVar198;
  auVar355._16_4_ = auVar145._16_4_ + auVar33._16_4_ * fVar159;
  auVar355._20_4_ = auVar145._20_4_ + auVar33._20_4_ * fVar195;
  auVar355._24_4_ = auVar145._24_4_ + auVar33._24_4_ * fVar197;
  auVar355._28_4_ = auVar145._28_4_ + auVar33._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 6);
  auVar163 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar12);
  auVar376._16_16_ = auVar132;
  auVar376._0_16_ = auVar163;
  uVar112 = (ulong)(uint)((int)lVar30 << 2);
  lVar113 = uVar118 * 2 + uVar112;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar163 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar14);
  auVar145 = vcvtdq2ps_avx(auVar376);
  auVar386._16_16_ = auVar132;
  auVar386._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar386);
  auVar33 = vsubps_avx(auVar33,auVar145);
  auVar377._0_4_ = auVar145._0_4_ + auVar33._0_4_ * fVar159;
  auVar377._4_4_ = auVar145._4_4_ + auVar33._4_4_ * fVar195;
  auVar377._8_4_ = auVar145._8_4_ + auVar33._8_4_ * fVar197;
  auVar377._12_4_ = auVar145._12_4_ + auVar33._12_4_ * fVar198;
  auVar377._16_4_ = auVar145._16_4_ + auVar33._16_4_ * fVar159;
  auVar377._20_4_ = auVar145._20_4_ + auVar33._20_4_ * fVar195;
  auVar377._24_4_ = auVar145._24_4_ + auVar33._24_4_ * fVar197;
  auVar377._28_4_ = auVar145._28_4_ + auVar33._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar112 + 6);
  auVar163 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar112 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar16);
  auVar387._16_16_ = auVar132;
  auVar387._0_16_ = auVar163;
  auVar145 = vcvtdq2ps_avx(auVar387);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 6);
  auVar163 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar18);
  auVar395._16_16_ = auVar132;
  auVar395._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar395);
  auVar33 = vsubps_avx(auVar33,auVar145);
  auVar388._0_4_ = auVar145._0_4_ + auVar33._0_4_ * fVar159;
  auVar388._4_4_ = auVar145._4_4_ + auVar33._4_4_ * fVar195;
  auVar388._8_4_ = auVar145._8_4_ + auVar33._8_4_ * fVar197;
  auVar388._12_4_ = auVar145._12_4_ + auVar33._12_4_ * fVar198;
  auVar388._16_4_ = auVar145._16_4_ + auVar33._16_4_ * fVar159;
  auVar388._20_4_ = auVar145._20_4_ + auVar33._20_4_ * fVar195;
  auVar388._24_4_ = auVar145._24_4_ + auVar33._24_4_ * fVar197;
  auVar388._28_4_ = auVar145._28_4_ + auVar33._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 6);
  auVar163 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 0xe);
  auVar132 = vpmovsxwd_avx(auVar20);
  auVar396._16_16_ = auVar132;
  auVar396._0_16_ = auVar163;
  lVar113 = uVar118 + (ulong)(byte)PVar27 * 0x20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar163 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar22);
  auVar411._16_16_ = auVar132;
  auVar411._0_16_ = auVar163;
  auVar145 = vcvtdq2ps_avx(auVar396);
  auVar33 = vcvtdq2ps_avx(auVar411);
  auVar33 = vsubps_avx(auVar33,auVar145);
  auVar397._0_4_ = auVar145._0_4_ + auVar33._0_4_ * fVar159;
  auVar397._4_4_ = auVar145._4_4_ + auVar33._4_4_ * fVar195;
  auVar397._8_4_ = auVar145._8_4_ + auVar33._8_4_ * fVar197;
  auVar397._12_4_ = auVar145._12_4_ + auVar33._12_4_ * fVar198;
  auVar397._16_4_ = auVar145._16_4_ + auVar33._16_4_ * fVar159;
  auVar397._20_4_ = auVar145._20_4_ + auVar33._20_4_ * fVar195;
  auVar397._24_4_ = auVar145._24_4_ + auVar33._24_4_ * fVar197;
  auVar397._28_4_ = auVar145._28_4_ + auVar33._28_4_;
  lVar113 = (ulong)(byte)PVar27 * 0x20 - uVar118;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar163 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 6);
  auVar127 = vpmovsxwd_avx(auVar25);
  auVar412._16_16_ = auVar132;
  auVar412._0_16_ = auVar163;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 0xe);
  auVar163 = vpmovsxwd_avx(auVar26);
  auVar425._16_16_ = auVar163;
  auVar425._0_16_ = auVar127;
  auVar145 = vcvtdq2ps_avx(auVar412);
  auVar33 = vcvtdq2ps_avx(auVar425);
  auVar33 = vsubps_avx(auVar33,auVar145);
  auVar413._0_4_ = auVar145._0_4_ + auVar33._0_4_ * fVar159;
  auVar413._4_4_ = auVar145._4_4_ + auVar33._4_4_ * fVar195;
  auVar413._8_4_ = auVar145._8_4_ + auVar33._8_4_ * fVar197;
  auVar413._12_4_ = auVar145._12_4_ + auVar33._12_4_ * fVar198;
  auVar413._16_4_ = auVar145._16_4_ + auVar33._16_4_ * fVar159;
  auVar413._20_4_ = auVar145._20_4_ + auVar33._20_4_ * fVar195;
  auVar413._24_4_ = auVar145._24_4_ + auVar33._24_4_ * fVar197;
  auVar413._28_4_ = auVar145._28_4_ + fVar198;
  auVar145 = vsubps_avx(auVar333,auVar213);
  auVar298._0_4_ = fVar224 * auVar145._0_4_;
  auVar298._4_4_ = fVar241 * auVar145._4_4_;
  auVar298._8_4_ = fVar242 * auVar145._8_4_;
  auVar298._12_4_ = fVar243 * auVar145._12_4_;
  auVar180._16_4_ = fVar244 * auVar145._16_4_;
  auVar180._0_16_ = auVar298;
  auVar180._20_4_ = fVar245 * auVar145._20_4_;
  auVar180._24_4_ = fVar246 * auVar145._24_4_;
  auVar180._28_4_ = auVar145._28_4_;
  auVar145 = vsubps_avx(auVar355,auVar213);
  auVar225._0_4_ = fVar224 * auVar145._0_4_;
  auVar225._4_4_ = fVar241 * auVar145._4_4_;
  auVar225._8_4_ = fVar242 * auVar145._8_4_;
  auVar225._12_4_ = fVar243 * auVar145._12_4_;
  auVar37._16_4_ = fVar244 * auVar145._16_4_;
  auVar37._0_16_ = auVar225;
  auVar37._20_4_ = fVar245 * auVar145._20_4_;
  auVar37._24_4_ = fVar246 * auVar145._24_4_;
  auVar37._28_4_ = auVar283._28_4_ + auVar236._28_4_;
  auVar145 = vsubps_avx(auVar377,auVar175);
  auVar200._0_4_ = fVar247 * auVar145._0_4_;
  auVar200._4_4_ = fVar264 * auVar145._4_4_;
  auVar200._8_4_ = fVar265 * auVar145._8_4_;
  auVar200._12_4_ = fVar266 * auVar145._12_4_;
  auVar283._16_4_ = fVar267 * auVar145._16_4_;
  auVar283._0_16_ = auVar200;
  auVar283._20_4_ = fVar268 * auVar145._20_4_;
  auVar283._24_4_ = fVar269 * auVar145._24_4_;
  auVar283._28_4_ = auVar145._28_4_;
  auVar145 = vsubps_avx(auVar388,auVar175);
  auVar248._0_4_ = fVar247 * auVar145._0_4_;
  auVar248._4_4_ = fVar264 * auVar145._4_4_;
  auVar248._8_4_ = fVar265 * auVar145._8_4_;
  auVar248._12_4_ = fVar266 * auVar145._12_4_;
  auVar236._16_4_ = fVar267 * auVar145._16_4_;
  auVar236._0_16_ = auVar248;
  auVar236._20_4_ = fVar268 * auVar145._20_4_;
  auVar236._24_4_ = fVar269 * auVar145._24_4_;
  auVar236._28_4_ = auVar35._28_4_ + auVar34._28_4_;
  auVar145 = vsubps_avx(auVar397,auVar138);
  auVar161._0_4_ = fVar270 * auVar145._0_4_;
  auVar161._4_4_ = fVar287 * auVar145._4_4_;
  auVar161._8_4_ = fVar288 * auVar145._8_4_;
  auVar161._12_4_ = fVar289 * auVar145._12_4_;
  auVar34._16_4_ = fVar290 * auVar145._16_4_;
  auVar34._0_16_ = auVar161;
  auVar34._20_4_ = fVar292 * auVar145._20_4_;
  auVar34._24_4_ = fVar294 * auVar145._24_4_;
  auVar34._28_4_ = auVar145._28_4_;
  auVar145 = vsubps_avx(auVar413,auVar138);
  auVar123._0_4_ = fVar270 * auVar145._0_4_;
  auVar123._4_4_ = fVar287 * auVar145._4_4_;
  auVar123._8_4_ = fVar288 * auVar145._8_4_;
  auVar123._12_4_ = fVar289 * auVar145._12_4_;
  auVar38._16_4_ = fVar290 * auVar145._16_4_;
  auVar38._0_16_ = auVar123;
  auVar38._20_4_ = fVar292 * auVar145._20_4_;
  auVar38._24_4_ = fVar294 * auVar145._24_4_;
  auVar38._28_4_ = auVar145._28_4_;
  auVar163 = vpminsd_avx(auVar180._16_16_,auVar37._16_16_);
  auVar132 = vpminsd_avx(auVar298,auVar225);
  auVar356._16_16_ = auVar163;
  auVar356._0_16_ = auVar132;
  auVar163 = vpminsd_avx(auVar283._16_16_,auVar236._16_16_);
  auVar132 = vpminsd_avx(auVar200,auVar248);
  auVar398._16_16_ = auVar163;
  auVar398._0_16_ = auVar132;
  auVar145 = vmaxps_avx(auVar356,auVar398);
  auVar163 = vpminsd_avx(auVar34._16_16_,auVar38._16_16_);
  auVar132 = vpminsd_avx(auVar161,auVar123);
  auVar426._16_16_ = auVar163;
  auVar426._0_16_ = auVar132;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar444._4_4_ = uVar8;
  auVar444._0_4_ = uVar8;
  auVar444._8_4_ = uVar8;
  auVar444._12_4_ = uVar8;
  auVar444._16_4_ = uVar8;
  auVar444._20_4_ = uVar8;
  auVar444._24_4_ = uVar8;
  auVar444._28_4_ = uVar8;
  auVar33 = vmaxps_avx(auVar426,auVar444);
  auVar145 = vmaxps_avx(auVar145,auVar33);
  local_2c0._4_4_ = auVar145._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar145._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar145._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar145._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar145._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar145._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar145._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar145._28_4_;
  auVar163 = vpmaxsd_avx(auVar180._16_16_,auVar37._16_16_);
  auVar132 = vpmaxsd_avx(auVar298,auVar225);
  auVar234._16_16_ = auVar163;
  auVar234._0_16_ = auVar132;
  auVar163 = vpmaxsd_avx(auVar283._16_16_,auVar236._16_16_);
  auVar132 = vpmaxsd_avx(auVar200,auVar248);
  auVar214._16_16_ = auVar163;
  auVar214._0_16_ = auVar132;
  auVar145 = vminps_avx(auVar234,auVar214);
  auVar163 = vpmaxsd_avx(auVar34._16_16_,auVar38._16_16_);
  auVar132 = vpmaxsd_avx(auVar161,auVar123);
  auVar139._16_16_ = auVar163;
  auVar139._0_16_ = auVar132;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar176._4_4_ = uVar8;
  auVar176._0_4_ = uVar8;
  auVar176._8_4_ = uVar8;
  auVar176._12_4_ = uVar8;
  auVar176._16_4_ = uVar8;
  auVar176._20_4_ = uVar8;
  auVar176._24_4_ = uVar8;
  auVar176._28_4_ = uVar8;
  auVar33 = vminps_avx(auVar139,auVar176);
  auVar145 = vminps_avx(auVar145,auVar33);
  auVar237._4_4_ = auVar145._4_4_ * 1.0000004;
  auVar237._0_4_ = auVar145._0_4_ * 1.0000004;
  auVar237._8_4_ = auVar145._8_4_ * 1.0000004;
  auVar237._12_4_ = auVar145._12_4_ * 1.0000004;
  auVar237._16_4_ = auVar145._16_4_ * 1.0000004;
  auVar237._20_4_ = auVar145._20_4_ * 1.0000004;
  auVar237._24_4_ = auVar145._24_4_ * 1.0000004;
  auVar237._28_4_ = auVar145._28_4_;
  auVar145 = vcmpps_avx(local_2c0,auVar237,2);
  auVar163 = vpshufd_avx(ZEXT116((byte)PVar27),0);
  auVar177._16_16_ = auVar163;
  auVar177._0_16_ = auVar163;
  auVar33 = vcvtdq2ps_avx(auVar177);
  auVar33 = vcmpps_avx(_DAT_02020f40,auVar33,1);
  auVar145 = vandps_avx(auVar145,auVar33);
  uVar110 = vmovmskps_avx(auVar145);
  local_ba9 = uVar110 != 0;
  if (uVar110 == 0) {
    return local_ba9;
  }
  auVar140._16_16_ = mm_lookupmask_ps._240_16_;
  auVar140._0_16_ = mm_lookupmask_ps._240_16_;
  uVar110 = uVar110 & 0xff;
  local_4a0 = vblendps_avx(auVar140,ZEXT832(0) << 0x20,0x80);
  local_9a0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f0 = prim;
LAB_0121b8b8:
  local_7e8 = (ulong)uVar110;
  lVar113 = 0;
  if (local_7e8 != 0) {
    for (; (uVar110 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
    }
  }
  uVar120 = (ulong)*(uint *)(local_7f0 + 2);
  pGVar28 = (context->scene->geometries).items[uVar120].ptr;
  uVar118 = (ulong)*(uint *)(*(long *)&pGVar28->field_0x58 +
                            (ulong)*(uint *)(local_7f0 + lVar113 * 4 + 6) *
                            pGVar28[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar224 = (pGVar28->time_range).lower;
  fVar224 = pGVar28->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar224) / ((pGVar28->time_range).upper - fVar224));
  auVar163 = vroundss_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),9);
  auVar163 = vminss_avx(auVar163,ZEXT416((uint)(pGVar28->fnumTimeSegments + -1.0)));
  auVar163 = vmaxss_avx(ZEXT816(0) << 0x20,auVar163);
  fVar224 = fVar224 - auVar163._0_4_;
  _Var29 = pGVar28[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar116 = (long)(int)auVar163._0_4_ * 0x38;
  lVar30 = *(long *)(_Var29 + 0x10 + lVar116);
  lVar115 = *(long *)(_Var29 + 0x38 + lVar116);
  lVar31 = *(long *)(_Var29 + 0x48 + lVar116);
  auVar163 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
  pfVar1 = (float *)(lVar115 + uVar118 * lVar31);
  fVar197 = auVar163._0_4_;
  fVar243 = auVar163._4_4_;
  fVar198 = auVar163._8_4_;
  fVar244 = auVar163._12_4_;
  pfVar2 = (float *)(lVar115 + (uVar118 + 1) * lVar31);
  pfVar3 = (float *)(lVar115 + (uVar118 + 2) * lVar31);
  pfVar4 = (float *)(lVar115 + lVar31 * (uVar118 + 3));
  lVar115 = *(long *)(_Var29 + lVar116);
  auVar163 = vshufps_avx(ZEXT416((uint)(1.0 - fVar224)),ZEXT416((uint)(1.0 - fVar224)),0);
  pfVar5 = (float *)(lVar115 + lVar30 * uVar118);
  fVar159 = auVar163._0_4_;
  fVar241 = auVar163._4_4_;
  fVar195 = auVar163._8_4_;
  fVar242 = auVar163._12_4_;
  pfVar6 = (float *)(lVar115 + lVar30 * (uVar118 + 1));
  pfVar7 = (float *)(lVar115 + lVar30 * (uVar118 + 2));
  auVar201._0_4_ = fVar197 * *pfVar1 + fVar159 * *pfVar5;
  auVar201._4_4_ = fVar243 * pfVar1[1] + fVar241 * pfVar5[1];
  auVar201._8_4_ = fVar198 * pfVar1[2] + fVar195 * pfVar5[2];
  auVar201._12_4_ = fVar244 * pfVar1[3] + fVar242 * pfVar5[3];
  auVar162._0_4_ = fVar159 * *pfVar6 + fVar197 * *pfVar2;
  auVar162._4_4_ = fVar241 * pfVar6[1] + fVar243 * pfVar2[1];
  auVar162._8_4_ = fVar195 * pfVar6[2] + fVar198 * pfVar2[2];
  auVar162._12_4_ = fVar242 * pfVar6[3] + fVar244 * pfVar2[3];
  pfVar1 = (float *)(lVar115 + lVar30 * (uVar118 + 3));
  auVar226._0_4_ = fVar159 * *pfVar7 + fVar197 * *pfVar3;
  auVar226._4_4_ = fVar241 * pfVar7[1] + fVar243 * pfVar3[1];
  auVar226._8_4_ = fVar195 * pfVar7[2] + fVar198 * pfVar3[2];
  auVar226._12_4_ = fVar242 * pfVar7[3] + fVar244 * pfVar3[3];
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar132 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar224 = *(float *)(ray + k * 4 + 0x40);
  auVar393._4_4_ = fVar224;
  auVar393._0_4_ = fVar224;
  auVar393._8_4_ = fVar224;
  auVar393._12_4_ = fVar224;
  fStack_790 = fVar224;
  _local_7a0 = auVar393;
  fStack_78c = fVar224;
  fStack_788 = fVar224;
  fStack_784 = fVar224;
  auVar400 = ZEXT3264(_local_7a0);
  auVar272._0_4_ = fVar159 * *pfVar1 + fVar197 * *pfVar4;
  auVar272._4_4_ = fVar241 * pfVar1[1] + fVar243 * pfVar4[1];
  auVar272._8_4_ = fVar195 * pfVar1[2] + fVar198 * pfVar4[2];
  auVar272._12_4_ = fVar242 * pfVar1[3] + fVar244 * pfVar4[3];
  auVar286 = ZEXT1664(auVar272);
  fVar159 = *(float *)(ray + k * 4 + 0x50);
  auVar409._4_4_ = fVar159;
  auVar409._0_4_ = fVar159;
  auVar409._8_4_ = fVar159;
  auVar409._12_4_ = fVar159;
  fStack_a30 = fVar159;
  _local_a40 = auVar409;
  fStack_a2c = fVar159;
  fStack_a28 = fVar159;
  fStack_a24 = fVar159;
  auVar415 = ZEXT3264(_local_a40);
  auVar163 = vunpcklps_avx(auVar393,auVar409);
  fVar241 = *(float *)(ray + k * 4 + 0x60);
  auVar424._4_4_ = fVar241;
  auVar424._0_4_ = fVar241;
  auVar424._8_4_ = fVar241;
  auVar424._12_4_ = fVar241;
  fStack_930 = fVar241;
  _local_940 = auVar424;
  fStack_92c = fVar241;
  fStack_928 = fVar241;
  fStack_924 = fVar241;
  _local_8f0 = vinsertps_avx(auVar163,auVar424,0x28);
  auVar379 = ZEXT1664(_local_8f0);
  auVar124._0_4_ = (auVar201._0_4_ + auVar162._0_4_ + auVar226._0_4_ + auVar272._0_4_) * 0.25;
  auVar124._4_4_ = (auVar201._4_4_ + auVar162._4_4_ + auVar226._4_4_ + auVar272._4_4_) * 0.25;
  auVar124._8_4_ = (auVar201._8_4_ + auVar162._8_4_ + auVar226._8_4_ + auVar272._8_4_) * 0.25;
  auVar124._12_4_ = (auVar201._12_4_ + auVar162._12_4_ + auVar226._12_4_ + auVar272._12_4_) * 0.25;
  auVar163 = vsubps_avx(auVar124,auVar132);
  auVar163 = vdpps_avx(auVar163,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar391 = ZEXT1664(local_900);
  auVar127 = vrcpss_avx(local_900,local_900);
  fVar195 = auVar163._0_4_ * auVar127._0_4_ * (2.0 - local_900._0_4_ * auVar127._0_4_);
  auVar336 = ZEXT464((uint)fVar195);
  auVar127 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
  auVar249._0_4_ = auVar132._0_4_ + local_8f0._0_4_ * auVar127._0_4_;
  auVar249._4_4_ = auVar132._4_4_ + local_8f0._4_4_ * auVar127._4_4_;
  auVar249._8_4_ = auVar132._8_4_ + local_8f0._8_4_ * auVar127._8_4_;
  auVar249._12_4_ = auVar132._12_4_ + local_8f0._12_4_ * auVar127._12_4_;
  auVar163 = vblendps_avx(auVar249,_DAT_01feba10,8);
  _local_a50 = vsubps_avx(auVar201,auVar163);
  auVar309 = ZEXT1664(_local_a50);
  _local_a60 = vsubps_avx(auVar226,auVar163);
  _local_a70 = vsubps_avx(auVar162,auVar163);
  _local_a80 = vsubps_avx(auVar272,auVar163);
  auVar163 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001250 = auVar163;
  _local_1a0 = auVar163;
  auVar163 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001250 = auVar163;
  _local_1c0 = auVar163;
  auVar163 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001250 = auVar163;
  _local_1e0 = auVar163;
  auVar163 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar163;
  _local_200 = auVar163;
  auVar163 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar163;
  _local_380 = auVar163;
  auVar163 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar163;
  _local_220 = auVar163;
  auVar163 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar163;
  _local_240 = auVar163;
  auVar163 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar163;
  _local_260 = auVar163;
  auVar163 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001290 = auVar163;
  _local_3a0 = auVar163;
  auVar163 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001290 = auVar163;
  _local_3c0 = auVar163;
  auVar163 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001290 = auVar163;
  _local_3e0 = auVar163;
  auVar163 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar163;
  _local_400 = auVar163;
  auVar163 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar163;
  _local_420 = auVar163;
  auVar163 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar163;
  _local_440 = auVar163;
  auVar163 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar163;
  _local_460 = auVar163;
  auVar163 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_480._16_16_ = auVar163;
  local_480._0_16_ = auVar163;
  auVar163 = ZEXT416((uint)(fVar224 * fVar224 + fVar159 * fVar159 + fVar241 * fVar241));
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  local_280._16_16_ = auVar163;
  local_280._0_16_ = auVar163;
  fVar224 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar195);
  auVar163 = vshufps_avx(ZEXT416((uint)(fVar224 - fVar195)),ZEXT416((uint)(fVar224 - fVar195)),0);
  local_2a0._16_16_ = auVar163;
  local_2a0._0_16_ = auVar163;
  local_6f0 = vpshufd_avx(ZEXT416(*(uint *)(local_7f0 + 2)),0);
  local_700 = vpshufd_avx(ZEXT416(*(uint *)(local_7f0 + lVar113 * 4 + 6)),0);
  register0x00001210 = auVar127;
  _local_920 = auVar127;
  uVar112 = 0;
  uVar117 = 0;
  uVar118 = 1;
  auVar141._8_4_ = 0x7fffffff;
  auVar141._0_8_ = 0x7fffffff7fffffff;
  auVar141._12_4_ = 0x7fffffff;
  auVar141._16_4_ = 0x7fffffff;
  auVar141._20_4_ = 0x7fffffff;
  auVar141._24_4_ = 0x7fffffff;
  auVar141._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_280,auVar141);
  auVar163 = vsqrtss_avx(local_900,local_900);
  local_ac4 = auVar163._0_4_;
  auVar163 = vsqrtss_avx(local_900,local_900);
  local_ac8 = auVar163._0_4_;
  local_800 = ZEXT816(0x3f80000000000000);
  auVar263 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_998 = uVar120;
  do {
    auVar163 = vmovshdup_avx(local_800);
    fVar244 = auVar163._0_4_ - local_800._0_4_;
    auVar163 = vshufps_avx(local_800,local_800,0);
    local_740._16_16_ = auVar163;
    local_740._0_16_ = auVar163;
    auVar132 = vshufps_avx(ZEXT416((uint)fVar244),ZEXT416((uint)fVar244),0);
    _fStack_750 = auVar132;
    _local_760 = auVar132;
    fVar442 = auVar132._0_4_;
    fVar193 = auVar132._4_4_;
    fVar194 = auVar132._8_4_;
    fVar196 = auVar132._12_4_;
    fVar199 = auVar163._0_4_;
    auVar235._0_4_ = fVar199 + fVar442 * 0.0;
    fVar221 = auVar163._4_4_;
    auVar235._4_4_ = fVar221 + fVar193 * 0.14285715;
    fVar222 = auVar163._8_4_;
    auVar235._8_4_ = fVar222 + fVar194 * 0.2857143;
    fVar223 = auVar163._12_4_;
    auVar235._12_4_ = fVar223 + fVar196 * 0.42857146;
    auVar235._16_4_ = fVar199 + fVar442 * 0.5714286;
    auVar235._20_4_ = fVar221 + fVar193 * 0.71428573;
    auVar235._24_4_ = fVar222 + fVar194 * 0.8571429;
    auVar235._28_4_ = fVar223 + fVar196;
    auVar145 = vsubps_avx(auVar263._0_32_,auVar235);
    fVar159 = auVar145._0_4_;
    fVar241 = auVar145._4_4_;
    fVar195 = auVar145._8_4_;
    fVar242 = auVar145._12_4_;
    fVar197 = auVar145._16_4_;
    fVar243 = auVar145._20_4_;
    fVar198 = auVar145._24_4_;
    fVar246 = fVar159 * fVar159 * fVar159;
    fVar269 = fVar241 * fVar241 * fVar241;
    fVar288 = fVar195 * fVar195 * fVar195;
    fVar290 = fVar242 * fVar242 * fVar242;
    fVar294 = fVar197 * fVar197 * fVar197;
    fVar319 = fVar243 * fVar243 * fVar243;
    fVar323 = fVar198 * fVar198 * fVar198;
    fVar328 = auVar235._0_4_ * auVar235._0_4_ * auVar235._0_4_;
    fVar337 = auVar235._4_4_ * auVar235._4_4_ * auVar235._4_4_;
    fVar338 = auVar235._8_4_ * auVar235._8_4_ * auVar235._8_4_;
    fVar340 = auVar235._12_4_ * auVar235._12_4_ * auVar235._12_4_;
    fVar342 = auVar235._16_4_ * auVar235._16_4_ * auVar235._16_4_;
    fVar344 = auVar235._20_4_ * auVar235._20_4_ * auVar235._20_4_;
    fVar346 = auVar235._24_4_ * auVar235._24_4_ * auVar235._24_4_;
    fVar245 = auVar235._0_4_ * fVar159;
    fVar264 = auVar235._4_4_ * fVar241;
    fVar265 = auVar235._8_4_ * fVar195;
    fVar266 = auVar235._12_4_ * fVar242;
    fVar267 = auVar235._16_4_ * fVar197;
    fVar268 = auVar235._20_4_ * fVar243;
    fVar270 = auVar235._24_4_ * fVar198;
    fVar247 = auVar391._28_4_ + auVar415._28_4_;
    fVar372 = auVar336._28_4_ + auVar286._28_4_ + fVar247;
    fVar383 = fVar247 + auVar309._28_4_ + auVar400._28_4_ + auVar379._28_4_;
    fVar247 = fVar246 * 0.16666667;
    fVar287 = fVar269 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar292 = fVar290 * 0.16666667;
    fVar316 = fVar294 * 0.16666667;
    fVar320 = fVar319 * 0.16666667;
    fVar324 = fVar323 * 0.16666667;
    fVar348 = (fVar328 + fVar246 * 4.0 + fVar159 * fVar245 * 12.0 + auVar235._0_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar360 = (fVar337 + fVar269 * 4.0 + fVar241 * fVar264 * 12.0 + auVar235._4_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar362 = (fVar338 + fVar288 * 4.0 + fVar195 * fVar265 * 12.0 + auVar235._8_4_ * fVar265 * 6.0)
              * 0.16666667;
    fVar364 = (fVar340 + fVar290 * 4.0 + fVar242 * fVar266 * 12.0 + auVar235._12_4_ * fVar266 * 6.0)
              * 0.16666667;
    fVar366 = (fVar342 + fVar294 * 4.0 + fVar197 * fVar267 * 12.0 + auVar235._16_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar368 = (fVar344 + fVar319 * 4.0 + fVar243 * fVar268 * 12.0 + auVar235._20_4_ * fVar268 * 6.0)
              * 0.16666667;
    fVar370 = (fVar346 + fVar323 * 4.0 + fVar198 * fVar270 * 12.0 + auVar235._24_4_ * fVar270 * 6.0)
              * 0.16666667;
    fVar246 = (fVar328 * 4.0 + fVar246 + auVar235._0_4_ * fVar245 * 12.0 + fVar159 * fVar245 * 6.0)
              * 0.16666667;
    fVar269 = (fVar337 * 4.0 + fVar269 + auVar235._4_4_ * fVar264 * 12.0 + fVar241 * fVar264 * 6.0)
              * 0.16666667;
    fVar288 = (fVar338 * 4.0 + fVar288 + auVar235._8_4_ * fVar265 * 12.0 + fVar195 * fVar265 * 6.0)
              * 0.16666667;
    fVar290 = (fVar340 * 4.0 + fVar290 + auVar235._12_4_ * fVar266 * 12.0 + fVar242 * fVar266 * 6.0)
              * 0.16666667;
    fVar294 = (fVar342 * 4.0 + fVar294 + auVar235._16_4_ * fVar267 * 12.0 + fVar197 * fVar267 * 6.0)
              * 0.16666667;
    fVar319 = (fVar344 * 4.0 + fVar319 + auVar235._20_4_ * fVar268 * 12.0 + fVar243 * fVar268 * 6.0)
              * 0.16666667;
    fVar323 = (fVar346 * 4.0 + fVar323 + auVar235._24_4_ * fVar270 * 12.0 + fVar198 * fVar270 * 6.0)
              * 0.16666667;
    fVar328 = fVar328 * 0.16666667;
    fVar337 = fVar337 * 0.16666667;
    fVar338 = fVar338 * 0.16666667;
    fVar340 = fVar340 * 0.16666667;
    fVar342 = fVar342 * 0.16666667;
    fVar344 = fVar344 * 0.16666667;
    fVar346 = fVar346 * 0.16666667;
    fVar407 = auVar400._28_4_ + 12.0;
    fVar384 = fVar383 + 12.166667;
    fVar349 = (float)local_1a0._0_4_ * fVar247 +
              fVar348 * (float)local_380._0_4_ +
              fVar328 * (float)local_420._0_4_ + fVar246 * (float)local_3a0._0_4_;
    fVar361 = (float)local_1a0._4_4_ * fVar287 +
              fVar360 * (float)local_380._4_4_ +
              fVar337 * (float)local_420._4_4_ + fVar269 * (float)local_3a0._4_4_;
    fVar363 = fStack_198 * fVar289 +
              fVar362 * fStack_378 + fVar338 * fStack_418 + fVar288 * fStack_398;
    fVar365 = fStack_194 * fVar292 +
              fVar364 * fStack_374 + fVar340 * fStack_414 + fVar290 * fStack_394;
    fVar367 = fStack_190 * fVar316 +
              fVar366 * fStack_370 + fVar342 * fStack_410 + fVar294 * fStack_390;
    fVar369 = fStack_18c * fVar320 +
              fVar368 * fStack_36c + fVar344 * fStack_40c + fVar319 * fStack_38c;
    fVar371 = fStack_188 * fVar324 +
              fVar370 * fStack_368 + fVar346 * fStack_408 + fVar323 * fStack_388;
    fVar373 = fVar372 + fVar384;
    local_880 = (float)local_1c0._0_4_ * fVar247 +
                (float)local_220._0_4_ * fVar348 +
                fVar328 * (float)local_440._0_4_ + fVar246 * (float)local_3c0._0_4_;
    fStack_87c = (float)local_1c0._4_4_ * fVar287 +
                 (float)local_220._4_4_ * fVar360 +
                 fVar337 * (float)local_440._4_4_ + fVar269 * (float)local_3c0._4_4_;
    fStack_878 = fStack_1b8 * fVar289 +
                 fStack_218 * fVar362 + fVar338 * fStack_438 + fVar288 * fStack_3b8;
    fStack_874 = fStack_1b4 * fVar292 +
                 fStack_214 * fVar364 + fVar340 * fStack_434 + fVar290 * fStack_3b4;
    fStack_870 = fStack_1b0 * fVar316 +
                 fStack_210 * fVar366 + fVar342 * fStack_430 + fVar294 * fStack_3b0;
    fStack_86c = fStack_1ac * fVar320 +
                 fStack_20c * fVar368 + fVar344 * fStack_42c + fVar319 * fStack_3ac;
    fStack_868 = fStack_1a8 * fVar324 +
                 fStack_208 * fVar370 + fVar346 * fStack_428 + fVar323 * fStack_3a8;
    fStack_864 = fVar373 + fVar407 + 12.166667;
    fVar122 = (float)local_1e0._0_4_ * fVar247 +
              (float)local_240._0_4_ * fVar348 +
              fVar328 * (float)local_460._0_4_ + fVar246 * (float)local_3e0._0_4_;
    fVar153 = (float)local_1e0._4_4_ * fVar287 +
              (float)local_240._4_4_ * fVar360 +
              fVar337 * (float)local_460._4_4_ + fVar269 * (float)local_3e0._4_4_;
    fVar154 = fStack_1d8 * fVar289 +
              fStack_238 * fVar362 + fVar338 * fStack_458 + fVar288 * fStack_3d8;
    fVar155 = fStack_1d4 * fVar292 +
              fStack_234 * fVar364 + fVar340 * fStack_454 + fVar290 * fStack_3d4;
    fVar156 = fStack_1d0 * fVar316 +
              fStack_230 * fVar366 + fVar342 * fStack_450 + fVar294 * fStack_3d0;
    fVar157 = fStack_1cc * fVar320 +
              fStack_22c * fVar368 + fVar344 * fStack_44c + fVar319 * fStack_3cc;
    fVar158 = fStack_1c8 * fVar324 +
              fStack_228 * fVar370 + fVar346 * fStack_448 + fVar323 * fStack_3c8;
    fVar407 = fStack_864 + fVar407 + auVar415._28_4_ + 12.0;
    local_ba0._0_4_ =
         (float)local_200._0_4_ * fVar247 +
         (float)local_260._0_4_ * fVar348 +
         fVar246 * (float)local_400._0_4_ + local_480._0_4_ * fVar328;
    local_ba0._4_4_ =
         (float)local_200._4_4_ * fVar287 +
         (float)local_260._4_4_ * fVar360 +
         fVar269 * (float)local_400._4_4_ + local_480._4_4_ * fVar337;
    fStack_b98 = fStack_1f8 * fVar289 +
                 fStack_258 * fVar362 + fVar288 * fStack_3f8 + local_480._8_4_ * fVar338;
    fStack_b94 = fStack_1f4 * fVar292 +
                 fStack_254 * fVar364 + fVar290 * fStack_3f4 + local_480._12_4_ * fVar340;
    fStack_b90 = fStack_1f0 * fVar316 +
                 fStack_250 * fVar366 + fVar294 * fStack_3f0 + local_480._16_4_ * fVar342;
    fStack_b8c = fStack_1ec * fVar320 +
                 fStack_24c * fVar368 + fVar319 * fStack_3ec + local_480._20_4_ * fVar344;
    fStack_b88 = fStack_1e8 * fVar324 +
                 fStack_248 * fVar370 + fVar323 * fStack_3e8 + local_480._24_4_ * fVar346;
    fStack_b84 = auVar309._28_4_ + fVar372 + fVar383 + auVar336._28_4_;
    auVar39._4_4_ = auVar235._4_4_ * -auVar235._4_4_;
    auVar39._0_4_ = auVar235._0_4_ * -auVar235._0_4_;
    auVar39._8_4_ = auVar235._8_4_ * -auVar235._8_4_;
    auVar39._12_4_ = auVar235._12_4_ * -auVar235._12_4_;
    auVar39._16_4_ = auVar235._16_4_ * -auVar235._16_4_;
    auVar39._20_4_ = auVar235._20_4_ * -auVar235._20_4_;
    auVar39._24_4_ = auVar235._24_4_ * -auVar235._24_4_;
    auVar39._28_4_ = auVar235._28_4_;
    auVar40._4_4_ = fVar264 * 4.0;
    auVar40._0_4_ = fVar245 * 4.0;
    auVar40._8_4_ = fVar265 * 4.0;
    auVar40._12_4_ = fVar266 * 4.0;
    auVar40._16_4_ = fVar267 * 4.0;
    auVar40._20_4_ = fVar268 * 4.0;
    auVar40._24_4_ = fVar270 * 4.0;
    auVar40._28_4_ = auVar286._28_4_;
    auVar145 = vsubps_avx(auVar39,auVar40);
    fVar289 = fVar159 * -fVar159 * 0.5;
    fVar320 = fVar241 * -fVar241 * 0.5;
    fVar323 = fVar195 * -fVar195 * 0.5;
    fVar324 = fVar242 * -fVar242 * 0.5;
    fVar328 = fVar197 * -fVar197 * 0.5;
    fVar338 = fVar243 * -fVar243 * 0.5;
    fVar340 = fVar198 * -fVar198 * 0.5;
    fVar247 = auVar145._0_4_ * 0.5;
    fVar287 = auVar145._4_4_ * 0.5;
    fVar288 = auVar145._8_4_ * 0.5;
    fVar290 = auVar145._12_4_ * 0.5;
    fVar292 = auVar145._16_4_ * 0.5;
    fVar294 = auVar145._20_4_ * 0.5;
    fVar316 = auVar145._24_4_ * 0.5;
    fVar246 = (fVar159 * fVar159 + fVar245 * 4.0) * 0.5;
    fVar264 = (fVar241 * fVar241 + fVar264 * 4.0) * 0.5;
    fVar265 = (fVar195 * fVar195 + fVar265 * 4.0) * 0.5;
    fVar266 = (fVar242 * fVar242 + fVar266 * 4.0) * 0.5;
    fVar267 = (fVar197 * fVar197 + fVar267 * 4.0) * 0.5;
    fVar269 = (fVar243 * fVar243 + fVar268 * 4.0) * 0.5;
    fVar270 = (fVar198 * fVar198 + fVar270 * 4.0) * 0.5;
    fVar159 = auVar235._0_4_ * auVar235._0_4_ * 0.5;
    fVar241 = auVar235._4_4_ * auVar235._4_4_ * 0.5;
    fVar195 = auVar235._8_4_ * auVar235._8_4_ * 0.5;
    fVar242 = auVar235._12_4_ * auVar235._12_4_ * 0.5;
    fVar197 = auVar235._16_4_ * auVar235._16_4_ * 0.5;
    fVar198 = auVar235._20_4_ * auVar235._20_4_ * 0.5;
    fVar245 = auVar235._24_4_ * auVar235._24_4_ * 0.5;
    fVar327 = fStack_864 + fVar384 + fVar384 + 4.0;
    auVar163 = vpermilps_avx(ZEXT416((uint)(fVar244 * 0.04761905)),0);
    fVar243 = auVar163._0_4_;
    fVar296 = fVar243 * ((float)local_1a0._0_4_ * fVar289 +
                        fVar247 * (float)local_380._0_4_ +
                        fVar246 * (float)local_3a0._0_4_ + fVar159 * (float)local_420._0_4_);
    fVar268 = auVar163._4_4_;
    fVar310 = fVar268 * ((float)local_1a0._4_4_ * fVar320 +
                        fVar287 * (float)local_380._4_4_ +
                        fVar264 * (float)local_3a0._4_4_ + fVar241 * (float)local_420._4_4_);
    local_8a0._4_4_ = fVar310;
    local_8a0._0_4_ = fVar296;
    fVar319 = auVar163._8_4_;
    fVar312 = fVar319 * (fStack_198 * fVar323 +
                        fVar288 * fStack_378 + fVar265 * fStack_398 + fVar195 * fStack_418);
    local_8a0._8_4_ = fVar312;
    fVar346 = auVar163._12_4_;
    fVar314 = fVar346 * (fStack_194 * fVar324 +
                        fVar290 * fStack_374 + fVar266 * fStack_394 + fVar242 * fStack_414);
    local_8a0._12_4_ = fVar314;
    fVar317 = fVar243 * (fStack_190 * fVar328 +
                        fVar292 * fStack_370 + fVar267 * fStack_390 + fVar197 * fStack_410);
    local_8a0._16_4_ = fVar317;
    fVar321 = fVar268 * (fStack_18c * fVar338 +
                        fVar294 * fStack_36c + fVar269 * fStack_38c + fVar198 * fStack_40c);
    local_8a0._20_4_ = fVar321;
    fVar325 = fVar319 * (fStack_188 * fVar340 +
                        fVar316 * fStack_368 + fVar270 * fStack_388 + fVar245 * fStack_408);
    local_8a0._24_4_ = fVar325;
    local_8a0._28_4_ = fVar327;
    fVar408 = fVar243 * ((float)local_1c0._0_4_ * fVar289 +
                        (float)local_220._0_4_ * fVar247 +
                        fVar246 * (float)local_3c0._0_4_ + fVar159 * (float)local_440._0_4_);
    fVar416 = fVar268 * ((float)local_1c0._4_4_ * fVar320 +
                        (float)local_220._4_4_ * fVar287 +
                        fVar264 * (float)local_3c0._4_4_ + fVar241 * (float)local_440._4_4_);
    auVar41._4_4_ = fVar416;
    auVar41._0_4_ = fVar408;
    fVar417 = fVar319 * (fStack_1b8 * fVar323 +
                        fStack_218 * fVar288 + fVar265 * fStack_3b8 + fVar195 * fStack_438);
    auVar41._8_4_ = fVar417;
    fVar418 = fVar346 * (fStack_1b4 * fVar324 +
                        fStack_214 * fVar290 + fVar266 * fStack_3b4 + fVar242 * fStack_434);
    auVar41._12_4_ = fVar418;
    fVar419 = fVar243 * (fStack_1b0 * fVar328 +
                        fStack_210 * fVar292 + fVar267 * fStack_3b0 + fVar197 * fStack_430);
    auVar41._16_4_ = fVar419;
    fVar420 = fVar268 * (fStack_1ac * fVar338 +
                        fStack_20c * fVar294 + fVar269 * fStack_3ac + fVar198 * fStack_42c);
    auVar41._20_4_ = fVar420;
    fVar421 = fVar319 * (fStack_1a8 * fVar340 +
                        fStack_208 * fVar316 + fVar270 * fStack_3a8 + fVar245 * fStack_428);
    auVar41._24_4_ = fVar421;
    auVar41._28_4_ = uStack_184;
    fVar422 = fVar243 * ((float)local_1e0._0_4_ * fVar289 +
                        fVar159 * (float)local_460._0_4_ + fVar246 * (float)local_3e0._0_4_ +
                        (float)local_240._0_4_ * fVar247);
    fVar430 = fVar268 * ((float)local_1e0._4_4_ * fVar320 +
                        fVar241 * (float)local_460._4_4_ + fVar264 * (float)local_3e0._4_4_ +
                        (float)local_240._4_4_ * fVar287);
    auVar42._4_4_ = fVar430;
    auVar42._0_4_ = fVar422;
    fVar432 = fVar319 * (fStack_1d8 * fVar323 +
                        fVar195 * fStack_458 + fVar265 * fStack_3d8 + fStack_238 * fVar288);
    auVar42._8_4_ = fVar432;
    fVar434 = fVar346 * (fStack_1d4 * fVar324 +
                        fVar242 * fStack_454 + fVar266 * fStack_3d4 + fStack_234 * fVar290);
    auVar42._12_4_ = fVar434;
    fVar436 = fVar243 * (fStack_1d0 * fVar328 +
                        fVar197 * fStack_450 + fVar267 * fStack_3d0 + fStack_230 * fVar292);
    auVar42._16_4_ = fVar436;
    fVar438 = fVar268 * (fStack_1cc * fVar338 +
                        fVar198 * fStack_44c + fVar269 * fStack_3cc + fStack_22c * fVar294);
    auVar42._20_4_ = fVar438;
    fVar440 = fVar319 * (fStack_1c8 * fVar340 +
                        fVar245 * fStack_448 + fVar270 * fStack_3c8 + fStack_228 * fVar316);
    auVar42._24_4_ = fVar440;
    auVar42._28_4_ = uStack_1a4;
    fVar247 = fVar243 * ((float)local_200._0_4_ * fVar289 +
                        (float)local_260._0_4_ * fVar247 +
                        fVar159 * local_480._0_4_ + fVar246 * (float)local_400._0_4_);
    fVar289 = fVar268 * ((float)local_200._4_4_ * fVar320 +
                        (float)local_260._4_4_ * fVar287 +
                        fVar241 * local_480._4_4_ + fVar264 * (float)local_400._4_4_);
    auVar43._4_4_ = fVar289;
    auVar43._0_4_ = fVar247;
    fVar337 = fVar319 * (fStack_1f8 * fVar323 +
                        fStack_258 * fVar288 + fVar195 * local_480._8_4_ + fVar265 * fStack_3f8);
    auVar43._8_4_ = fVar337;
    fVar362 = fVar346 * (fStack_1f4 * fVar324 +
                        fStack_254 * fVar290 + fVar242 * local_480._12_4_ + fVar266 * fStack_3f4);
    auVar43._12_4_ = fVar362;
    fVar243 = fVar243 * (fStack_1f0 * fVar328 +
                        fStack_250 * fVar292 + fVar197 * local_480._16_4_ + fVar267 * fStack_3f0);
    auVar43._16_4_ = fVar243;
    fVar268 = fVar268 * (fStack_1ec * fVar338 +
                        fStack_24c * fVar294 + fVar198 * local_480._20_4_ + fVar269 * fStack_3ec);
    auVar43._20_4_ = fVar268;
    fVar319 = fVar319 * (fStack_1e8 * fVar340 +
                        fStack_248 * fVar316 + fVar245 * local_480._24_4_ + fVar270 * fStack_3e8);
    auVar43._24_4_ = fVar319;
    auVar43._28_4_ = fVar346;
    auVar107._4_4_ = fStack_87c;
    auVar107._0_4_ = local_880;
    auVar107._8_4_ = fStack_878;
    auVar107._12_4_ = fStack_874;
    auVar107._16_4_ = fStack_870;
    auVar107._20_4_ = fStack_86c;
    auVar107._24_4_ = fStack_868;
    auVar107._28_4_ = fStack_864;
    auVar145 = vperm2f128_avx(auVar107,auVar107,1);
    auVar145 = vshufps_avx(auVar145,auVar107,0x30);
    _local_a20 = vshufps_avx(auVar107,auVar145,0x29);
    auVar102._4_4_ = fVar153;
    auVar102._0_4_ = fVar122;
    auVar102._8_4_ = fVar154;
    auVar102._12_4_ = fVar155;
    auVar102._16_4_ = fVar156;
    auVar102._20_4_ = fVar157;
    auVar102._24_4_ = fVar158;
    auVar102._28_4_ = fVar407;
    auVar145 = vperm2f128_avx(auVar102,auVar102,1);
    auVar145 = vshufps_avx(auVar145,auVar102,0x30);
    auVar283 = vshufps_avx(auVar102,auVar145,0x29);
    auVar33 = vsubps_avx(_local_ba0,auVar43);
    auVar145 = vperm2f128_avx(auVar33,auVar33,1);
    auVar145 = vshufps_avx(auVar145,auVar33,0x30);
    local_780 = vshufps_avx(auVar33,auVar145,0x29);
    auVar34 = vsubps_avx(_local_a20,auVar107);
    auVar35 = vsubps_avx(auVar283,auVar102);
    fVar241 = auVar34._0_4_;
    fVar198 = auVar34._4_4_;
    auVar44._4_4_ = fVar430 * fVar198;
    auVar44._0_4_ = fVar422 * fVar241;
    fVar264 = auVar34._8_4_;
    auVar44._8_4_ = fVar432 * fVar264;
    fVar269 = auVar34._12_4_;
    auVar44._12_4_ = fVar434 * fVar269;
    fVar290 = auVar34._16_4_;
    auVar44._16_4_ = fVar436 * fVar290;
    fVar320 = auVar34._20_4_;
    auVar44._20_4_ = fVar438 * fVar320;
    fVar338 = auVar34._24_4_;
    auVar44._24_4_ = fVar440 * fVar338;
    auVar44._28_4_ = auVar33._28_4_;
    fVar195 = auVar35._0_4_;
    fVar244 = auVar35._4_4_;
    auVar45._4_4_ = fVar416 * fVar244;
    auVar45._0_4_ = fVar408 * fVar195;
    fVar265 = auVar35._8_4_;
    auVar45._8_4_ = fVar417 * fVar265;
    fVar270 = auVar35._12_4_;
    auVar45._12_4_ = fVar418 * fVar270;
    fVar292 = auVar35._16_4_;
    auVar45._16_4_ = fVar419 * fVar292;
    fVar323 = auVar35._20_4_;
    auVar45._20_4_ = fVar420 * fVar323;
    fVar340 = auVar35._24_4_;
    auVar45._24_4_ = fVar421 * fVar340;
    auVar45._28_4_ = auVar145._28_4_;
    auVar34 = vsubps_avx(auVar45,auVar44);
    auVar100._4_4_ = fVar361;
    auVar100._0_4_ = fVar349;
    auVar100._8_4_ = fVar363;
    auVar100._12_4_ = fVar365;
    auVar100._16_4_ = fVar367;
    auVar100._20_4_ = fVar369;
    auVar100._24_4_ = fVar371;
    auVar100._28_4_ = fVar373;
    auVar145 = vperm2f128_avx(auVar100,auVar100,1);
    auVar145 = vshufps_avx(auVar145,auVar100,0x30);
    local_720 = vshufps_avx(auVar100,auVar145,0x29);
    auVar145 = vsubps_avx(local_720,auVar100);
    auVar46._4_4_ = fVar244 * fVar310;
    auVar46._0_4_ = fVar195 * fVar296;
    auVar46._8_4_ = fVar265 * fVar312;
    auVar46._12_4_ = fVar270 * fVar314;
    auVar46._16_4_ = fVar292 * fVar317;
    auVar46._20_4_ = fVar323 * fVar321;
    auVar46._24_4_ = fVar340 * fVar325;
    auVar46._28_4_ = local_720._28_4_;
    fVar242 = auVar145._0_4_;
    fVar245 = auVar145._4_4_;
    auVar47._4_4_ = fVar430 * fVar245;
    auVar47._0_4_ = fVar422 * fVar242;
    fVar266 = auVar145._8_4_;
    auVar47._8_4_ = fVar432 * fVar266;
    fVar287 = auVar145._12_4_;
    auVar47._12_4_ = fVar434 * fVar287;
    fVar294 = auVar145._16_4_;
    auVar47._16_4_ = fVar436 * fVar294;
    fVar324 = auVar145._20_4_;
    auVar47._20_4_ = fVar438 * fVar324;
    fVar342 = auVar145._24_4_;
    auVar47._24_4_ = fVar440 * fVar342;
    auVar47._28_4_ = fVar373;
    auVar35 = vsubps_avx(auVar47,auVar46);
    auVar48._4_4_ = fVar416 * fVar245;
    auVar48._0_4_ = fVar408 * fVar242;
    auVar48._8_4_ = fVar417 * fVar266;
    auVar48._12_4_ = fVar418 * fVar287;
    auVar48._16_4_ = fVar419 * fVar294;
    auVar48._20_4_ = fVar420 * fVar324;
    auVar48._24_4_ = fVar421 * fVar342;
    auVar48._28_4_ = fVar373;
    auVar49._4_4_ = fVar310 * fVar198;
    auVar49._0_4_ = fVar296 * fVar241;
    auVar49._8_4_ = fVar312 * fVar264;
    auVar49._12_4_ = fVar314 * fVar269;
    auVar49._16_4_ = fVar317 * fVar290;
    auVar49._20_4_ = fVar321 * fVar320;
    auVar49._24_4_ = fVar325 * fVar338;
    auVar49._28_4_ = uStack_1c4;
    auVar236 = vsubps_avx(auVar49,auVar48);
    fVar159 = auVar236._28_4_;
    auVar178._0_4_ = fVar242 * fVar242 + fVar241 * fVar241 + fVar195 * fVar195;
    auVar178._4_4_ = fVar245 * fVar245 + fVar198 * fVar198 + fVar244 * fVar244;
    auVar178._8_4_ = fVar266 * fVar266 + fVar264 * fVar264 + fVar265 * fVar265;
    auVar178._12_4_ = fVar287 * fVar287 + fVar269 * fVar269 + fVar270 * fVar270;
    auVar178._16_4_ = fVar294 * fVar294 + fVar290 * fVar290 + fVar292 * fVar292;
    auVar178._20_4_ = fVar324 * fVar324 + fVar320 * fVar320 + fVar323 * fVar323;
    auVar178._24_4_ = fVar342 * fVar342 + fVar338 * fVar338 + fVar340 * fVar340;
    auVar178._28_4_ = fVar159 + fVar159 + auVar34._28_4_;
    auVar145 = vrcpps_avx(auVar178);
    fVar364 = auVar145._0_4_;
    fVar366 = auVar145._4_4_;
    auVar50._4_4_ = fVar366 * auVar178._4_4_;
    auVar50._0_4_ = fVar364 * auVar178._0_4_;
    fVar368 = auVar145._8_4_;
    auVar50._8_4_ = fVar368 * auVar178._8_4_;
    fVar370 = auVar145._12_4_;
    auVar50._12_4_ = fVar370 * auVar178._12_4_;
    fVar372 = auVar145._16_4_;
    auVar50._16_4_ = fVar372 * auVar178._16_4_;
    fVar383 = auVar145._20_4_;
    auVar50._20_4_ = fVar383 * auVar178._20_4_;
    fVar384 = auVar145._24_4_;
    auVar50._24_4_ = fVar384 * auVar178._24_4_;
    auVar50._28_4_ = uStack_1c4;
    auVar445._8_4_ = 0x3f800000;
    auVar445._0_8_ = &DAT_3f8000003f800000;
    auVar445._12_4_ = 0x3f800000;
    auVar445._16_4_ = 0x3f800000;
    auVar445._20_4_ = 0x3f800000;
    auVar445._24_4_ = 0x3f800000;
    auVar445._28_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar445,auVar50);
    fVar364 = auVar36._0_4_ * fVar364 + fVar364;
    fVar366 = auVar36._4_4_ * fVar366 + fVar366;
    fVar368 = auVar36._8_4_ * fVar368 + fVar368;
    fVar370 = auVar36._12_4_ * fVar370 + fVar370;
    fVar372 = auVar36._16_4_ * fVar372 + fVar372;
    fVar383 = auVar36._20_4_ * fVar383 + fVar383;
    fVar384 = auVar36._24_4_ * fVar384 + fVar384;
    auVar33 = vperm2f128_avx(auVar41,auVar41,1);
    auVar33 = vshufps_avx(auVar33,auVar41,0x30);
    local_ac0 = vshufps_avx(auVar41,auVar33,0x29);
    auVar33 = vperm2f128_avx(auVar42,auVar42,1);
    auVar33 = vshufps_avx(auVar33,auVar42,0x30);
    local_9e0 = vshufps_avx(auVar42,auVar33,0x29);
    fVar423 = local_9e0._0_4_;
    fVar431 = local_9e0._4_4_;
    auVar51._4_4_ = fVar431 * fVar198;
    auVar51._0_4_ = fVar423 * fVar241;
    fVar433 = local_9e0._8_4_;
    auVar51._8_4_ = fVar433 * fVar264;
    fVar435 = local_9e0._12_4_;
    auVar51._12_4_ = fVar435 * fVar269;
    fVar437 = local_9e0._16_4_;
    auVar51._16_4_ = fVar437 * fVar290;
    fVar439 = local_9e0._20_4_;
    auVar51._20_4_ = fVar439 * fVar320;
    fVar441 = local_9e0._24_4_;
    auVar51._24_4_ = fVar441 * fVar338;
    auVar51._28_4_ = auVar33._28_4_;
    fVar443 = local_ac0._0_4_;
    fVar449 = local_ac0._4_4_;
    auVar52._4_4_ = fVar449 * fVar244;
    auVar52._0_4_ = fVar443 * fVar195;
    fVar450 = local_ac0._8_4_;
    auVar52._8_4_ = fVar450 * fVar265;
    fVar451 = local_ac0._12_4_;
    auVar52._12_4_ = fVar451 * fVar270;
    fVar452 = local_ac0._16_4_;
    auVar52._16_4_ = fVar452 * fVar292;
    fVar453 = local_ac0._20_4_;
    auVar52._20_4_ = fVar453 * fVar323;
    fVar454 = local_ac0._24_4_;
    auVar52._24_4_ = fVar454 * fVar340;
    auVar52._28_4_ = uStack_184;
    auVar180 = vsubps_avx(auVar52,auVar51);
    auVar33 = vperm2f128_avx(local_8a0,local_8a0,1);
    auVar33 = vshufps_avx(auVar33,local_8a0,0x30);
    local_9c0 = vshufps_avx(local_8a0,auVar33,0x29);
    fVar197 = local_9c0._0_4_;
    fVar246 = local_9c0._4_4_;
    auVar53._4_4_ = fVar244 * fVar246;
    auVar53._0_4_ = fVar195 * fVar197;
    fVar267 = local_9c0._8_4_;
    auVar53._8_4_ = fVar265 * fVar267;
    fVar288 = local_9c0._12_4_;
    auVar53._12_4_ = fVar270 * fVar288;
    fVar316 = local_9c0._16_4_;
    auVar53._16_4_ = fVar292 * fVar316;
    fVar328 = local_9c0._20_4_;
    auVar53._20_4_ = fVar323 * fVar328;
    fVar344 = local_9c0._24_4_;
    auVar53._24_4_ = fVar340 * fVar344;
    auVar53._28_4_ = auVar33._28_4_;
    auVar54._4_4_ = fVar431 * fVar245;
    auVar54._0_4_ = fVar423 * fVar242;
    auVar54._8_4_ = fVar433 * fVar266;
    auVar54._12_4_ = fVar435 * fVar287;
    auVar54._16_4_ = fVar437 * fVar294;
    auVar54._20_4_ = fVar439 * fVar324;
    uVar110 = local_9e0._28_4_;
    auVar54._24_4_ = fVar441 * fVar342;
    auVar54._28_4_ = uVar110;
    auVar37 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = fVar449 * fVar245;
    auVar55._0_4_ = fVar443 * fVar242;
    auVar55._8_4_ = fVar450 * fVar266;
    auVar55._12_4_ = fVar451 * fVar287;
    auVar55._16_4_ = fVar452 * fVar294;
    auVar55._20_4_ = fVar453 * fVar324;
    auVar55._24_4_ = fVar454 * fVar342;
    auVar55._28_4_ = uVar110;
    auVar56._4_4_ = fVar246 * fVar198;
    auVar56._0_4_ = fVar197 * fVar241;
    auVar56._8_4_ = fVar267 * fVar264;
    auVar56._12_4_ = fVar288 * fVar269;
    auVar56._16_4_ = fVar316 * fVar290;
    auVar56._20_4_ = fVar328 * fVar320;
    fVar348 = local_ac0._28_4_;
    auVar56._24_4_ = fVar344 * fVar338;
    auVar56._28_4_ = fVar348;
    auVar33 = vsubps_avx(auVar56,auVar55);
    fVar360 = auVar33._28_4_;
    auVar57._4_4_ =
         (auVar34._4_4_ * auVar34._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar236._4_4_ * auVar236._4_4_) * fVar366;
    auVar57._0_4_ =
         (auVar34._0_4_ * auVar34._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar236._0_4_ * auVar236._0_4_) * fVar364;
    auVar57._8_4_ =
         (auVar34._8_4_ * auVar34._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar236._8_4_ * auVar236._8_4_) * fVar368;
    auVar57._12_4_ =
         (auVar34._12_4_ * auVar34._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar236._12_4_ * auVar236._12_4_) * fVar370;
    auVar57._16_4_ =
         (auVar34._16_4_ * auVar34._16_4_ +
         auVar35._16_4_ * auVar35._16_4_ + auVar236._16_4_ * auVar236._16_4_) * fVar372;
    auVar57._20_4_ =
         (auVar34._20_4_ * auVar34._20_4_ +
         auVar35._20_4_ * auVar35._20_4_ + auVar236._20_4_ * auVar236._20_4_) * fVar383;
    auVar57._24_4_ =
         (auVar34._24_4_ * auVar34._24_4_ +
         auVar35._24_4_ * auVar35._24_4_ + auVar236._24_4_ * auVar236._24_4_) * fVar384;
    auVar57._28_4_ = auVar34._28_4_ + auVar35._28_4_ + fVar159;
    auVar58._4_4_ =
         (auVar180._4_4_ * auVar180._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar33._4_4_ * auVar33._4_4_) * fVar366;
    auVar58._0_4_ =
         (auVar180._0_4_ * auVar180._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar33._0_4_ * auVar33._0_4_) * fVar364;
    auVar58._8_4_ =
         (auVar180._8_4_ * auVar180._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar33._8_4_ * auVar33._8_4_) * fVar368;
    auVar58._12_4_ =
         (auVar180._12_4_ * auVar180._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar33._12_4_ * auVar33._12_4_) * fVar370;
    auVar58._16_4_ =
         (auVar180._16_4_ * auVar180._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar33._16_4_ * auVar33._16_4_) * fVar372;
    auVar58._20_4_ =
         (auVar180._20_4_ * auVar180._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar33._20_4_ * auVar33._20_4_) * fVar383;
    auVar58._24_4_ =
         (auVar180._24_4_ * auVar180._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar33._24_4_ * auVar33._24_4_) * fVar384;
    auVar58._28_4_ = auVar36._28_4_ + auVar145._28_4_;
    auVar145 = vmaxps_avx(auVar57,auVar58);
    auVar33 = vperm2f128_avx(_local_ba0,_local_ba0,1);
    auVar33 = vshufps_avx(auVar33,_local_ba0,0x30);
    auVar35 = vshufps_avx(_local_ba0,auVar33,0x29);
    auVar142._0_4_ = (float)local_ba0._0_4_ + fVar247;
    auVar142._4_4_ = (float)local_ba0._4_4_ + fVar289;
    auVar142._8_4_ = fStack_b98 + fVar337;
    auVar142._12_4_ = fStack_b94 + fVar362;
    auVar142._16_4_ = fStack_b90 + fVar243;
    auVar142._20_4_ = fStack_b8c + fVar268;
    auVar142._24_4_ = fStack_b88 + fVar319;
    auVar142._28_4_ = fStack_b84 + fVar346;
    auVar33 = vmaxps_avx(_local_ba0,auVar142);
    auVar34 = vmaxps_avx(local_780,auVar35);
    auVar34 = vmaxps_avx(auVar33,auVar34);
    auVar33 = vrsqrtps_avx(auVar178);
    fVar159 = auVar33._0_4_;
    fVar243 = auVar33._4_4_;
    fVar247 = auVar33._8_4_;
    fVar268 = auVar33._12_4_;
    fVar289 = auVar33._16_4_;
    fVar319 = auVar33._20_4_;
    fVar337 = auVar33._24_4_;
    auVar59._4_4_ = fVar243 * fVar243 * fVar243 * auVar178._4_4_ * 0.5;
    auVar59._0_4_ = fVar159 * fVar159 * fVar159 * auVar178._0_4_ * 0.5;
    auVar59._8_4_ = fVar247 * fVar247 * fVar247 * auVar178._8_4_ * 0.5;
    auVar59._12_4_ = fVar268 * fVar268 * fVar268 * auVar178._12_4_ * 0.5;
    auVar59._16_4_ = fVar289 * fVar289 * fVar289 * auVar178._16_4_ * 0.5;
    auVar59._20_4_ = fVar319 * fVar319 * fVar319 * auVar178._20_4_ * 0.5;
    auVar59._24_4_ = fVar337 * fVar337 * fVar337 * auVar178._24_4_ * 0.5;
    auVar59._28_4_ = auVar178._28_4_;
    auVar60._4_4_ = fVar243 * 1.5;
    auVar60._0_4_ = fVar159 * 1.5;
    auVar60._8_4_ = fVar247 * 1.5;
    auVar60._12_4_ = fVar268 * 1.5;
    auVar60._16_4_ = fVar289 * 1.5;
    auVar60._20_4_ = fVar319 * 1.5;
    auVar60._24_4_ = fVar337 * 1.5;
    auVar60._28_4_ = auVar33._28_4_;
    auVar33 = vsubps_avx(auVar60,auVar59);
    auVar236 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar36 = vsubps_avx(auVar236,auVar107);
    local_840 = vsubps_avx(auVar236,auVar102);
    fVar243 = local_840._0_4_;
    fVar247 = local_840._4_4_;
    fVar268 = local_840._8_4_;
    fVar289 = local_840._12_4_;
    fVar319 = local_840._16_4_;
    fVar337 = local_840._20_4_;
    fVar346 = local_840._24_4_;
    fVar392 = auVar36._0_4_;
    fVar401 = auVar36._4_4_;
    fVar402 = auVar36._8_4_;
    fVar403 = auVar36._12_4_;
    fVar404 = auVar36._16_4_;
    fVar405 = auVar36._20_4_;
    fVar406 = auVar36._24_4_;
    auVar101._4_4_ = fVar361;
    auVar101._0_4_ = fVar349;
    auVar101._8_4_ = fVar363;
    auVar101._12_4_ = fVar365;
    auVar101._16_4_ = fVar367;
    auVar101._20_4_ = fVar369;
    auVar101._24_4_ = fVar371;
    auVar101._28_4_ = fVar373;
    auVar237 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar236 = vsubps_avx(auVar237,auVar101);
    fVar455 = auVar236._0_4_;
    fVar459 = auVar236._4_4_;
    fVar460 = auVar236._8_4_;
    fVar461 = auVar236._12_4_;
    fVar462 = auVar236._16_4_;
    fVar463 = auVar236._20_4_;
    fVar464 = auVar236._24_4_;
    auVar414._0_4_ =
         fVar455 * (float)local_7a0._0_4_ +
         fVar392 * (float)local_a40._0_4_ + (float)local_940._0_4_ * fVar243;
    auVar414._4_4_ =
         fVar459 * (float)local_7a0._4_4_ +
         fVar401 * (float)local_a40._4_4_ + (float)local_940._4_4_ * fVar247;
    auVar414._8_4_ = fVar460 * fStack_798 + fVar402 * fStack_a38 + fStack_938 * fVar268;
    auVar414._12_4_ = fVar461 * fStack_794 + fVar403 * fStack_a34 + fStack_934 * fVar289;
    auVar414._16_4_ = fVar462 * fStack_790 + fVar404 * fStack_a30 + fStack_930 * fVar319;
    auVar414._20_4_ = fVar463 * fStack_78c + fVar405 * fStack_a2c + fStack_92c * fVar337;
    auVar414._24_4_ = fVar464 * fStack_788 + fVar406 * fStack_a28 + fStack_928 * fVar346;
    auVar414._28_4_ = fVar360 + fVar360 + auVar37._28_4_ + fVar360;
    auVar427._0_4_ = fVar455 * fVar455 + fVar392 * fVar392 + fVar243 * fVar243;
    auVar427._4_4_ = fVar459 * fVar459 + fVar401 * fVar401 + fVar247 * fVar247;
    auVar427._8_4_ = fVar460 * fVar460 + fVar402 * fVar402 + fVar268 * fVar268;
    auVar427._12_4_ = fVar461 * fVar461 + fVar403 * fVar403 + fVar289 * fVar289;
    auVar427._16_4_ = fVar462 * fVar462 + fVar404 * fVar404 + fVar319 * fVar319;
    auVar427._20_4_ = fVar463 * fVar463 + fVar405 * fVar405 + fVar337 * fVar337;
    auVar427._24_4_ = fVar464 * fVar464 + fVar406 * fVar406 + fVar346 * fVar346;
    auVar427._28_4_ = fVar348 + fVar348 + fVar360;
    fVar370 = auVar33._0_4_;
    fVar372 = auVar33._4_4_;
    fVar383 = auVar33._8_4_;
    fVar384 = auVar33._12_4_;
    fVar291 = auVar33._16_4_;
    fVar293 = auVar33._20_4_;
    fVar295 = auVar33._24_4_;
    local_a00._0_4_ =
         (float)local_7a0._0_4_ * fVar242 * fVar370 +
         fVar370 * fVar241 * (float)local_a40._0_4_ + fVar195 * fVar370 * (float)local_940._0_4_;
    local_a00._4_4_ =
         (float)local_7a0._4_4_ * fVar245 * fVar372 +
         fVar372 * fVar198 * (float)local_a40._4_4_ + fVar244 * fVar372 * (float)local_940._4_4_;
    fStack_9f8 = fStack_798 * fVar266 * fVar383 +
                 fVar383 * fVar264 * fStack_a38 + fVar265 * fVar383 * fStack_938;
    fStack_9f4 = fStack_794 * fVar287 * fVar384 +
                 fVar384 * fVar269 * fStack_a34 + fVar270 * fVar384 * fStack_934;
    fStack_9f0 = fStack_790 * fVar294 * fVar291 +
                 fVar291 * fVar290 * fStack_a30 + fVar292 * fVar291 * fStack_930;
    fStack_9ec = fStack_78c * fVar324 * fVar293 +
                 fVar293 * fVar320 * fStack_a2c + fVar323 * fVar293 * fStack_92c;
    fStack_9e8 = fStack_788 * fVar342 * fVar295 +
                 fVar295 * fVar338 * fStack_a28 + fVar340 * fVar295 * fStack_928;
    fStack_9e4 = fStack_784 + fStack_a24 + fStack_924;
    fVar159 = fStack_784 + fStack_a24 + fStack_924;
    local_960._0_4_ =
         fVar455 * fVar242 * fVar370 + fVar392 * fVar370 * fVar241 + fVar195 * fVar370 * fVar243;
    local_960._4_4_ =
         fVar459 * fVar245 * fVar372 + fVar401 * fVar372 * fVar198 + fVar244 * fVar372 * fVar247;
    local_960._8_4_ =
         fVar460 * fVar266 * fVar383 + fVar402 * fVar383 * fVar264 + fVar265 * fVar383 * fVar268;
    local_960._12_4_ =
         fVar461 * fVar287 * fVar384 + fVar403 * fVar384 * fVar269 + fVar270 * fVar384 * fVar289;
    local_960._16_4_ =
         fVar462 * fVar294 * fVar291 + fVar404 * fVar291 * fVar290 + fVar292 * fVar291 * fVar319;
    local_960._20_4_ =
         fVar463 * fVar324 * fVar293 + fVar405 * fVar293 * fVar320 + fVar323 * fVar293 * fVar337;
    local_960._24_4_ =
         fVar464 * fVar342 * fVar295 + fVar406 * fVar295 * fVar338 + fVar340 * fVar295 * fVar346;
    local_960._28_4_ = fStack_a24 + fVar159;
    auVar61._4_4_ = (float)local_a00._4_4_ * local_960._4_4_;
    auVar61._0_4_ = (float)local_a00._0_4_ * (float)local_960._0_4_;
    auVar61._8_4_ = fStack_9f8 * local_960._8_4_;
    auVar61._12_4_ = fStack_9f4 * local_960._12_4_;
    auVar61._16_4_ = fStack_9f0 * local_960._16_4_;
    auVar61._20_4_ = fStack_9ec * local_960._20_4_;
    auVar61._24_4_ = fStack_9e8 * local_960._24_4_;
    auVar61._28_4_ = fVar159;
    auVar180 = vsubps_avx(auVar414,auVar61);
    auVar62._4_4_ = local_960._4_4_ * local_960._4_4_;
    auVar62._0_4_ = (float)local_960._0_4_ * (float)local_960._0_4_;
    auVar62._8_4_ = local_960._8_4_ * local_960._8_4_;
    auVar62._12_4_ = local_960._12_4_ * local_960._12_4_;
    auVar62._16_4_ = local_960._16_4_ * local_960._16_4_;
    auVar62._20_4_ = local_960._20_4_ * local_960._20_4_;
    auVar62._24_4_ = local_960._24_4_ * local_960._24_4_;
    auVar62._28_4_ = fStack_a24;
    auVar37 = vsubps_avx(auVar427,auVar62);
    auVar236 = vsqrtps_avx(auVar145);
    fVar159 = (auVar236._0_4_ + auVar34._0_4_) * 1.0000002;
    fVar348 = (auVar236._4_4_ + auVar34._4_4_) * 1.0000002;
    fVar360 = (auVar236._8_4_ + auVar34._8_4_) * 1.0000002;
    fVar362 = (auVar236._12_4_ + auVar34._12_4_) * 1.0000002;
    fVar364 = (auVar236._16_4_ + auVar34._16_4_) * 1.0000002;
    fVar366 = (auVar236._20_4_ + auVar34._20_4_) * 1.0000002;
    fVar368 = (auVar236._24_4_ + auVar34._24_4_) * 1.0000002;
    auVar63._4_4_ = fVar348 * fVar348;
    auVar63._0_4_ = fVar159 * fVar159;
    auVar63._8_4_ = fVar360 * fVar360;
    auVar63._12_4_ = fVar362 * fVar362;
    auVar63._16_4_ = fVar364 * fVar364;
    auVar63._20_4_ = fVar366 * fVar366;
    auVar63._24_4_ = fVar368 * fVar368;
    auVar63._28_4_ = auVar236._28_4_ + auVar34._28_4_;
    fVar348 = auVar180._0_4_ + auVar180._0_4_;
    fVar360 = auVar180._4_4_ + auVar180._4_4_;
    local_8c0._0_8_ = CONCAT44(fVar360,fVar348);
    local_8c0._8_4_ = auVar180._8_4_ + auVar180._8_4_;
    local_8c0._12_4_ = auVar180._12_4_ + auVar180._12_4_;
    local_8c0._16_4_ = auVar180._16_4_ + auVar180._16_4_;
    local_8c0._20_4_ = auVar180._20_4_ + auVar180._20_4_;
    local_8c0._24_4_ = auVar180._24_4_ + auVar180._24_4_;
    local_8c0._28_4_ = auVar180._28_4_ + auVar180._28_4_;
    auVar180 = vsubps_avx(auVar37,auVar63);
    auVar64._4_4_ = (float)local_a00._4_4_ * (float)local_a00._4_4_;
    auVar64._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar64._8_4_ = fStack_9f8 * fStack_9f8;
    auVar64._12_4_ = fStack_9f4 * fStack_9f4;
    auVar64._16_4_ = fStack_9f0 * fStack_9f0;
    auVar64._20_4_ = fStack_9ec * fStack_9ec;
    auVar64._24_4_ = fStack_9e8 * fStack_9e8;
    auVar64._28_4_ = auVar427._28_4_;
    auVar391 = ZEXT3264(local_280);
    auVar38 = vsubps_avx(local_280,auVar64);
    auVar379 = ZEXT3264(auVar38);
    auVar65._4_4_ = fVar360 * fVar360;
    auVar65._0_4_ = fVar348 * fVar348;
    auVar65._8_4_ = local_8c0._8_4_ * local_8c0._8_4_;
    auVar65._12_4_ = local_8c0._12_4_ * local_8c0._12_4_;
    auVar65._16_4_ = local_8c0._16_4_ * local_8c0._16_4_;
    auVar65._20_4_ = local_8c0._20_4_ * local_8c0._20_4_;
    auVar65._24_4_ = local_8c0._24_4_ * local_8c0._24_4_;
    auVar65._28_4_ = auVar37._28_4_;
    fVar362 = auVar38._0_4_;
    fVar364 = auVar38._4_4_;
    fVar366 = auVar38._8_4_;
    fVar368 = auVar38._12_4_;
    fVar380 = auVar38._16_4_;
    fVar381 = auVar38._20_4_;
    fVar382 = auVar38._24_4_;
    auVar66._4_4_ = fVar364 * 4.0 * auVar180._4_4_;
    auVar66._0_4_ = fVar362 * 4.0 * auVar180._0_4_;
    auVar66._8_4_ = fVar366 * 4.0 * auVar180._8_4_;
    auVar66._12_4_ = fVar368 * 4.0 * auVar180._12_4_;
    auVar66._16_4_ = fVar380 * 4.0 * auVar180._16_4_;
    auVar66._20_4_ = fVar381 * 4.0 * auVar180._20_4_;
    auVar66._24_4_ = fVar382 * 4.0 * auVar180._24_4_;
    auVar66._28_4_ = 0x40800000;
    auVar34 = vsubps_avx(auVar65,auVar66);
    auVar145 = vcmpps_avx(auVar34,auVar237,5);
    fVar159 = auVar38._28_4_;
    if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0x7f,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar145 >> 0xbf,0) == '\0') &&
        (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar145[0x1f])
    {
      auVar179._8_4_ = 0x7f800000;
      auVar179._0_8_ = 0x7f8000007f800000;
      auVar179._12_4_ = 0x7f800000;
      auVar179._16_4_ = 0x7f800000;
      auVar179._20_4_ = 0x7f800000;
      auVar179._24_4_ = 0x7f800000;
      auVar179._28_4_ = 0x7f800000;
      auVar446._8_4_ = 0xff800000;
      auVar446._0_8_ = 0xff800000ff800000;
      auVar446._12_4_ = 0xff800000;
      auVar446._16_4_ = 0xff800000;
      auVar446._20_4_ = 0xff800000;
      auVar446._24_4_ = 0xff800000;
      auVar446._28_4_ = 0xff800000;
    }
    else {
      auVar139 = vsqrtps_avx(auVar34);
      auVar303._0_4_ = fVar362 + fVar362;
      auVar303._4_4_ = fVar364 + fVar364;
      auVar303._8_4_ = fVar366 + fVar366;
      auVar303._12_4_ = fVar368 + fVar368;
      auVar303._16_4_ = fVar380 + fVar380;
      auVar303._20_4_ = fVar381 + fVar381;
      auVar303._24_4_ = fVar382 + fVar382;
      auVar303._28_4_ = fVar159 + fVar159;
      auVar138 = vrcpps_avx(auVar303);
      auVar34 = vcmpps_avx(auVar34,auVar237,5);
      fVar297 = auVar138._0_4_;
      fVar311 = auVar138._4_4_;
      auVar67._4_4_ = auVar303._4_4_ * fVar311;
      auVar67._0_4_ = auVar303._0_4_ * fVar297;
      fVar313 = auVar138._8_4_;
      auVar67._8_4_ = auVar303._8_4_ * fVar313;
      fVar315 = auVar138._12_4_;
      auVar67._12_4_ = auVar303._12_4_ * fVar315;
      fVar318 = auVar138._16_4_;
      auVar67._16_4_ = auVar303._16_4_ * fVar318;
      fVar322 = auVar138._20_4_;
      auVar67._20_4_ = auVar303._20_4_ * fVar322;
      fVar326 = auVar138._24_4_;
      auVar67._24_4_ = auVar303._24_4_ * fVar326;
      auVar67._28_4_ = auVar303._28_4_;
      auVar357._8_4_ = 0x3f800000;
      auVar357._0_8_ = &DAT_3f8000003f800000;
      auVar357._12_4_ = 0x3f800000;
      auVar357._16_4_ = 0x3f800000;
      auVar357._20_4_ = 0x3f800000;
      auVar357._24_4_ = 0x3f800000;
      auVar357._28_4_ = 0x3f800000;
      auVar237 = vsubps_avx(auVar357,auVar67);
      fVar297 = fVar297 + fVar297 * auVar237._0_4_;
      fVar311 = fVar311 + fVar311 * auVar237._4_4_;
      fVar313 = fVar313 + fVar313 * auVar237._8_4_;
      fVar315 = fVar315 + fVar315 * auVar237._12_4_;
      fVar318 = fVar318 + fVar318 * auVar237._16_4_;
      fVar322 = fVar322 + fVar322 * auVar237._20_4_;
      fVar326 = fVar326 + fVar326 * auVar237._24_4_;
      auVar334._0_8_ = CONCAT44(fVar360,fVar348) ^ 0x8000000080000000;
      auVar334._8_4_ = -local_8c0._8_4_;
      auVar334._12_4_ = -local_8c0._12_4_;
      auVar334._16_4_ = -local_8c0._16_4_;
      auVar334._20_4_ = -local_8c0._20_4_;
      auVar334._24_4_ = -local_8c0._24_4_;
      auVar334._28_4_ = -local_8c0._28_4_;
      auVar175 = vsubps_avx(auVar334,auVar139);
      fVar348 = auVar175._0_4_ * fVar297;
      fVar360 = auVar175._4_4_ * fVar311;
      auVar68._4_4_ = fVar360;
      auVar68._0_4_ = fVar348;
      fVar339 = auVar175._8_4_ * fVar313;
      auVar68._8_4_ = fVar339;
      fVar341 = auVar175._12_4_ * fVar315;
      auVar68._12_4_ = fVar341;
      fVar343 = auVar175._16_4_ * fVar318;
      auVar68._16_4_ = fVar343;
      fVar345 = auVar175._20_4_ * fVar322;
      auVar68._20_4_ = fVar345;
      fVar347 = auVar175._24_4_ * fVar326;
      auVar68._24_4_ = fVar347;
      auVar68._28_4_ = auVar175._28_4_;
      auVar139 = vsubps_avx(auVar139,local_8c0);
      fVar297 = auVar139._0_4_ * fVar297;
      fVar311 = auVar139._4_4_ * fVar311;
      auVar69._4_4_ = fVar311;
      auVar69._0_4_ = fVar297;
      fVar313 = auVar139._8_4_ * fVar313;
      auVar69._8_4_ = fVar313;
      fVar315 = auVar139._12_4_ * fVar315;
      auVar69._12_4_ = fVar315;
      fVar318 = auVar139._16_4_ * fVar318;
      auVar69._16_4_ = fVar318;
      fVar322 = auVar139._20_4_ * fVar322;
      auVar69._20_4_ = fVar322;
      fVar326 = auVar139._24_4_ * fVar326;
      auVar69._24_4_ = fVar326;
      auVar69._28_4_ = auVar139._28_4_;
      fStack_4c4 = local_960._28_4_ + auVar138._28_4_ + auVar237._28_4_;
      local_4e0[0] = fVar370 * ((float)local_960._0_4_ + (float)local_a00._0_4_ * fVar348);
      local_4e0[1] = fVar372 * (local_960._4_4_ + (float)local_a00._4_4_ * fVar360);
      local_4e0[2] = fVar383 * (local_960._8_4_ + fStack_9f8 * fVar339);
      local_4e0[3] = fVar384 * (local_960._12_4_ + fStack_9f4 * fVar341);
      fStack_4d0 = fVar291 * (local_960._16_4_ + fStack_9f0 * fVar343);
      fStack_4cc = fVar293 * (local_960._20_4_ + fStack_9ec * fVar345);
      fStack_4c8 = fVar295 * (local_960._24_4_ + fStack_9e8 * fVar347);
      local_500[0] = fVar370 * ((float)local_960._0_4_ + (float)local_a00._0_4_ * fVar297);
      local_500[1] = fVar372 * (local_960._4_4_ + (float)local_a00._4_4_ * fVar311);
      local_500[2] = fVar383 * (local_960._8_4_ + fStack_9f8 * fVar313);
      local_500[3] = fVar384 * (local_960._12_4_ + fStack_9f4 * fVar315);
      fStack_4f0 = fVar291 * (local_960._16_4_ + fStack_9f0 * fVar318);
      fStack_4ec = fVar293 * (local_960._20_4_ + fStack_9ec * fVar322);
      fStack_4e8 = fVar295 * (local_960._24_4_ + fStack_9e8 * fVar326);
      fStack_4e4 = local_960._28_4_ + fStack_4c4;
      auVar304._8_4_ = 0x7f800000;
      auVar304._0_8_ = 0x7f8000007f800000;
      auVar304._12_4_ = 0x7f800000;
      auVar304._16_4_ = 0x7f800000;
      auVar304._20_4_ = 0x7f800000;
      auVar304._24_4_ = 0x7f800000;
      auVar304._28_4_ = 0x7f800000;
      auVar179 = vblendvps_avx(auVar304,auVar68,auVar34);
      auVar335._8_4_ = 0x7fffffff;
      auVar335._0_8_ = 0x7fffffff7fffffff;
      auVar335._12_4_ = 0x7fffffff;
      auVar335._16_4_ = 0x7fffffff;
      auVar335._20_4_ = 0x7fffffff;
      auVar335._24_4_ = 0x7fffffff;
      auVar335._28_4_ = 0x7fffffff;
      auVar237 = vandps_avx(auVar64,auVar335);
      auVar237 = vmaxps_avx(local_4c0,auVar237);
      auVar70._4_4_ = auVar237._4_4_ * 1.9073486e-06;
      auVar70._0_4_ = auVar237._0_4_ * 1.9073486e-06;
      auVar70._8_4_ = auVar237._8_4_ * 1.9073486e-06;
      auVar70._12_4_ = auVar237._12_4_ * 1.9073486e-06;
      auVar70._16_4_ = auVar237._16_4_ * 1.9073486e-06;
      auVar70._20_4_ = auVar237._20_4_ * 1.9073486e-06;
      auVar70._24_4_ = auVar237._24_4_ * 1.9073486e-06;
      auVar70._28_4_ = auVar237._28_4_;
      auVar237 = vandps_avx(auVar38,auVar335);
      auVar237 = vcmpps_avx(auVar237,auVar70,1);
      auVar305._8_4_ = 0xff800000;
      auVar305._0_8_ = 0xff800000ff800000;
      auVar305._12_4_ = 0xff800000;
      auVar305._16_4_ = 0xff800000;
      auVar305._20_4_ = 0xff800000;
      auVar305._24_4_ = 0xff800000;
      auVar305._28_4_ = 0xff800000;
      auVar446 = vblendvps_avx(auVar305,auVar69,auVar34);
      auVar138 = auVar34 & auVar237;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar138 >> 0x7f,0) != '\0') ||
            (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar138 >> 0xbf,0) != '\0') ||
          (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar138[0x1f] < '\0') {
        auVar145 = vandps_avx(auVar237,auVar34);
        auVar163 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
        auVar138 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar237 = vcmpps_avx(auVar180,auVar138,2);
        auVar390._8_4_ = 0xff800000;
        auVar390._0_8_ = 0xff800000ff800000;
        auVar390._12_4_ = 0xff800000;
        auVar390._16_4_ = 0xff800000;
        auVar390._20_4_ = 0xff800000;
        auVar390._24_4_ = 0xff800000;
        auVar390._28_4_ = 0xff800000;
        auVar391 = ZEXT3264(auVar390);
        auVar429._8_4_ = 0x7f800000;
        auVar429._0_8_ = 0x7f8000007f800000;
        auVar429._12_4_ = 0x7f800000;
        auVar429._16_4_ = 0x7f800000;
        auVar429._20_4_ = 0x7f800000;
        auVar429._24_4_ = 0x7f800000;
        auVar429._28_4_ = 0x7f800000;
        auVar180 = vblendvps_avx(auVar429,auVar390,auVar237);
        auVar132 = vpmovsxwd_avx(auVar163);
        auVar163 = vpunpckhwd_avx(auVar163,auVar163);
        auVar285._16_16_ = auVar163;
        auVar285._0_16_ = auVar132;
        auVar179 = vblendvps_avx(auVar179,auVar180,auVar285);
        auVar180 = vblendvps_avx(auVar390,auVar429,auVar237);
        auVar446 = vblendvps_avx(auVar446,auVar180,auVar285);
        auVar180 = vcmpps_avx(auVar138,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar150._0_4_ = auVar145._0_4_ ^ auVar180._0_4_;
        auVar150._4_4_ = auVar145._4_4_ ^ auVar180._4_4_;
        auVar150._8_4_ = auVar145._8_4_ ^ auVar180._8_4_;
        auVar150._12_4_ = auVar145._12_4_ ^ auVar180._12_4_;
        auVar150._16_4_ = auVar145._16_4_ ^ auVar180._16_4_;
        auVar150._20_4_ = auVar145._20_4_ ^ auVar180._20_4_;
        auVar150._24_4_ = auVar145._24_4_ ^ auVar180._24_4_;
        auVar150._28_4_ = auVar145._28_4_ ^ auVar180._28_4_;
        auVar145 = vorps_avx(auVar237,auVar150);
        auVar145 = vandps_avx(auVar34,auVar145);
      }
    }
    auVar415 = ZEXT3264(auVar34);
    auVar400 = ZEXT3264(auVar36);
    auVar336 = ZEXT3264(local_960);
    auVar309 = ZEXT3264(local_8c0);
    auVar286 = ZEXT3264(local_4a0);
    auVar34 = local_4a0 & auVar145;
    auVar258._8_4_ = 0x3f800000;
    auVar258._0_8_ = &DAT_3f8000003f800000;
    auVar258._12_4_ = 0x3f800000;
    auVar258._16_4_ = 0x3f800000;
    auVar258._20_4_ = 0x3f800000;
    auVar258._24_4_ = 0x3f800000;
    auVar258._28_4_ = 0x3f800000;
    auVar263 = ZEXT3264(auVar258);
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0x7f,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0xbf,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0')
    {
      local_2e0 = auVar33;
      auVar163 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_810._0_4_)),0);
      auVar259._16_16_ = auVar163;
      auVar259._0_16_ = auVar163;
      auVar237 = vminps_avx(auVar259,auVar446);
      auVar391 = ZEXT3264(_local_940);
      auVar215._0_4_ =
           (float)local_7a0._0_4_ * fVar296 +
           (float)local_a40._0_4_ * fVar408 + (float)local_940._0_4_ * fVar422;
      auVar215._4_4_ =
           (float)local_7a0._4_4_ * fVar310 +
           (float)local_a40._4_4_ * fVar416 + (float)local_940._4_4_ * fVar430;
      auVar215._8_4_ = fStack_798 * fVar312 + fStack_a38 * fVar417 + fStack_938 * fVar432;
      auVar215._12_4_ = fStack_794 * fVar314 + fStack_a34 * fVar418 + fStack_934 * fVar434;
      auVar215._16_4_ = fStack_790 * fVar317 + fStack_a30 * fVar419 + fStack_930 * fVar436;
      auVar215._20_4_ = fStack_78c * fVar321 + fStack_a2c * fVar420 + fStack_92c * fVar438;
      auVar215._24_4_ = fStack_788 * fVar325 + fStack_a28 * fVar421 + fStack_928 * fVar440;
      auVar215._28_4_ = fVar327 + local_4a0._28_4_ + 0.0;
      auVar34 = vrcpps_avx(auVar215);
      fVar348 = auVar34._0_4_;
      fVar360 = auVar34._4_4_;
      auVar71._4_4_ = auVar215._4_4_ * fVar360;
      auVar71._0_4_ = auVar215._0_4_ * fVar348;
      fVar327 = auVar34._8_4_;
      auVar71._8_4_ = auVar215._8_4_ * fVar327;
      fVar297 = auVar34._12_4_;
      auVar71._12_4_ = auVar215._12_4_ * fVar297;
      fVar311 = auVar34._16_4_;
      auVar71._16_4_ = auVar215._16_4_ * fVar311;
      fVar313 = auVar34._20_4_;
      auVar71._20_4_ = auVar215._20_4_ * fVar313;
      fVar315 = auVar34._24_4_;
      auVar71._24_4_ = auVar215._24_4_ * fVar315;
      auVar71._28_4_ = local_4a0._28_4_;
      auVar180 = vsubps_avx(auVar258,auVar71);
      auVar399._8_4_ = 0x7fffffff;
      auVar399._0_8_ = 0x7fffffff7fffffff;
      auVar399._12_4_ = 0x7fffffff;
      auVar399._16_4_ = 0x7fffffff;
      auVar399._20_4_ = 0x7fffffff;
      auVar399._24_4_ = 0x7fffffff;
      auVar399._28_4_ = 0x7fffffff;
      auVar400 = ZEXT3264(auVar399);
      auVar34 = vandps_avx(auVar399,auVar215);
      auVar378._8_4_ = 0x219392ef;
      auVar378._0_8_ = 0x219392ef219392ef;
      auVar378._12_4_ = 0x219392ef;
      auVar378._16_4_ = 0x219392ef;
      auVar378._20_4_ = 0x219392ef;
      auVar378._24_4_ = 0x219392ef;
      auVar378._28_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar34,auVar378,1);
      auVar415 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar72._4_4_ =
           (fVar360 + fVar360 * auVar180._4_4_) *
           -(fVar459 * fVar310 + fVar401 * fVar416 + fVar430 * fVar247);
      auVar72._0_4_ =
           (fVar348 + fVar348 * auVar180._0_4_) *
           -(fVar455 * fVar296 + fVar392 * fVar408 + fVar422 * fVar243);
      auVar72._8_4_ =
           (fVar327 + fVar327 * auVar180._8_4_) *
           -(fVar460 * fVar312 + fVar402 * fVar417 + fVar432 * fVar268);
      auVar72._12_4_ =
           (fVar297 + fVar297 * auVar180._12_4_) *
           -(fVar461 * fVar314 + fVar403 * fVar418 + fVar434 * fVar289);
      auVar72._16_4_ =
           (fVar311 + fVar311 * auVar180._16_4_) *
           -(fVar462 * fVar317 + fVar404 * fVar419 + fVar436 * fVar319);
      auVar72._20_4_ =
           (fVar313 + fVar313 * auVar180._20_4_) *
           -(fVar463 * fVar321 + fVar405 * fVar420 + fVar438 * fVar337);
      auVar72._24_4_ =
           (fVar315 + fVar315 * auVar180._24_4_) *
           -(fVar464 * fVar325 + fVar406 * fVar421 + fVar440 * fVar346);
      auVar72._28_4_ = -(auVar179._28_4_ + 0.0 + 0.0);
      auVar180 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar34 = vcmpps_avx(auVar215,auVar180,1);
      auVar34 = vorps_avx(auVar36,auVar34);
      auVar428._8_4_ = 0xff800000;
      auVar428._0_8_ = 0xff800000ff800000;
      auVar428._12_4_ = 0xff800000;
      auVar428._16_4_ = 0xff800000;
      auVar428._20_4_ = 0xff800000;
      auVar428._24_4_ = 0xff800000;
      auVar428._28_4_ = 0xff800000;
      auVar34 = vblendvps_avx(auVar72,auVar428,auVar34);
      auVar180 = vcmpps_avx(auVar215,auVar180,6);
      auVar36 = vorps_avx(auVar36,auVar180);
      auVar447._8_4_ = 0x7f800000;
      auVar447._0_8_ = 0x7f8000007f800000;
      auVar447._12_4_ = 0x7f800000;
      auVar447._16_4_ = 0x7f800000;
      auVar447._20_4_ = 0x7f800000;
      auVar447._24_4_ = 0x7f800000;
      auVar447._28_4_ = 0x7f800000;
      auVar36 = vblendvps_avx(auVar72,auVar447,auVar36);
      auVar180 = vmaxps_avx(local_2a0,auVar179);
      auVar180 = vmaxps_avx(auVar180,auVar34);
      auVar36 = vminps_avx(auVar237,auVar36);
      auVar379 = ZEXT3264(auVar36);
      auVar176 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar34 = vsubps_avx(auVar176,_local_a20);
      auVar283 = vsubps_avx(auVar176,auVar283);
      auVar73._4_4_ = auVar283._4_4_ * -fVar431;
      auVar73._0_4_ = auVar283._0_4_ * -fVar423;
      auVar73._8_4_ = auVar283._8_4_ * -fVar433;
      auVar73._12_4_ = auVar283._12_4_ * -fVar435;
      auVar73._16_4_ = auVar283._16_4_ * -fVar437;
      auVar73._20_4_ = auVar283._20_4_ * -fVar439;
      auVar73._24_4_ = auVar283._24_4_ * -fVar441;
      auVar73._28_4_ = auVar283._28_4_;
      auVar74._4_4_ = fVar449 * auVar34._4_4_;
      auVar74._0_4_ = fVar443 * auVar34._0_4_;
      auVar74._8_4_ = fVar450 * auVar34._8_4_;
      auVar74._12_4_ = fVar451 * auVar34._12_4_;
      auVar74._16_4_ = fVar452 * auVar34._16_4_;
      auVar74._20_4_ = fVar453 * auVar34._20_4_;
      auVar74._24_4_ = fVar454 * auVar34._24_4_;
      auVar74._28_4_ = auVar34._28_4_;
      auVar34 = vsubps_avx(auVar73,auVar74);
      auVar283 = vsubps_avx(auVar176,local_720);
      auVar336 = ZEXT3264(auVar145);
      auVar75._4_4_ = fVar246 * auVar283._4_4_;
      auVar75._0_4_ = fVar197 * auVar283._0_4_;
      auVar75._8_4_ = fVar267 * auVar283._8_4_;
      auVar75._12_4_ = fVar288 * auVar283._12_4_;
      auVar75._16_4_ = fVar316 * auVar283._16_4_;
      auVar75._20_4_ = fVar328 * auVar283._20_4_;
      uVar8 = auVar283._28_4_;
      auVar75._24_4_ = fVar344 * auVar283._24_4_;
      auVar75._28_4_ = uVar8;
      auVar138 = vsubps_avx(auVar34,auVar75);
      auVar76._4_4_ = (float)local_940._4_4_ * -fVar431;
      auVar76._0_4_ = (float)local_940._0_4_ * -fVar423;
      auVar76._8_4_ = fStack_938 * -fVar433;
      auVar76._12_4_ = fStack_934 * -fVar435;
      auVar76._16_4_ = fStack_930 * -fVar437;
      auVar76._20_4_ = fStack_92c * -fVar439;
      auVar76._24_4_ = fStack_928 * -fVar441;
      auVar76._28_4_ = uVar110 ^ 0x80000000;
      auVar77._4_4_ = (float)local_a40._4_4_ * fVar449;
      auVar77._0_4_ = (float)local_a40._0_4_ * fVar443;
      auVar77._8_4_ = fStack_a38 * fVar450;
      auVar77._12_4_ = fStack_a34 * fVar451;
      auVar77._16_4_ = fStack_a30 * fVar452;
      auVar77._20_4_ = fStack_a2c * fVar453;
      auVar77._24_4_ = fStack_a28 * fVar454;
      auVar77._28_4_ = uVar8;
      auVar457._8_4_ = 0x3f800000;
      auVar457._0_8_ = &DAT_3f8000003f800000;
      auVar457._12_4_ = 0x3f800000;
      auVar457._16_4_ = 0x3f800000;
      auVar457._20_4_ = 0x3f800000;
      auVar457._24_4_ = 0x3f800000;
      auVar457._28_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar76,auVar77);
      auVar78._4_4_ = (float)local_7a0._4_4_ * fVar246;
      auVar78._0_4_ = (float)local_7a0._0_4_ * fVar197;
      auVar78._8_4_ = fStack_798 * fVar267;
      auVar78._12_4_ = fStack_794 * fVar288;
      auVar78._16_4_ = fStack_790 * fVar316;
      auVar78._20_4_ = fStack_78c * fVar328;
      auVar78._24_4_ = fStack_788 * fVar344;
      auVar78._28_4_ = uVar8;
      auVar139 = vsubps_avx(auVar34,auVar78);
      auVar34 = vrcpps_avx(auVar139);
      fVar197 = auVar34._0_4_;
      fVar243 = auVar34._4_4_;
      auVar79._4_4_ = auVar139._4_4_ * fVar243;
      auVar79._0_4_ = auVar139._0_4_ * fVar197;
      fVar246 = auVar34._8_4_;
      auVar79._8_4_ = auVar139._8_4_ * fVar246;
      fVar247 = auVar34._12_4_;
      auVar79._12_4_ = auVar139._12_4_ * fVar247;
      fVar267 = auVar34._16_4_;
      auVar79._16_4_ = auVar139._16_4_ * fVar267;
      fVar268 = auVar34._20_4_;
      auVar79._20_4_ = auVar139._20_4_ * fVar268;
      fVar288 = auVar34._24_4_;
      auVar79._24_4_ = auVar139._24_4_ * fVar288;
      auVar79._28_4_ = fStack_784;
      auVar175 = vsubps_avx(auVar457,auVar79);
      auVar34 = vandps_avx(auVar399,auVar139);
      auVar143._8_4_ = 0x219392ef;
      auVar143._0_8_ = 0x219392ef219392ef;
      auVar143._12_4_ = 0x219392ef;
      auVar143._16_4_ = 0x219392ef;
      auVar143._20_4_ = 0x219392ef;
      auVar143._24_4_ = 0x219392ef;
      auVar143._28_4_ = 0x219392ef;
      auVar283 = vcmpps_avx(auVar34,auVar143,1);
      auVar309 = ZEXT3264(auVar283);
      auVar80._4_4_ = (fVar243 + fVar243 * auVar175._4_4_) * -auVar138._4_4_;
      auVar80._0_4_ = (fVar197 + fVar197 * auVar175._0_4_) * -auVar138._0_4_;
      auVar80._8_4_ = (fVar246 + fVar246 * auVar175._8_4_) * -auVar138._8_4_;
      auVar80._12_4_ = (fVar247 + fVar247 * auVar175._12_4_) * -auVar138._12_4_;
      auVar80._16_4_ = (fVar267 + fVar267 * auVar175._16_4_) * -auVar138._16_4_;
      auVar80._20_4_ = (fVar268 + fVar268 * auVar175._20_4_) * -auVar138._20_4_;
      auVar80._24_4_ = (fVar288 + fVar288 * auVar175._24_4_) * -auVar138._24_4_;
      auVar80._28_4_ = auVar138._28_4_ ^ 0x80000000;
      auVar34 = vcmpps_avx(auVar139,auVar176,1);
      auVar34 = vorps_avx(auVar283,auVar34);
      auVar34 = vblendvps_avx(auVar80,auVar428,auVar34);
      _local_8e0 = vmaxps_avx(auVar180,auVar34);
      auVar286 = ZEXT864(0) << 0x20;
      auVar34 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,6);
      auVar34 = vorps_avx(auVar283,auVar34);
      auVar34 = vblendvps_avx(auVar80,auVar447,auVar34);
      auVar145 = vandps_avx(auVar145,local_4a0);
      local_300 = vminps_avx(auVar36,auVar34);
      auVar34 = vcmpps_avx(_local_8e0,local_300,2);
      auVar283 = auVar145 & auVar34;
      if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar283 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar283 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar283 >> 0x7f,0) == '\0') &&
            (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar283 >> 0xbf,0) == '\0') &&
          (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar283[0x1f]) {
        auVar263 = ZEXT3264(auVar457);
      }
      else {
        auVar283 = vminps_avx(_local_ba0,auVar142);
        auVar36 = vminps_avx(local_780,auVar35);
        auVar283 = vminps_avx(auVar283,auVar36);
        auVar283 = vsubps_avx(auVar283,auVar236);
        auVar145 = vandps_avx(auVar34,auVar145);
        auVar109._4_4_ = local_4e0[1];
        auVar109._0_4_ = local_4e0[0];
        auVar109._8_4_ = local_4e0[2];
        auVar109._12_4_ = local_4e0[3];
        auVar109._16_4_ = fStack_4d0;
        auVar109._20_4_ = fStack_4cc;
        auVar109._24_4_ = fStack_4c8;
        auVar109._28_4_ = fStack_4c4;
        auVar34 = vminps_avx(auVar109,auVar457);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar199 + fVar442 * (auVar34._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar221 + fVar193 * (auVar34._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar222 + fVar194 * (auVar34._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar223 + fVar196 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar199 + fVar442 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar221 + fVar193 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar222 + fVar194 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar223 + auVar34._28_4_ + 7.0;
        auVar108._4_4_ = local_500[1];
        auVar108._0_4_ = local_500[0];
        auVar108._8_4_ = local_500[2];
        auVar108._12_4_ = local_500[3];
        auVar108._16_4_ = fStack_4f0;
        auVar108._20_4_ = fStack_4ec;
        auVar108._24_4_ = fStack_4e8;
        auVar108._28_4_ = fStack_4e4;
        auVar34 = vminps_avx(auVar108,auVar457);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_500[0] = fVar199 + fVar442 * (auVar34._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar221 + fVar193 * (auVar34._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar222 + fVar194 * (auVar34._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar223 + fVar196 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar199 + fVar442 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar221 + fVar193 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar222 + fVar194 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar223 + auVar34._28_4_ + 7.0;
        auVar81._4_4_ = auVar283._4_4_ * 0.99999976;
        auVar81._0_4_ = auVar283._0_4_ * 0.99999976;
        auVar81._8_4_ = auVar283._8_4_ * 0.99999976;
        auVar81._12_4_ = auVar283._12_4_ * 0.99999976;
        auVar81._16_4_ = auVar283._16_4_ * 0.99999976;
        auVar81._20_4_ = auVar283._20_4_ * 0.99999976;
        auVar81._24_4_ = auVar283._24_4_ * 0.99999976;
        auVar81._28_4_ = 0x3f7ffffc;
        auVar34 = vmaxps_avx(ZEXT832(0) << 0x20,auVar81);
        auVar82._4_4_ = auVar34._4_4_ * auVar34._4_4_;
        auVar82._0_4_ = auVar34._0_4_ * auVar34._0_4_;
        auVar82._8_4_ = auVar34._8_4_ * auVar34._8_4_;
        auVar82._12_4_ = auVar34._12_4_ * auVar34._12_4_;
        auVar82._16_4_ = auVar34._16_4_ * auVar34._16_4_;
        auVar82._20_4_ = auVar34._20_4_ * auVar34._20_4_;
        auVar82._24_4_ = auVar34._24_4_ * auVar34._24_4_;
        auVar82._28_4_ = auVar34._28_4_;
        auVar283 = vsubps_avx(auVar37,auVar82);
        auVar83._4_4_ = auVar283._4_4_ * fVar364 * 4.0;
        auVar83._0_4_ = auVar283._0_4_ * fVar362 * 4.0;
        auVar83._8_4_ = auVar283._8_4_ * fVar366 * 4.0;
        auVar83._12_4_ = auVar283._12_4_ * fVar368 * 4.0;
        auVar83._16_4_ = auVar283._16_4_ * fVar380 * 4.0;
        auVar83._20_4_ = auVar283._20_4_ * fVar381 * 4.0;
        auVar83._24_4_ = auVar283._24_4_ * fVar382 * 4.0;
        auVar83._28_4_ = auVar34._28_4_;
        auVar236 = vsubps_avx(auVar65,auVar83);
        local_aa0 = vcmpps_avx(auVar236,ZEXT832(0) << 0x20,5);
        auVar456 = local_940._0_28_;
        auVar34 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          auVar180 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_620 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          auVar231 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar379 = ZEXT864(0) << 0x20;
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar278._8_4_ = 0xff800000;
          auVar278._0_8_ = 0xff800000ff800000;
          auVar278._12_4_ = 0xff800000;
          auVar278._16_4_ = 0xff800000;
          auVar278._20_4_ = 0xff800000;
          auVar278._24_4_ = 0xff800000;
          auVar278._28_4_ = 0xff800000;
          auVar389 = _local_760;
          local_aa0 = auVar41;
          _local_600 = _local_620;
        }
        else {
          auVar180 = vsqrtps_avx(auVar236);
          auVar238._0_4_ = fVar362 + fVar362;
          auVar238._4_4_ = fVar364 + fVar364;
          auVar238._8_4_ = fVar366 + fVar366;
          auVar238._12_4_ = fVar368 + fVar368;
          auVar238._16_4_ = fVar380 + fVar380;
          auVar238._20_4_ = fVar381 + fVar381;
          auVar238._24_4_ = fVar382 + fVar382;
          auVar238._28_4_ = fVar159 + fVar159;
          auVar36 = vrcpps_avx(auVar238);
          fVar159 = auVar36._0_4_;
          fVar197 = auVar36._4_4_;
          auVar84._4_4_ = auVar238._4_4_ * fVar197;
          auVar84._0_4_ = auVar238._0_4_ * fVar159;
          fVar243 = auVar36._8_4_;
          auVar84._8_4_ = auVar238._8_4_ * fVar243;
          fVar246 = auVar36._12_4_;
          auVar84._12_4_ = auVar238._12_4_ * fVar246;
          fVar247 = auVar36._16_4_;
          auVar84._16_4_ = auVar238._16_4_ * fVar247;
          fVar267 = auVar36._20_4_;
          auVar84._20_4_ = auVar238._20_4_ * fVar267;
          fVar268 = auVar36._24_4_;
          auVar84._24_4_ = auVar238._24_4_ * fVar268;
          auVar84._28_4_ = auVar238._28_4_;
          auVar37 = vsubps_avx(auVar457,auVar84);
          fVar159 = fVar159 + fVar159 * auVar37._0_4_;
          fVar197 = fVar197 + fVar197 * auVar37._4_4_;
          fVar243 = fVar243 + fVar243 * auVar37._8_4_;
          fVar246 = fVar246 + fVar246 * auVar37._12_4_;
          fVar247 = fVar247 + fVar247 * auVar37._16_4_;
          fVar267 = fVar267 + fVar267 * auVar37._20_4_;
          fVar268 = fVar268 + fVar268 * auVar37._24_4_;
          fVar288 = auVar36._28_4_ + auVar37._28_4_;
          auVar279._0_8_ = local_8c0._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = -local_8c0._8_4_;
          auVar279._12_4_ = -local_8c0._12_4_;
          auVar279._16_4_ = -local_8c0._16_4_;
          auVar279._20_4_ = -local_8c0._20_4_;
          auVar279._24_4_ = -local_8c0._24_4_;
          auVar279._28_4_ = -local_8c0._28_4_;
          auVar36 = vsubps_avx(auVar279,auVar180);
          fVar348 = auVar36._0_4_ * fVar159;
          fVar360 = auVar36._4_4_ * fVar197;
          auVar85._4_4_ = fVar360;
          auVar85._0_4_ = fVar348;
          fVar362 = auVar36._8_4_ * fVar243;
          auVar85._8_4_ = fVar362;
          fVar364 = auVar36._12_4_ * fVar246;
          auVar85._12_4_ = fVar364;
          fVar366 = auVar36._16_4_ * fVar247;
          auVar85._16_4_ = fVar366;
          fVar368 = auVar36._20_4_ * fVar267;
          auVar85._20_4_ = fVar368;
          fVar442 = auVar36._24_4_ * fVar268;
          auVar85._24_4_ = fVar442;
          auVar85._28_4_ = 0xff800000;
          auVar180 = vsubps_avx(auVar180,local_8c0);
          fVar159 = auVar180._0_4_ * fVar159;
          fVar197 = auVar180._4_4_ * fVar197;
          auVar86._4_4_ = fVar197;
          auVar86._0_4_ = fVar159;
          fVar243 = auVar180._8_4_ * fVar243;
          auVar86._8_4_ = fVar243;
          fVar246 = auVar180._12_4_ * fVar246;
          auVar86._12_4_ = fVar246;
          fVar247 = auVar180._16_4_ * fVar247;
          auVar86._16_4_ = fVar247;
          fVar267 = auVar180._20_4_ * fVar267;
          auVar86._20_4_ = fVar267;
          fVar268 = auVar180._24_4_ * fVar268;
          auVar86._24_4_ = fVar268;
          auVar86._28_4_ = 0x80000000;
          auVar415 = ZEXT3264(auVar86);
          fVar289 = fVar370 * (fVar348 * (float)local_a00._0_4_ + (float)local_960._0_4_);
          fVar316 = fVar372 * (fVar360 * (float)local_a00._4_4_ + local_960._4_4_);
          fVar319 = fVar383 * (fVar362 * fStack_9f8 + local_960._8_4_);
          fVar328 = fVar384 * (fVar364 * fStack_9f4 + local_960._12_4_);
          fVar337 = fVar291 * (fVar366 * fStack_9f0 + local_960._16_4_);
          fVar344 = fVar293 * (fVar368 * fStack_9ec + local_960._20_4_);
          fVar346 = fVar295 * (fVar442 * fStack_9e8 + local_960._24_4_);
          auVar181._0_4_ = fVar349 + fVar242 * fVar289;
          auVar181._4_4_ = fVar361 + fVar245 * fVar316;
          auVar181._8_4_ = fVar363 + fVar266 * fVar319;
          auVar181._12_4_ = fVar365 + fVar287 * fVar328;
          auVar181._16_4_ = fVar367 + fVar294 * fVar337;
          auVar181._20_4_ = fVar369 + fVar324 * fVar344;
          auVar181._24_4_ = fVar371 + fVar342 * fVar346;
          auVar181._28_4_ = fVar373 + auVar180._28_4_ + local_960._28_4_;
          auVar87._4_4_ = (float)local_7a0._4_4_ * fVar360;
          auVar87._0_4_ = (float)local_7a0._0_4_ * fVar348;
          auVar87._8_4_ = fStack_798 * fVar362;
          auVar87._12_4_ = fStack_794 * fVar364;
          auVar87._16_4_ = fStack_790 * fVar366;
          auVar87._20_4_ = fStack_78c * fVar368;
          auVar87._24_4_ = fStack_788 * fVar442;
          auVar87._28_4_ = fVar288;
          auVar180 = vsubps_avx(auVar87,auVar181);
          auVar239._0_4_ = local_880 + fVar241 * fVar289;
          auVar239._4_4_ = fStack_87c + fVar198 * fVar316;
          auVar239._8_4_ = fStack_878 + fVar264 * fVar319;
          auVar239._12_4_ = fStack_874 + fVar269 * fVar328;
          auVar239._16_4_ = fStack_870 + fVar290 * fVar337;
          auVar239._20_4_ = fStack_86c + fVar320 * fVar344;
          auVar239._24_4_ = fStack_868 + fVar338 * fVar346;
          auVar239._28_4_ = fStack_864 + fVar288;
          auVar306._0_4_ = (float)local_a40._0_4_ * fVar348;
          auVar306._4_4_ = (float)local_a40._4_4_ * fVar360;
          auVar306._8_4_ = fStack_a38 * fVar362;
          auVar306._12_4_ = fStack_a34 * fVar364;
          auVar306._16_4_ = fStack_a30 * fVar366;
          auVar306._20_4_ = fStack_a2c * fVar368;
          auVar306._24_4_ = fStack_a28 * fVar442;
          auVar306._28_4_ = 0;
          auVar37 = vsubps_avx(auVar306,auVar239);
          auVar280._0_4_ = fVar122 + fVar195 * fVar289;
          auVar280._4_4_ = fVar153 + fVar244 * fVar316;
          auVar280._8_4_ = fVar154 + fVar265 * fVar319;
          auVar280._12_4_ = fVar155 + fVar270 * fVar328;
          auVar280._16_4_ = fVar156 + fVar292 * fVar337;
          auVar280._20_4_ = fVar157 + fVar323 * fVar344;
          auVar280._24_4_ = fVar158 + fVar340 * fVar346;
          auVar280._28_4_ = fVar407 + auVar36._28_4_;
          auVar88._4_4_ = (float)local_940._4_4_ * fVar360;
          auVar88._0_4_ = (float)local_940._0_4_ * fVar348;
          auVar88._8_4_ = fStack_938 * fVar362;
          auVar88._12_4_ = fStack_934 * fVar364;
          auVar88._16_4_ = fStack_930 * fVar366;
          auVar88._20_4_ = fStack_92c * fVar368;
          auVar88._24_4_ = fStack_928 * fVar442;
          auVar88._28_4_ = 0;
          local_8a0 = vsubps_avx(auVar88,auVar280);
          fVar370 = fVar370 * (fVar159 * (float)local_a00._0_4_ + (float)local_960._0_4_);
          fVar372 = fVar372 * (fVar197 * (float)local_a00._4_4_ + local_960._4_4_);
          fVar383 = fVar383 * (fVar243 * fStack_9f8 + local_960._8_4_);
          fVar384 = fVar384 * (fVar246 * fStack_9f4 + local_960._12_4_);
          fVar291 = fVar291 * (fVar247 * fStack_9f0 + local_960._16_4_);
          fVar293 = fVar293 * (fVar267 * fStack_9ec + local_960._20_4_);
          fVar295 = fVar295 * (fVar268 * fStack_9e8 + local_960._24_4_);
          auVar307._0_4_ = fVar349 + fVar242 * fVar370;
          auVar307._4_4_ = fVar361 + fVar245 * fVar372;
          auVar307._8_4_ = fVar363 + fVar266 * fVar383;
          auVar307._12_4_ = fVar365 + fVar287 * fVar384;
          auVar307._16_4_ = fVar367 + fVar294 * fVar291;
          auVar307._20_4_ = fVar369 + fVar324 * fVar293;
          auVar307._24_4_ = fVar371 + fVar342 * fVar295;
          auVar307._28_4_ = fVar373 + 0.0;
          auVar89._4_4_ = (float)local_7a0._4_4_ * fVar197;
          auVar89._0_4_ = (float)local_7a0._0_4_ * fVar159;
          auVar89._8_4_ = fStack_798 * fVar243;
          auVar89._12_4_ = fStack_794 * fVar246;
          auVar89._16_4_ = fStack_790 * fVar247;
          auVar89._20_4_ = fStack_78c * fVar267;
          auVar89._24_4_ = fStack_788 * fVar268;
          auVar89._28_4_ = fStack_784;
          _local_600 = vsubps_avx(auVar89,auVar307);
          auVar308._0_4_ = local_880 + fVar241 * fVar370;
          auVar308._4_4_ = fStack_87c + fVar198 * fVar372;
          auVar308._8_4_ = fStack_878 + fVar264 * fVar383;
          auVar308._12_4_ = fStack_874 + fVar269 * fVar384;
          auVar308._16_4_ = fStack_870 + fVar290 * fVar291;
          auVar308._20_4_ = fStack_86c + fVar320 * fVar293;
          auVar308._24_4_ = fStack_868 + fVar338 * fVar295;
          auVar308._28_4_ = fStack_864 + local_600._28_4_;
          auVar90._4_4_ = (float)local_a40._4_4_ * fVar197;
          auVar90._0_4_ = (float)local_a40._0_4_ * fVar159;
          auVar90._8_4_ = fStack_a38 * fVar243;
          auVar90._12_4_ = fStack_a34 * fVar246;
          auVar90._16_4_ = fStack_a30 * fVar247;
          auVar90._20_4_ = fStack_a2c * fVar267;
          auVar90._24_4_ = fStack_a28 * fVar268;
          auVar90._28_4_ = fStack_784;
          _local_620 = vsubps_avx(auVar90,auVar308);
          auVar281._0_4_ = fVar122 + fVar195 * fVar370;
          auVar281._4_4_ = fVar153 + fVar244 * fVar372;
          auVar281._8_4_ = fVar154 + fVar265 * fVar383;
          auVar281._12_4_ = fVar155 + fVar270 * fVar384;
          auVar281._16_4_ = fVar156 + fVar292 * fVar291;
          auVar281._20_4_ = fVar157 + fVar323 * fVar293;
          auVar281._24_4_ = fVar158 + fVar340 * fVar295;
          auVar281._28_4_ = fVar407 + local_8a0._28_4_ + local_960._28_4_;
          auVar91._4_4_ = (float)local_940._4_4_ * fVar197;
          auVar91._0_4_ = (float)local_940._0_4_ * fVar159;
          auVar91._8_4_ = fStack_938 * fVar243;
          auVar91._12_4_ = fStack_934 * fVar246;
          auVar91._16_4_ = fStack_930 * fVar247;
          auVar91._20_4_ = fStack_92c * fVar267;
          auVar91._24_4_ = fStack_928 * fVar268;
          auVar91._28_4_ = local_620._28_4_;
          _local_640 = vsubps_avx(auVar91,auVar281);
          auVar36 = vcmpps_avx(auVar236,_DAT_02020f00,5);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar260 = vblendvps_avx(auVar261,auVar85,auVar36);
          auVar358._8_4_ = 0x7fffffff;
          auVar358._0_8_ = 0x7fffffff7fffffff;
          auVar358._12_4_ = 0x7fffffff;
          auVar358._16_4_ = 0x7fffffff;
          auVar358._20_4_ = 0x7fffffff;
          auVar358._24_4_ = 0x7fffffff;
          auVar358._28_4_ = 0x7fffffff;
          auVar236 = vandps_avx(auVar358,auVar64);
          auVar236 = vmaxps_avx(local_4c0,auVar236);
          auVar389._8_4_ = 0x36000000;
          auVar389._0_8_ = 0x3600000036000000;
          auVar389._12_4_ = 0x36000000;
          auVar389._16_4_ = 0x36000000;
          auVar389._20_4_ = 0x36000000;
          auVar389._24_4_ = 0x36000000;
          auVar389._28_4_ = 0x36000000;
          auVar92._4_4_ = auVar236._4_4_ * 1.9073486e-06;
          auVar92._0_4_ = auVar236._0_4_ * 1.9073486e-06;
          auVar92._8_4_ = auVar236._8_4_ * 1.9073486e-06;
          auVar92._12_4_ = auVar236._12_4_ * 1.9073486e-06;
          auVar92._16_4_ = auVar236._16_4_ * 1.9073486e-06;
          auVar92._20_4_ = auVar236._20_4_ * 1.9073486e-06;
          auVar92._24_4_ = auVar236._24_4_ * 1.9073486e-06;
          auVar92._28_4_ = auVar236._28_4_;
          auVar236 = vandps_avx(auVar358,auVar38);
          auVar236 = vcmpps_avx(auVar236,auVar92,1);
          auVar282._8_4_ = 0xff800000;
          auVar282._0_8_ = 0xff800000ff800000;
          auVar282._12_4_ = 0xff800000;
          auVar282._16_4_ = 0xff800000;
          auVar282._20_4_ = 0xff800000;
          auVar282._24_4_ = 0xff800000;
          auVar282._28_4_ = 0xff800000;
          auVar278 = vblendvps_avx(auVar282,auVar86,auVar36);
          auVar38 = auVar36 & auVar236;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            auVar34 = vandps_avx(auVar236,auVar36);
            auVar163 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
            auVar236 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar389 = vcmpps_avx(auVar283,auVar236,2);
            auVar448._8_4_ = 0xff800000;
            auVar448._0_8_ = 0xff800000ff800000;
            auVar448._12_4_ = 0xff800000;
            auVar448._16_4_ = 0xff800000;
            auVar448._20_4_ = 0xff800000;
            auVar448._24_4_ = 0xff800000;
            auVar448._28_4_ = 0xff800000;
            auVar458._8_4_ = 0x7f800000;
            auVar458._0_8_ = 0x7f8000007f800000;
            auVar458._12_4_ = 0x7f800000;
            auVar458._16_4_ = 0x7f800000;
            auVar458._20_4_ = 0x7f800000;
            auVar458._24_4_ = 0x7f800000;
            auVar458._28_4_ = 0x7f800000;
            auVar33 = vblendvps_avx(auVar458,auVar448,auVar389);
            auVar132 = vpmovsxwd_avx(auVar163);
            auVar415 = ZEXT1664(auVar132);
            auVar163 = vpunpckhwd_avx(auVar163,auVar163);
            auVar359._16_16_ = auVar163;
            auVar359._0_16_ = auVar132;
            auVar260 = vblendvps_avx(auVar260,auVar33,auVar359);
            auVar33 = vblendvps_avx(auVar448,auVar458,auVar389);
            auVar278 = vblendvps_avx(auVar278,auVar33,auVar359);
            auVar283 = vcmpps_avx(auVar236,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar151._0_4_ = auVar283._0_4_ ^ auVar34._0_4_;
            auVar151._4_4_ = auVar283._4_4_ ^ auVar34._4_4_;
            auVar151._8_4_ = auVar283._8_4_ ^ auVar34._8_4_;
            auVar151._12_4_ = auVar283._12_4_ ^ auVar34._12_4_;
            auVar151._16_4_ = auVar283._16_4_ ^ auVar34._16_4_;
            auVar151._20_4_ = auVar283._20_4_ ^ auVar34._20_4_;
            auVar151._24_4_ = auVar283._24_4_ ^ auVar34._24_4_;
            auVar151._28_4_ = auVar283._28_4_ ^ auVar34._28_4_;
            auVar34 = vorps_avx(auVar389,auVar151);
            auVar34 = vandps_avx(auVar36,auVar34);
          }
          auVar400 = ZEXT3264(auVar33);
          auVar231 = auVar37._0_28_;
          auVar379 = ZEXT3264(local_8a0);
          _local_a20 = auVar180;
        }
        auVar391 = ZEXT3264(auVar389);
        auVar336 = ZEXT3264(auVar145);
        _local_360 = _local_8e0;
        local_340 = vminps_avx(local_300,auVar260);
        _local_320 = vmaxps_avx(_local_8e0,auVar278);
        auVar286 = ZEXT3264(_local_320);
        auVar33 = vcmpps_avx(_local_8e0,local_340,2);
        local_520 = vandps_avx(auVar33,auVar145);
        auVar33 = vcmpps_avx(_local_320,local_300,2);
        local_5c0 = vandps_avx(auVar33,auVar145);
        auVar309 = ZEXT3264(local_5c0);
        auVar145 = vorps_avx(local_5c0,local_520);
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0x7f,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0xbf,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar145[0x1f] < '\0') {
          local_860 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_580._0_4_ = auVar34._0_4_ ^ local_860._0_4_;
          local_580._4_4_ = auVar34._4_4_ ^ local_860._4_4_;
          local_580._8_4_ = auVar34._8_4_ ^ local_860._8_4_;
          local_580._12_4_ = auVar34._12_4_ ^ local_860._12_4_;
          local_580._16_4_ = auVar34._16_4_ ^ local_860._16_4_;
          local_580._20_4_ = auVar34._20_4_ ^ local_860._20_4_;
          local_580._24_4_ = auVar34._24_4_ ^ local_860._24_4_;
          local_580._28_4_ = (uint)auVar34._28_4_ ^ local_860._28_4_;
          auVar336 = ZEXT3264(local_580);
          auVar144._0_4_ =
               auVar180._0_4_ * (float)local_7a0._0_4_ +
               (float)local_a40._0_4_ * auVar231._0_4_ + (float)local_940._0_4_ * auVar379._0_4_;
          auVar144._4_4_ =
               auVar180._4_4_ * (float)local_7a0._4_4_ +
               (float)local_a40._4_4_ * auVar231._4_4_ + (float)local_940._4_4_ * auVar379._4_4_;
          auVar144._8_4_ =
               auVar180._8_4_ * fStack_798 +
               fStack_a38 * auVar231._8_4_ + fStack_938 * auVar379._8_4_;
          auVar144._12_4_ =
               auVar180._12_4_ * fStack_794 +
               fStack_a34 * auVar231._12_4_ + fStack_934 * auVar379._12_4_;
          auVar144._16_4_ =
               auVar180._16_4_ * fStack_790 +
               fStack_a30 * auVar231._16_4_ + fStack_930 * auVar379._16_4_;
          auVar144._20_4_ =
               auVar180._20_4_ * fStack_78c +
               fStack_a2c * auVar231._20_4_ + fStack_92c * auVar379._20_4_;
          auVar144._24_4_ =
               auVar180._24_4_ * fStack_788 +
               fStack_a28 * auVar231._24_4_ + fStack_928 * auVar379._24_4_;
          auVar144._28_4_ = auVar34._28_4_ + auVar180._28_4_ + fStack_a24;
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar182._16_4_ = 0x7fffffff;
          auVar182._20_4_ = 0x7fffffff;
          auVar182._24_4_ = 0x7fffffff;
          auVar182._28_4_ = 0x7fffffff;
          auVar145 = vandps_avx(auVar144,auVar182);
          auVar183._8_4_ = 0x3e99999a;
          auVar183._0_8_ = 0x3e99999a3e99999a;
          auVar183._12_4_ = 0x3e99999a;
          auVar183._16_4_ = 0x3e99999a;
          auVar183._20_4_ = 0x3e99999a;
          auVar183._24_4_ = 0x3e99999a;
          auVar183._28_4_ = 0x3e99999a;
          auVar145 = vcmpps_avx(auVar145,auVar183,1);
          auVar145 = vorps_avx(auVar145,local_580);
          auVar184._8_4_ = 3;
          auVar184._0_8_ = 0x300000003;
          auVar184._12_4_ = 3;
          auVar184._16_4_ = 3;
          auVar184._20_4_ = 3;
          auVar184._24_4_ = 3;
          auVar184._28_4_ = 3;
          auVar216._8_4_ = 2;
          auVar216._0_8_ = 0x200000002;
          auVar216._12_4_ = 2;
          auVar216._16_4_ = 2;
          auVar216._20_4_ = 2;
          auVar216._24_4_ = 2;
          auVar216._28_4_ = 2;
          auVar145 = vblendvps_avx(auVar216,auVar184,auVar145);
          local_560 = ZEXT432((uint)uVar118);
          local_7e0 = vpshufd_avx(ZEXT416((uint)uVar118),0);
          auVar163 = vpcmpgtd_avx(auVar145._16_16_,local_7e0);
          auStack_7d0 = auVar237._16_16_;
          auVar132 = vpcmpgtd_avx(auVar145._0_16_,local_7e0);
          auVar185._16_16_ = auVar163;
          auVar185._0_16_ = auVar132;
          auVar145 = vblendps_avx(ZEXT1632(auVar132),auVar185,0xf0);
          local_5a0 = vandnps_avx(auVar145,local_520);
          auVar263 = ZEXT3264(local_5a0);
          auVar33 = local_520 & ~auVar145;
          auStack_5d8 = auVar35._8_24_;
          local_5e0 = uVar118;
          local_540 = auVar145;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar286 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar283 = _local_320;
            fVar242 = (float)local_a40._0_4_;
            fVar197 = (float)local_a40._4_4_;
            fVar198 = fStack_a38;
            fVar244 = fStack_a34;
            fVar245 = fStack_a30;
            fVar246 = fStack_a2c;
            fVar247 = fStack_a28;
          }
          else {
            local_7c0._4_4_ = (float)local_8e0._4_4_ + (float)local_920._4_4_;
            local_7c0._0_4_ = (float)local_8e0._0_4_ + (float)local_920._0_4_;
            fStack_7b8 = fStack_8d8 + fStack_918;
            fStack_7b4 = fStack_8d4 + fStack_914;
            fStack_7b0 = fStack_8d0 + fStack_910;
            fStack_7ac = fStack_8cc + fStack_90c;
            fStack_7a8 = fStack_8c8 + fStack_908;
            fStack_7a4 = fStack_8c4 + fStack_904;
            auVar286 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            local_ac0 = _local_320;
            local_9c0 = local_5c0;
            do {
              auVar250 = auVar286._0_16_;
              auVar186._8_4_ = 0x7f800000;
              auVar186._0_8_ = 0x7f8000007f800000;
              auVar186._12_4_ = 0x7f800000;
              auVar186._16_4_ = 0x7f800000;
              auVar186._20_4_ = 0x7f800000;
              auVar186._24_4_ = 0x7f800000;
              auVar186._28_4_ = 0x7f800000;
              auVar145 = auVar263._0_32_;
              auVar33 = vblendvps_avx(auVar186,_local_8e0,auVar145);
              auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
              auVar34 = vminps_avx(auVar33,auVar34);
              auVar283 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar283);
              auVar283 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar283);
              auVar33 = vcmpps_avx(auVar33,auVar34,0);
              auVar34 = auVar145 & auVar33;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0x7f,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar34[0x1f] < '\0') {
                auVar145 = vandps_avx(auVar33,auVar145);
              }
              local_780._0_8_ = uVar117;
              uVar111 = vmovmskps_avx(auVar145);
              uVar110 = 0;
              if (uVar111 != 0) {
                for (; (uVar111 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                }
              }
              uVar118 = (ulong)uVar110;
              *(undefined4 *)(local_5a0 + uVar118 * 4) = 0;
              fVar159 = local_4e0[uVar118];
              uVar110 = *(uint *)(local_360 + uVar118 * 4);
              fVar241 = local_ac4;
              if ((float)local_900._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_900._0_4_);
                auVar250._8_4_ = 0x7fffffff;
                auVar250._0_8_ = 0x7fffffff7fffffff;
                auVar250._12_4_ = 0x7fffffff;
              }
              auVar400 = ZEXT464(uVar110);
              auVar379 = ZEXT464((uint)fVar159);
              auVar132 = vminps_avx(_local_a50,_local_a70);
              auVar163 = vmaxps_avx(_local_a50,_local_a70);
              auVar127 = vminps_avx(_local_a60,_local_a80);
              auVar134 = vminps_avx(auVar132,auVar127);
              auVar132 = vmaxps_avx(_local_a60,_local_a80);
              auVar127 = vmaxps_avx(auVar163,auVar132);
              auVar163 = vandps_avx(auVar134,auVar250);
              auVar132 = vandps_avx(auVar127,auVar250);
              auVar163 = vmaxps_avx(auVar163,auVar132);
              auVar132 = vmovshdup_avx(auVar163);
              auVar132 = vmaxss_avx(auVar132,auVar163);
              auVar163 = vshufpd_avx(auVar163,auVar163,1);
              auVar163 = vmaxss_avx(auVar163,auVar132);
              local_880 = auVar163._0_4_ * 1.9073486e-06;
              local_720._0_4_ = fVar241 * 1.9073486e-06;
              _local_760 = vshufps_avx(auVar127,auVar127,0xff);
              lVar113 = 5;
              do {
                fVar243 = auVar379._0_4_;
                fVar197 = 1.0 - fVar243;
                fVar159 = fVar197 * fVar197 * fVar197;
                fVar241 = fVar243 * fVar243;
                fVar195 = fVar243 * fVar241;
                fVar242 = fVar243 * fVar197;
                auVar163 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.16666667)),
                                       ZEXT416((uint)(fVar195 * 0.16666667)),0);
                auVar132 = ZEXT416((uint)((fVar195 * 4.0 + fVar159 +
                                          fVar243 * fVar242 * 12.0 + fVar197 * fVar242 * 6.0) *
                                         0.16666667));
                auVar132 = vshufps_avx(auVar132,auVar132,0);
                auVar127 = ZEXT416((uint)((fVar159 * 4.0 + fVar195 +
                                          fVar197 * fVar242 * 12.0 + fVar243 * fVar242 * 6.0) *
                                         0.16666667));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar134 = vshufps_avx(auVar400._0_16_,auVar400._0_16_,0);
                auVar202._0_4_ = auVar134._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar202._4_4_ = auVar134._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar202._8_4_ = auVar134._8_4_ * fStack_8e8 + 0.0;
                auVar202._12_4_ = auVar134._12_4_ * fStack_8e4 + 0.0;
                auVar134 = vshufps_avx(ZEXT416((uint)(fVar159 * 0.16666667)),
                                       ZEXT416((uint)(fVar159 * 0.16666667)),0);
                auVar125._0_4_ =
                     auVar134._0_4_ * (float)local_a50._0_4_ +
                     auVar127._0_4_ * (float)local_a70._0_4_ +
                     auVar163._0_4_ * (float)local_a80._0_4_ +
                     auVar132._0_4_ * (float)local_a60._0_4_;
                auVar125._4_4_ =
                     auVar134._4_4_ * (float)local_a50._4_4_ +
                     auVar127._4_4_ * (float)local_a70._4_4_ +
                     auVar163._4_4_ * (float)local_a80._4_4_ +
                     auVar132._4_4_ * (float)local_a60._4_4_;
                auVar125._8_4_ =
                     auVar134._8_4_ * fStack_a48 +
                     auVar127._8_4_ * fStack_a68 +
                     auVar163._8_4_ * fStack_a78 + auVar132._8_4_ * fStack_a58;
                auVar125._12_4_ =
                     auVar134._12_4_ * fStack_a44 +
                     auVar127._12_4_ * fStack_a64 +
                     auVar163._12_4_ * fStack_a74 + auVar132._12_4_ * fStack_a54;
                local_8a0._0_16_ = auVar125;
                auVar163 = vsubps_avx(auVar202,auVar125);
                _local_a20 = auVar163;
                auVar163 = vdpps_avx(auVar163,auVar163,0x7f);
                fVar159 = auVar163._0_4_;
                if (fVar159 < 0.0) {
                  local_aa0._0_4_ = fVar241;
                  local_9e0._0_4_ = fVar242;
                  fVar195 = sqrtf(fVar159);
                  fVar241 = (float)local_aa0._0_4_;
                  fVar242 = (float)local_9e0._0_4_;
                }
                else {
                  auVar132 = vsqrtss_avx(auVar163,auVar163);
                  fVar195 = auVar132._0_4_;
                }
                auVar132 = vshufps_avx(ZEXT416((uint)(fVar241 * 0.5)),ZEXT416((uint)(fVar241 * 0.5))
                                       ,0);
                auVar127 = ZEXT416((uint)((fVar197 * fVar197 + fVar242 * 4.0) * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar134 = ZEXT416((uint)((fVar243 * -fVar243 - fVar242 * 4.0) * 0.5));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar126 = ZEXT416((uint)(fVar197 * -fVar197 * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar350._0_4_ =
                     (float)local_a50._0_4_ * auVar126._0_4_ +
                     (float)local_a70._0_4_ * auVar134._0_4_ +
                     (float)local_a80._0_4_ * auVar132._0_4_ +
                     (float)local_a60._0_4_ * auVar127._0_4_;
                auVar350._4_4_ =
                     (float)local_a50._4_4_ * auVar126._4_4_ +
                     (float)local_a70._4_4_ * auVar134._4_4_ +
                     (float)local_a80._4_4_ * auVar132._4_4_ +
                     (float)local_a60._4_4_ * auVar127._4_4_;
                auVar350._8_4_ =
                     fStack_a48 * auVar126._8_4_ +
                     fStack_a68 * auVar134._8_4_ +
                     fStack_a78 * auVar132._8_4_ + fStack_a58 * auVar127._8_4_;
                auVar350._12_4_ =
                     fStack_a44 * auVar126._12_4_ +
                     fStack_a64 * auVar134._12_4_ +
                     fStack_a74 * auVar132._12_4_ + fStack_a54 * auVar127._12_4_;
                auVar132 = vshufps_avx(auVar379._0_16_,auVar379._0_16_,0);
                auVar127 = ZEXT416((uint)(fVar197 - (fVar243 + fVar243)));
                auVar134 = vshufps_avx(auVar127,auVar127,0);
                auVar127 = ZEXT416((uint)(fVar243 - (fVar197 + fVar197)));
                auVar126 = vshufps_avx(auVar127,auVar127,0);
                auVar133 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                auVar127 = vdpps_avx(auVar350,auVar350,0x7f);
                auVar164._0_4_ =
                     (float)local_a50._0_4_ * auVar133._0_4_ +
                     (float)local_a70._0_4_ * auVar126._0_4_ +
                     (float)local_a80._0_4_ * auVar132._0_4_ +
                     (float)local_a60._0_4_ * auVar134._0_4_;
                auVar164._4_4_ =
                     (float)local_a50._4_4_ * auVar133._4_4_ +
                     (float)local_a70._4_4_ * auVar126._4_4_ +
                     (float)local_a80._4_4_ * auVar132._4_4_ +
                     (float)local_a60._4_4_ * auVar134._4_4_;
                auVar164._8_4_ =
                     fStack_a48 * auVar133._8_4_ +
                     fStack_a68 * auVar126._8_4_ +
                     fStack_a78 * auVar132._8_4_ + fStack_a58 * auVar134._8_4_;
                auVar164._12_4_ =
                     fStack_a44 * auVar133._12_4_ +
                     fStack_a64 * auVar126._12_4_ +
                     fStack_a74 * auVar132._12_4_ + fStack_a54 * auVar134._12_4_;
                auVar132 = vblendps_avx(auVar127,_DAT_01feba10,0xe);
                auVar134 = vrsqrtss_avx(auVar132,auVar132);
                fVar242 = auVar134._0_4_;
                fVar241 = auVar127._0_4_;
                auVar134 = vdpps_avx(auVar350,auVar164,0x7f);
                auVar126 = vshufps_avx(auVar127,auVar127,0);
                auVar165._0_4_ = auVar164._0_4_ * auVar126._0_4_;
                auVar165._4_4_ = auVar164._4_4_ * auVar126._4_4_;
                auVar165._8_4_ = auVar164._8_4_ * auVar126._8_4_;
                auVar165._12_4_ = auVar164._12_4_ * auVar126._12_4_;
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar251._0_4_ = auVar350._0_4_ * auVar134._0_4_;
                auVar251._4_4_ = auVar350._4_4_ * auVar134._4_4_;
                auVar251._8_4_ = auVar350._8_4_ * auVar134._8_4_;
                auVar251._12_4_ = auVar350._12_4_ * auVar134._12_4_;
                auVar133 = vsubps_avx(auVar165,auVar251);
                auVar134 = vrcpss_avx(auVar132,auVar132);
                auVar132 = vmaxss_avx(ZEXT416((uint)local_880),
                                      ZEXT416((uint)(auVar400._0_4_ * (float)local_720._0_4_)));
                auVar415 = ZEXT1664(auVar132);
                auVar134 = ZEXT416((uint)(auVar134._0_4_ * (2.0 - fVar241 * auVar134._0_4_)));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                uVar118 = CONCAT44(auVar350._4_4_,auVar350._0_4_);
                auVar273._0_8_ = uVar118 ^ 0x8000000080000000;
                auVar273._8_4_ = -auVar350._8_4_;
                auVar273._12_4_ = -auVar350._12_4_;
                auVar126 = ZEXT416((uint)(fVar242 * 1.5 +
                                         fVar241 * -0.5 * fVar242 * fVar242 * fVar242));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar227._0_4_ = auVar126._0_4_ * auVar133._0_4_ * auVar134._0_4_;
                auVar227._4_4_ = auVar126._4_4_ * auVar133._4_4_ * auVar134._4_4_;
                auVar227._8_4_ = auVar126._8_4_ * auVar133._8_4_ * auVar134._8_4_;
                auVar227._12_4_ = auVar126._12_4_ * auVar133._12_4_ * auVar134._12_4_;
                auVar299._0_4_ = auVar350._0_4_ * auVar126._0_4_;
                auVar299._4_4_ = auVar350._4_4_ * auVar126._4_4_;
                auVar299._8_4_ = auVar350._8_4_ * auVar126._8_4_;
                auVar299._12_4_ = auVar350._12_4_ * auVar126._12_4_;
                local_aa0._0_4_ = auVar132._0_4_;
                if (fVar241 < 0.0) {
                  local_9e0._0_16_ = auVar273;
                  local_840._0_16_ = auVar299;
                  _local_a00 = auVar227;
                  fVar241 = sqrtf(fVar241);
                  auVar415 = ZEXT464((uint)local_aa0._0_4_);
                  auVar227 = _local_a00;
                  auVar273 = local_9e0._0_16_;
                  auVar299 = local_840._0_16_;
                }
                else {
                  auVar132 = vsqrtss_avx(auVar127,auVar127);
                  fVar241 = auVar132._0_4_;
                }
                auVar132 = vdpps_avx(_local_a20,auVar299,0x7f);
                fVar241 = (local_880 / fVar241) * (fVar195 + 1.0) +
                          auVar415._0_4_ + fVar195 * local_880;
                auVar127 = vdpps_avx(auVar273,auVar299,0x7f);
                auVar134 = vdpps_avx(_local_a20,auVar227,0x7f);
                auVar126 = vdpps_avx(_local_8f0,auVar299,0x7f);
                auVar133 = vdpps_avx(_local_a20,auVar273,0x7f);
                fVar195 = auVar127._0_4_ + auVar134._0_4_;
                fVar242 = auVar132._0_4_;
                auVar128._0_4_ = fVar242 * fVar242;
                auVar128._4_4_ = auVar132._4_4_ * auVar132._4_4_;
                auVar128._8_4_ = auVar132._8_4_ * auVar132._8_4_;
                auVar128._12_4_ = auVar132._12_4_ * auVar132._12_4_;
                auVar134 = vsubps_avx(auVar163,auVar128);
                auVar127 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar197 = auVar133._0_4_ - fVar242 * fVar195;
                fVar198 = auVar127._0_4_ - fVar242 * auVar126._0_4_;
                auVar127 = vrsqrtss_avx(auVar134,auVar134);
                fVar244 = auVar134._0_4_;
                fVar242 = auVar127._0_4_;
                fVar242 = fVar242 * 1.5 + fVar244 * -0.5 * fVar242 * fVar242 * fVar242;
                if (fVar244 < 0.0) {
                  local_9e0._0_16_ = auVar132;
                  local_840._0_4_ = fVar241;
                  local_960._0_4_ = fVar197;
                  local_8c0._0_4_ = fVar198;
                  local_740._0_4_ = fVar242;
                  _local_a00 = auVar126;
                  fVar244 = sqrtf(fVar244);
                  auVar415 = ZEXT464((uint)local_aa0._0_4_);
                  fVar242 = (float)local_740._0_4_;
                  fVar197 = (float)local_960._0_4_;
                  fVar198 = (float)local_8c0._0_4_;
                  auVar126 = _local_a00;
                  auVar132 = local_9e0._0_16_;
                  fVar241 = (float)local_840._0_4_;
                }
                else {
                  auVar127 = vsqrtss_avx(auVar134,auVar134);
                  fVar244 = auVar127._0_4_;
                }
                auVar336 = ZEXT1664(auVar163);
                auVar391 = ZEXT3264(_local_940);
                auVar171 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar133 = vshufps_avx(auVar350,auVar350,0xff);
                fVar197 = fVar197 * fVar242 - auVar133._0_4_;
                auVar252._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar252._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar274._0_4_ = -fVar197;
                auVar274._4_4_ = 0x80000000;
                auVar274._8_4_ = 0x80000000;
                auVar274._12_4_ = 0x80000000;
                auVar127 = vinsertps_avx(ZEXT416((uint)(fVar198 * fVar242)),auVar252,0x10);
                auVar134 = vmovsldup_avx(ZEXT416((uint)(fVar195 * fVar198 * fVar242 -
                                                       auVar126._0_4_ * fVar197)));
                auVar127 = vdivps_avx(auVar127,auVar134);
                auVar171 = ZEXT416((uint)(fVar244 - auVar171._0_4_));
                auVar126 = vinsertps_avx(auVar132,auVar171,0x10);
                auVar228._0_4_ = auVar126._0_4_ * auVar127._0_4_;
                auVar228._4_4_ = auVar126._4_4_ * auVar127._4_4_;
                auVar228._8_4_ = auVar126._8_4_ * auVar127._8_4_;
                auVar228._12_4_ = auVar126._12_4_ * auVar127._12_4_;
                auVar127 = vinsertps_avx(auVar274,ZEXT416((uint)fVar195),0x1c);
                auVar127 = vdivps_avx(auVar127,auVar134);
                auVar134 = vhaddps_avx(auVar228,auVar228);
                auVar203._0_4_ = auVar126._0_4_ * auVar127._0_4_;
                auVar203._4_4_ = auVar126._4_4_ * auVar127._4_4_;
                auVar203._8_4_ = auVar126._8_4_ * auVar127._8_4_;
                auVar203._12_4_ = auVar126._12_4_ * auVar127._12_4_;
                auVar127 = vhaddps_avx(auVar203,auVar203);
                fVar243 = fVar243 - auVar134._0_4_;
                fVar195 = auVar400._0_4_ - auVar127._0_4_;
                auVar253._8_4_ = 0x7fffffff;
                auVar253._0_8_ = 0x7fffffff7fffffff;
                auVar253._12_4_ = 0x7fffffff;
                auVar286 = ZEXT1664(auVar253);
                auVar132 = vandps_avx(auVar132,auVar253);
                bVar121 = true;
                auVar456 = local_940._0_28_;
                fVar242 = (float)local_a40._0_4_;
                fVar197 = (float)local_a40._4_4_;
                fVar198 = fStack_a38;
                fVar244 = fStack_a34;
                fVar245 = fStack_a30;
                fVar246 = fStack_a2c;
                fVar247 = fStack_a28;
                if (fVar241 <= auVar132._0_4_) {
LAB_0121d332:
                  auVar309 = ZEXT3264(local_9c0);
                  auVar400 = ZEXT464((uint)fVar195);
                }
                else {
                  auVar132 = vandps_avx(auVar171,auVar253);
                  auVar309 = ZEXT3264(local_9c0);
                  if ((float)local_760._0_4_ * 1.9073486e-06 + auVar415._0_4_ + fVar241 <=
                      auVar132._0_4_) goto LAB_0121d332;
                  fVar195 = fVar195 + (float)local_810._0_4_;
                  if (fVar195 < fVar224) {
                    bVar121 = false;
                    uVar120 = 0;
                    goto LAB_0121d332;
                  }
                  fVar241 = *(float *)(ray + k * 4 + 0x80);
                  auVar415 = ZEXT464((uint)fVar241);
                  auVar132 = ZEXT416((uint)fVar195);
                  bVar121 = false;
                  if (fVar195 <= fVar241) {
                    auVar400 = ZEXT1664(auVar132);
                    if ((fVar243 < 0.0) || (1.0 < fVar243)) {
                      uVar120 = 0;
                    }
                    else {
                      auVar163 = vrsqrtss_avx(auVar163,auVar163);
                      fVar264 = auVar163._0_4_;
                      pGVar28 = (context->scene->geometries).items[local_998].ptr;
                      if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar120 = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar163 = ZEXT416((uint)(fVar264 * 1.5 +
                                                   fVar159 * -0.5 * fVar264 * fVar264 * fVar264));
                          auVar163 = vshufps_avx(auVar163,auVar163,0);
                          auVar166._0_4_ = auVar163._0_4_ * (float)local_a20._0_4_;
                          auVar166._4_4_ = auVar163._4_4_ * (float)local_a20._4_4_;
                          auVar166._8_4_ = auVar163._8_4_ * fStack_a18;
                          auVar166._12_4_ = auVar163._12_4_ * fStack_a14;
                          auVar336 = ZEXT1664(auVar350);
                          auVar129._0_4_ = auVar350._0_4_ + auVar133._0_4_ * auVar166._0_4_;
                          auVar129._4_4_ = auVar350._4_4_ + auVar133._4_4_ * auVar166._4_4_;
                          auVar129._8_4_ = auVar350._8_4_ + auVar133._8_4_ * auVar166._8_4_;
                          auVar129._12_4_ = auVar350._12_4_ + auVar133._12_4_ * auVar166._12_4_;
                          auVar163 = vshufps_avx(auVar166,auVar166,0xc9);
                          auVar127 = vshufps_avx(auVar350,auVar350,0xc9);
                          auVar167._0_4_ = auVar127._0_4_ * auVar166._0_4_;
                          auVar167._4_4_ = auVar127._4_4_ * auVar166._4_4_;
                          auVar167._8_4_ = auVar127._8_4_ * auVar166._8_4_;
                          auVar167._12_4_ = auVar127._12_4_ * auVar166._12_4_;
                          auVar204._0_4_ = auVar350._0_4_ * auVar163._0_4_;
                          auVar204._4_4_ = auVar350._4_4_ * auVar163._4_4_;
                          auVar204._8_4_ = auVar350._8_4_ * auVar163._8_4_;
                          auVar204._12_4_ = auVar350._12_4_ * auVar163._12_4_;
                          auVar134 = vsubps_avx(auVar204,auVar167);
                          auVar163 = vshufps_avx(auVar134,auVar134,0xc9);
                          auVar127 = vshufps_avx(auVar129,auVar129,0xc9);
                          auVar205._0_4_ = auVar127._0_4_ * auVar163._0_4_;
                          auVar205._4_4_ = auVar127._4_4_ * auVar163._4_4_;
                          auVar205._8_4_ = auVar127._8_4_ * auVar163._8_4_;
                          auVar205._12_4_ = auVar127._12_4_ * auVar163._12_4_;
                          auVar163 = vshufps_avx(auVar134,auVar134,0xd2);
                          auVar130._0_4_ = auVar129._0_4_ * auVar163._0_4_;
                          auVar130._4_4_ = auVar129._4_4_ * auVar163._4_4_;
                          auVar130._8_4_ = auVar129._8_4_ * auVar163._8_4_;
                          auVar130._12_4_ = auVar129._12_4_ * auVar163._12_4_;
                          auVar163 = vsubps_avx(auVar205,auVar130);
                          local_6b0 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
                          local_6e0 = (RTCHitN  [16])vshufps_avx(auVar163,auVar163,0x55);
                          auStack_6d0 = vshufps_avx(auVar163,auVar163,0xaa);
                          local_6c0 = vshufps_avx(auVar163,auVar163,0);
                          local_6a0 = ZEXT816(0) << 0x20;
                          local_690 = local_700._0_8_;
                          uStack_688 = local_700._8_8_;
                          local_680 = local_6f0._0_8_;
                          uStack_678 = local_6f0._8_8_;
                          uVar110 = context->user->instID[0];
                          _local_670 = CONCAT44(uVar110,uVar110);
                          _uStack_668 = CONCAT44(uVar110,uVar110);
                          uVar110 = context->user->instPrimID[0];
                          _uStack_660 = CONCAT44(uVar110,uVar110);
                          _uStack_658 = CONCAT44(uVar110,uVar110);
                          *(float *)(ray + k * 4 + 0x80) = fVar195;
                          local_ae0 = *local_9a0;
                          uStack_ad8 = local_9a0[1];
                          local_990.valid = (int *)&local_ae0;
                          local_990.geometryUserPtr = pGVar28->userPtr;
                          local_990.context = context->user;
                          local_990.hit = local_6e0;
                          local_990.N = 4;
                          local_990.ray = (RTCRayN *)ray;
                          if (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar336 = ZEXT1664(auVar350);
                            auVar391 = ZEXT1664(local_940._0_16_);
                            (*pGVar28->occlusionFilterN)(&local_990);
                            auVar309 = ZEXT3264(local_9c0);
                            auVar456 = local_940._0_28_;
                            auVar286 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar103._8_8_ = uStack_ad8;
                          auVar103._0_8_ = local_ae0;
                          if (auVar103 == (undefined1  [16])0x0) {
                            auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar163 = auVar163 ^ _DAT_01febe20;
                            fVar242 = (float)local_a40._0_4_;
                            fVar197 = (float)local_a40._4_4_;
                            fVar198 = fStack_a38;
                            fVar244 = fStack_a34;
                            fVar245 = fStack_a30;
                            fVar246 = fStack_a2c;
                            fVar247 = fStack_a28;
                          }
                          else {
                            p_Var32 = context->args->filter;
                            if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar336 = ZEXT1664(auVar336._0_16_);
                              auVar391 = ZEXT1664(auVar391._0_16_);
                              (*p_Var32)(&local_990);
                              auVar309 = ZEXT3264(local_9c0);
                              auVar456 = local_940._0_28_;
                              auVar286 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar104._8_8_ = uStack_ad8;
                            auVar104._0_8_ = local_ae0;
                            auVar127 = vpcmpeqd_avx((undefined1  [16])0x0,auVar104);
                            auVar163 = auVar127 ^ _DAT_01febe20;
                            auVar206._8_4_ = 0xff800000;
                            auVar206._0_8_ = 0xff800000ff800000;
                            auVar206._12_4_ = 0xff800000;
                            auVar127 = vblendvps_avx(auVar206,*(undefined1 (*) [16])
                                                               (local_990.ray + 0x80),auVar127);
                            *(undefined1 (*) [16])(local_990.ray + 0x80) = auVar127;
                            fVar242 = (float)local_a40._0_4_;
                            fVar197 = (float)local_a40._4_4_;
                            fVar198 = fStack_a38;
                            fVar244 = fStack_a34;
                            fVar245 = fStack_a30;
                            fVar246 = fStack_a2c;
                            fVar247 = fStack_a28;
                          }
                          auVar400 = ZEXT1664(auVar132);
                          auVar415 = ZEXT464((uint)fVar241);
                          auVar168._8_8_ = 0x100000001;
                          auVar168._0_8_ = 0x100000001;
                          bVar121 = (auVar168 & auVar163) != (undefined1  [16])0x0;
                          uVar120 = (ulong)bVar121;
                          if (!bVar121) {
                            *(float *)(ray + k * 4 + 0x80) = fVar241;
                          }
                          bVar121 = false;
                          goto LAB_0121d337;
                        }
                        uVar120 = 1;
                      }
                      bVar121 = false;
                    }
                  }
                  else {
                    uVar120 = 0;
                    auVar400 = ZEXT1664(auVar132);
                  }
                }
LAB_0121d337:
                auVar379 = ZEXT464((uint)fVar243);
                bVar119 = (byte)uVar120;
                if (!bVar121) goto LAB_0121d6e4;
                lVar113 = lVar113 + -1;
              } while (lVar113 != 0);
              bVar119 = 0;
              auVar309 = ZEXT3264(local_9c0);
              fVar242 = (float)local_a40._0_4_;
              fVar197 = (float)local_a40._4_4_;
              fVar198 = fStack_a38;
              fVar244 = fStack_a34;
              fVar245 = fStack_a30;
              fVar246 = fStack_a2c;
              fVar247 = fStack_a28;
LAB_0121d6e4:
              uVar120 = (ulong)(bVar119 & 1);
              uVar117 = CONCAT71(local_780._1_7_,local_780[0] | bVar119 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar146._4_4_ = uVar8;
              auVar146._0_4_ = uVar8;
              auVar146._8_4_ = uVar8;
              auVar146._12_4_ = uVar8;
              auVar146._16_4_ = uVar8;
              auVar146._20_4_ = uVar8;
              auVar146._24_4_ = uVar8;
              auVar146._28_4_ = uVar8;
              auVar145 = vcmpps_avx(_local_7c0,auVar146,2);
              auVar33 = vandps_avx(auVar145,local_5a0);
              auVar263 = ZEXT3264(auVar33);
              auVar34 = local_5a0 & auVar145;
              uVar118 = local_5e0;
              auVar283 = local_ac0;
              local_5a0 = auVar33;
            } while ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar34 >> 0x7f,0) != '\0') ||
                       (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar34 >> 0xbf,0) != '\0') ||
                     (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar34[0x1f] < '\0');
          }
          auVar147._0_4_ =
               (float)local_600._0_4_ * (float)local_7a0._0_4_ +
               fVar242 * (float)local_620._0_4_ + auVar456._0_4_ * (float)local_640._0_4_;
          auVar147._4_4_ =
               (float)local_600._4_4_ * (float)local_7a0._4_4_ +
               fVar197 * (float)local_620._4_4_ + auVar456._4_4_ * (float)local_640._4_4_;
          auVar147._8_4_ =
               fStack_5f8 * fStack_798 + fVar198 * fStack_618 + auVar456._8_4_ * fStack_638;
          auVar147._12_4_ =
               fStack_5f4 * fStack_794 + fVar244 * fStack_614 + auVar456._12_4_ * fStack_634;
          auVar147._16_4_ =
               fStack_5f0 * fStack_790 + fVar245 * fStack_610 + auVar456._16_4_ * fStack_630;
          auVar147._20_4_ =
               fStack_5ec * fStack_78c + fVar246 * fStack_60c + auVar456._20_4_ * fStack_62c;
          auVar147._24_4_ =
               fStack_5e8 * fStack_788 + fVar247 * fStack_608 + auVar456._24_4_ * fStack_628;
          auVar147._28_4_ = fStack_5e4 + auVar145._28_4_ + auVar263._28_4_;
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar187._16_4_ = 0x7fffffff;
          auVar187._20_4_ = 0x7fffffff;
          auVar187._24_4_ = 0x7fffffff;
          auVar187._28_4_ = 0x7fffffff;
          auVar145 = vandps_avx(auVar147,auVar187);
          auVar188._8_4_ = 0x3e99999a;
          auVar188._0_8_ = 0x3e99999a3e99999a;
          auVar188._12_4_ = 0x3e99999a;
          auVar188._16_4_ = 0x3e99999a;
          auVar188._20_4_ = 0x3e99999a;
          auVar188._24_4_ = 0x3e99999a;
          auVar188._28_4_ = 0x3e99999a;
          auVar145 = vcmpps_avx(auVar145,auVar188,1);
          auVar33 = vorps_avx(auVar145,local_580);
          auVar189._0_4_ = (float)local_920._0_4_ + auVar283._0_4_;
          auVar189._4_4_ = (float)local_920._4_4_ + auVar283._4_4_;
          auVar189._8_4_ = fStack_918 + auVar283._8_4_;
          auVar189._12_4_ = fStack_914 + auVar283._12_4_;
          auVar189._16_4_ = fStack_910 + auVar283._16_4_;
          auVar189._20_4_ = fStack_90c + auVar283._20_4_;
          auVar189._24_4_ = fStack_908 + auVar283._24_4_;
          auVar189._28_4_ = fStack_904 + auVar283._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar217._4_4_ = uVar8;
          auVar217._0_4_ = uVar8;
          auVar217._8_4_ = uVar8;
          auVar217._12_4_ = uVar8;
          auVar217._16_4_ = uVar8;
          auVar217._20_4_ = uVar8;
          auVar217._24_4_ = uVar8;
          auVar217._28_4_ = uVar8;
          auVar145 = vcmpps_avx(auVar189,auVar217,2);
          _local_8e0 = vandps_avx(auVar145,auVar309._0_32_);
          auVar190._8_4_ = 3;
          auVar190._0_8_ = 0x300000003;
          auVar190._12_4_ = 3;
          auVar190._16_4_ = 3;
          auVar190._20_4_ = 3;
          auVar190._24_4_ = 3;
          auVar190._28_4_ = 3;
          auVar218._8_4_ = 2;
          auVar218._0_8_ = 0x200000002;
          auVar218._12_4_ = 2;
          auVar218._16_4_ = 2;
          auVar218._20_4_ = 2;
          auVar218._24_4_ = 2;
          auVar218._28_4_ = 2;
          auVar145 = vblendvps_avx(auVar218,auVar190,auVar33);
          auVar163 = vpcmpgtd_avx(auVar145._16_16_,local_7e0);
          auVar132 = vpshufd_avx(local_560._0_16_,0);
          auVar132 = vpcmpgtd_avx(auVar145._0_16_,auVar132);
          auVar191._16_16_ = auVar163;
          auVar191._0_16_ = auVar132;
          _local_7c0 = vblendps_avx(ZEXT1632(auVar132),auVar191,0xf0);
          auVar145 = vandnps_avx(_local_7c0,_local_8e0);
          auVar33 = _local_8e0 & ~_local_7c0;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            local_740 = _local_320;
            local_760._4_4_ = (float)local_920._4_4_ + (float)local_320._4_4_;
            local_760._0_4_ = (float)local_920._0_4_ + (float)local_320._0_4_;
            fStack_758 = fStack_918 + fStack_318;
            fStack_754 = fStack_914 + fStack_314;
            fStack_750 = fStack_910 + fStack_310;
            fStack_74c = fStack_90c + fStack_30c;
            fStack_748 = fStack_908 + fStack_308;
            fStack_744 = fStack_904 + fStack_304;
            do {
              auVar254 = auVar286._0_16_;
              auVar192._8_4_ = 0x7f800000;
              auVar192._0_8_ = 0x7f8000007f800000;
              auVar192._12_4_ = 0x7f800000;
              auVar192._16_4_ = 0x7f800000;
              auVar192._20_4_ = 0x7f800000;
              auVar192._24_4_ = 0x7f800000;
              auVar192._28_4_ = 0x7f800000;
              auVar33 = vblendvps_avx(auVar192,local_740,auVar145);
              auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
              auVar34 = vminps_avx(auVar33,auVar34);
              auVar283 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar283);
              auVar283 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar283);
              auVar34 = vcmpps_avx(auVar33,auVar34,0);
              auVar283 = auVar145 & auVar34;
              auVar33 = auVar145;
              if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar283 >> 0x7f,0) != '\0') ||
                    (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar283 >> 0xbf,0) != '\0') ||
                  (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar283[0x1f] < '\0') {
                auVar33 = vandps_avx(auVar34,auVar145);
              }
              local_780._0_8_ = uVar117;
              uVar111 = vmovmskps_avx(auVar33);
              uVar110 = 0;
              if (uVar111 != 0) {
                for (; (uVar111 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                }
              }
              uVar118 = (ulong)uVar110;
              local_5c0 = auVar145;
              *(undefined4 *)(local_5c0 + uVar118 * 4) = 0;
              fVar159 = local_500[uVar118];
              uVar110 = *(uint *)(local_300 + uVar118 * 4);
              fVar241 = local_ac8;
              if ((float)local_900._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_900._0_4_);
                auVar254._8_4_ = 0x7fffffff;
                auVar254._0_8_ = 0x7fffffff7fffffff;
                auVar254._12_4_ = 0x7fffffff;
              }
              auVar400 = ZEXT464(uVar110);
              auVar379 = ZEXT464((uint)fVar159);
              auVar132 = vminps_avx(_local_a50,_local_a70);
              auVar163 = vmaxps_avx(_local_a50,_local_a70);
              auVar127 = vminps_avx(_local_a60,_local_a80);
              auVar134 = vminps_avx(auVar132,auVar127);
              auVar132 = vmaxps_avx(_local_a60,_local_a80);
              auVar127 = vmaxps_avx(auVar163,auVar132);
              auVar163 = vandps_avx(auVar134,auVar254);
              auVar132 = vandps_avx(auVar127,auVar254);
              auVar163 = vmaxps_avx(auVar163,auVar132);
              auVar132 = vmovshdup_avx(auVar163);
              auVar132 = vmaxss_avx(auVar132,auVar163);
              auVar163 = vshufpd_avx(auVar163,auVar163,1);
              auVar163 = vmaxss_avx(auVar163,auVar132);
              local_880 = auVar163._0_4_ * 1.9073486e-06;
              local_720._0_4_ = fVar241 * 1.9073486e-06;
              local_8c0._0_16_ = vshufps_avx(auVar127,auVar127,0xff);
              lVar113 = 5;
              do {
                fVar243 = auVar379._0_4_;
                fVar197 = 1.0 - fVar243;
                fVar159 = fVar197 * fVar197 * fVar197;
                fVar241 = fVar243 * fVar243;
                fVar195 = fVar243 * fVar241;
                fVar242 = fVar243 * fVar197;
                auVar163 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.16666667)),
                                       ZEXT416((uint)(fVar195 * 0.16666667)),0);
                auVar132 = ZEXT416((uint)((fVar195 * 4.0 + fVar159 +
                                          fVar243 * fVar242 * 12.0 + fVar197 * fVar242 * 6.0) *
                                         0.16666667));
                auVar132 = vshufps_avx(auVar132,auVar132,0);
                auVar127 = ZEXT416((uint)((fVar159 * 4.0 + fVar195 +
                                          fVar197 * fVar242 * 12.0 + fVar243 * fVar242 * 6.0) *
                                         0.16666667));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar134 = vshufps_avx(auVar400._0_16_,auVar400._0_16_,0);
                auVar207._0_4_ = auVar134._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar207._4_4_ = auVar134._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar207._8_4_ = auVar134._8_4_ * fStack_8e8 + 0.0;
                auVar207._12_4_ = auVar134._12_4_ * fStack_8e4 + 0.0;
                auVar134 = vshufps_avx(ZEXT416((uint)(fVar159 * 0.16666667)),
                                       ZEXT416((uint)(fVar159 * 0.16666667)),0);
                auVar131._0_4_ =
                     auVar134._0_4_ * (float)local_a50._0_4_ +
                     auVar127._0_4_ * (float)local_a70._0_4_ +
                     auVar163._0_4_ * (float)local_a80._0_4_ +
                     auVar132._0_4_ * (float)local_a60._0_4_;
                auVar131._4_4_ =
                     auVar134._4_4_ * (float)local_a50._4_4_ +
                     auVar127._4_4_ * (float)local_a70._4_4_ +
                     auVar163._4_4_ * (float)local_a80._4_4_ +
                     auVar132._4_4_ * (float)local_a60._4_4_;
                auVar131._8_4_ =
                     auVar134._8_4_ * fStack_a48 +
                     auVar127._8_4_ * fStack_a68 +
                     auVar163._8_4_ * fStack_a78 + auVar132._8_4_ * fStack_a58;
                auVar131._12_4_ =
                     auVar134._12_4_ * fStack_a44 +
                     auVar127._12_4_ * fStack_a64 +
                     auVar163._12_4_ * fStack_a74 + auVar132._12_4_ * fStack_a54;
                local_8a0._0_16_ = auVar131;
                auVar163 = vsubps_avx(auVar207,auVar131);
                _local_a20 = auVar163;
                auVar163 = vdpps_avx(auVar163,auVar163,0x7f);
                fVar159 = auVar163._0_4_;
                if (fVar159 < 0.0) {
                  local_aa0._0_4_ = fVar241;
                  local_ac0._0_4_ = fVar242;
                  auVar263._0_4_ = sqrtf(fVar159);
                  auVar263._4_60_ = extraout_var;
                  auVar132 = auVar263._0_16_;
                  fVar241 = (float)local_aa0._0_4_;
                  fVar242 = (float)local_ac0._0_4_;
                }
                else {
                  auVar132 = vsqrtss_avx(auVar163,auVar163);
                }
                auVar391 = ZEXT1664(auVar132);
                auVar127 = vshufps_avx(ZEXT416((uint)(fVar241 * 0.5)),ZEXT416((uint)(fVar241 * 0.5))
                                       ,0);
                auVar134 = ZEXT416((uint)((fVar197 * fVar197 + fVar242 * 4.0) * 0.5));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar126 = ZEXT416((uint)((fVar243 * -fVar243 - fVar242 * 4.0) * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar133 = ZEXT416((uint)(fVar197 * -fVar197 * 0.5));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                auVar351._0_4_ =
                     (float)local_a50._0_4_ * auVar133._0_4_ +
                     (float)local_a70._0_4_ * auVar126._0_4_ +
                     (float)local_a80._0_4_ * auVar127._0_4_ +
                     (float)local_a60._0_4_ * auVar134._0_4_;
                auVar351._4_4_ =
                     (float)local_a50._4_4_ * auVar133._4_4_ +
                     (float)local_a70._4_4_ * auVar126._4_4_ +
                     (float)local_a80._4_4_ * auVar127._4_4_ +
                     (float)local_a60._4_4_ * auVar134._4_4_;
                auVar351._8_4_ =
                     fStack_a48 * auVar133._8_4_ +
                     fStack_a68 * auVar126._8_4_ +
                     fStack_a78 * auVar127._8_4_ + fStack_a58 * auVar134._8_4_;
                auVar351._12_4_ =
                     fStack_a44 * auVar133._12_4_ +
                     fStack_a64 * auVar126._12_4_ +
                     fStack_a74 * auVar127._12_4_ + fStack_a54 * auVar134._12_4_;
                auVar127 = vshufps_avx(auVar379._0_16_,auVar379._0_16_,0);
                auVar134 = ZEXT416((uint)(fVar197 - (fVar243 + fVar243)));
                auVar126 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = ZEXT416((uint)(fVar243 - (fVar197 + fVar197)));
                auVar133 = vshufps_avx(auVar134,auVar134,0);
                auVar171 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                auVar134 = vdpps_avx(auVar351,auVar351,0x7f);
                auVar169._0_4_ =
                     (float)local_a50._0_4_ * auVar171._0_4_ +
                     (float)local_a70._0_4_ * auVar133._0_4_ +
                     (float)local_a80._0_4_ * auVar127._0_4_ +
                     (float)local_a60._0_4_ * auVar126._0_4_;
                auVar169._4_4_ =
                     (float)local_a50._4_4_ * auVar171._4_4_ +
                     (float)local_a70._4_4_ * auVar133._4_4_ +
                     (float)local_a80._4_4_ * auVar127._4_4_ +
                     (float)local_a60._4_4_ * auVar126._4_4_;
                auVar169._8_4_ =
                     fStack_a48 * auVar171._8_4_ +
                     fStack_a68 * auVar133._8_4_ +
                     fStack_a78 * auVar127._8_4_ + fStack_a58 * auVar126._8_4_;
                auVar169._12_4_ =
                     fStack_a44 * auVar171._12_4_ +
                     fStack_a64 * auVar133._12_4_ +
                     fStack_a74 * auVar127._12_4_ + fStack_a54 * auVar126._12_4_;
                auVar127 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar126 = vrsqrtss_avx(auVar127,auVar127);
                fVar195 = auVar126._0_4_;
                fVar241 = auVar134._0_4_;
                auVar126 = vdpps_avx(auVar351,auVar169,0x7f);
                auVar133 = vshufps_avx(auVar134,auVar134,0);
                auVar170._0_4_ = auVar169._0_4_ * auVar133._0_4_;
                auVar170._4_4_ = auVar169._4_4_ * auVar133._4_4_;
                auVar170._8_4_ = auVar169._8_4_ * auVar133._8_4_;
                auVar170._12_4_ = auVar169._12_4_ * auVar133._12_4_;
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar255._0_4_ = auVar351._0_4_ * auVar126._0_4_;
                auVar255._4_4_ = auVar351._4_4_ * auVar126._4_4_;
                auVar255._8_4_ = auVar351._8_4_ * auVar126._8_4_;
                auVar255._12_4_ = auVar351._12_4_ * auVar126._12_4_;
                auVar171 = vsubps_avx(auVar170,auVar255);
                auVar126 = vrcpss_avx(auVar127,auVar127);
                auVar127 = vmaxss_avx(ZEXT416((uint)local_880),
                                      ZEXT416((uint)(auVar400._0_4_ * (float)local_720._0_4_)));
                auVar415 = ZEXT1664(auVar127);
                auVar126 = ZEXT416((uint)(auVar126._0_4_ * (2.0 - fVar241 * auVar126._0_4_)));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                uVar118 = CONCAT44(auVar351._4_4_,auVar351._0_4_);
                auVar275._0_8_ = uVar118 ^ 0x8000000080000000;
                auVar275._8_4_ = -auVar351._8_4_;
                auVar275._12_4_ = -auVar351._12_4_;
                auVar133 = ZEXT416((uint)(fVar195 * 1.5 +
                                         fVar241 * -0.5 * fVar195 * fVar195 * fVar195));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                auVar229._0_4_ = auVar133._0_4_ * auVar171._0_4_ * auVar126._0_4_;
                auVar229._4_4_ = auVar133._4_4_ * auVar171._4_4_ * auVar126._4_4_;
                auVar229._8_4_ = auVar133._8_4_ * auVar171._8_4_ * auVar126._8_4_;
                auVar229._12_4_ = auVar133._12_4_ * auVar171._12_4_ * auVar126._12_4_;
                auVar300._0_4_ = auVar351._0_4_ * auVar133._0_4_;
                auVar300._4_4_ = auVar351._4_4_ * auVar133._4_4_;
                auVar300._8_4_ = auVar351._8_4_ * auVar133._8_4_;
                auVar300._12_4_ = auVar351._12_4_ * auVar133._12_4_;
                local_aa0._0_4_ = auVar127._0_4_;
                if (fVar241 < 0.0) {
                  local_ac0._0_16_ = auVar275;
                  local_9c0._0_16_ = auVar300;
                  local_9e0._0_16_ = auVar229;
                  fVar241 = sqrtf(fVar241);
                  auVar391 = ZEXT464(auVar132._0_4_);
                  auVar415 = ZEXT464((uint)local_aa0._0_4_);
                  auVar229 = local_9e0._0_16_;
                  auVar275 = local_ac0._0_16_;
                  auVar300 = local_9c0._0_16_;
                }
                else {
                  auVar132 = vsqrtss_avx(auVar134,auVar134);
                  fVar241 = auVar132._0_4_;
                }
                auVar132 = vdpps_avx(_local_a20,auVar300,0x7f);
                fVar241 = (local_880 / fVar241) * (auVar391._0_4_ + 1.0) +
                          auVar415._0_4_ + auVar391._0_4_ * local_880;
                auVar127 = vdpps_avx(auVar275,auVar300,0x7f);
                auVar134 = vdpps_avx(_local_a20,auVar229,0x7f);
                auVar126 = vdpps_avx(_local_8f0,auVar300,0x7f);
                auVar133 = vdpps_avx(_local_a20,auVar275,0x7f);
                fVar195 = auVar127._0_4_ + auVar134._0_4_;
                fVar242 = auVar132._0_4_;
                auVar135._0_4_ = fVar242 * fVar242;
                auVar135._4_4_ = auVar132._4_4_ * auVar132._4_4_;
                auVar135._8_4_ = auVar132._8_4_ * auVar132._8_4_;
                auVar135._12_4_ = auVar132._12_4_ * auVar132._12_4_;
                auVar134 = vsubps_avx(auVar163,auVar135);
                auVar127 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar197 = auVar133._0_4_ - fVar242 * fVar195;
                fVar198 = auVar127._0_4_ - fVar242 * auVar126._0_4_;
                auVar127 = vrsqrtss_avx(auVar134,auVar134);
                fVar244 = auVar134._0_4_;
                fVar242 = auVar127._0_4_;
                fVar242 = fVar242 * 1.5 + fVar244 * -0.5 * fVar242 * fVar242 * fVar242;
                if (fVar244 < 0.0) {
                  local_ac0._0_16_ = auVar132;
                  local_9c0._0_4_ = fVar241;
                  local_9e0._0_16_ = auVar126;
                  local_840._0_4_ = fVar197;
                  local_a00._0_4_ = fVar198;
                  local_960._0_4_ = fVar242;
                  auVar391 = ZEXT1664(auVar391._0_16_);
                  fVar244 = sqrtf(fVar244);
                  auVar415 = ZEXT464((uint)local_aa0._0_4_);
                  fVar242 = (float)local_960._0_4_;
                  fVar197 = (float)local_840._0_4_;
                  fVar198 = (float)local_a00._0_4_;
                  auVar126 = local_9e0._0_16_;
                  auVar132 = local_ac0._0_16_;
                  fVar241 = (float)local_9c0._0_4_;
                }
                else {
                  auVar127 = vsqrtss_avx(auVar134,auVar134);
                  fVar244 = auVar127._0_4_;
                }
                auVar336 = ZEXT1664(auVar163);
                auVar171 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar133 = vshufps_avx(auVar351,auVar351,0xff);
                fVar245 = fVar197 * fVar242 - auVar133._0_4_;
                auVar256._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar256._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar256._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar276._0_4_ = -fVar245;
                auVar276._4_4_ = 0x80000000;
                auVar276._8_4_ = 0x80000000;
                auVar276._12_4_ = 0x80000000;
                fVar197 = fVar195 * fVar198 * fVar242;
                auVar309 = ZEXT464((uint)fVar197);
                auVar127 = vinsertps_avx(ZEXT416((uint)(fVar198 * fVar242)),auVar256,0x10);
                auVar134 = vmovsldup_avx(ZEXT416((uint)(fVar197 - auVar126._0_4_ * fVar245)));
                auVar127 = vdivps_avx(auVar127,auVar134);
                auVar171 = ZEXT416((uint)(fVar244 - auVar171._0_4_));
                auVar126 = vinsertps_avx(auVar132,auVar171,0x10);
                auVar230._0_4_ = auVar126._0_4_ * auVar127._0_4_;
                auVar230._4_4_ = auVar126._4_4_ * auVar127._4_4_;
                auVar230._8_4_ = auVar126._8_4_ * auVar127._8_4_;
                auVar230._12_4_ = auVar126._12_4_ * auVar127._12_4_;
                auVar127 = vinsertps_avx(auVar276,ZEXT416((uint)fVar195),0x1c);
                auVar127 = vdivps_avx(auVar127,auVar134);
                auVar134 = vhaddps_avx(auVar230,auVar230);
                auVar208._0_4_ = auVar126._0_4_ * auVar127._0_4_;
                auVar208._4_4_ = auVar126._4_4_ * auVar127._4_4_;
                auVar208._8_4_ = auVar126._8_4_ * auVar127._8_4_;
                auVar208._12_4_ = auVar126._12_4_ * auVar127._12_4_;
                auVar127 = vhaddps_avx(auVar208,auVar208);
                fVar243 = fVar243 - auVar134._0_4_;
                fVar195 = auVar400._0_4_ - auVar127._0_4_;
                auVar400 = ZEXT464((uint)fVar195);
                auVar257._8_4_ = 0x7fffffff;
                auVar257._0_8_ = 0x7fffffff7fffffff;
                auVar257._12_4_ = 0x7fffffff;
                auVar286 = ZEXT1664(auVar257);
                auVar132 = vandps_avx(auVar132,auVar257);
                bVar121 = true;
                if (auVar132._0_4_ < fVar241) {
                  auVar132 = vandps_avx(auVar171,auVar257);
                  if (auVar132._0_4_ <
                      (float)local_8c0._0_4_ * 1.9073486e-06 + auVar415._0_4_ + fVar241) {
                    fVar195 = fVar195 + (float)local_810._0_4_;
                    auVar400 = ZEXT464((uint)fVar195);
                    if ((((fVar224 <= fVar195) &&
                         (fVar241 = *(float *)(ray + k * 4 + 0x80), fVar195 <= fVar241)) &&
                        (0.0 <= fVar243)) && (fVar243 <= 1.0)) {
                      auVar132 = vrsqrtss_avx(auVar163,auVar163);
                      fVar242 = auVar132._0_4_;
                      pGVar28 = (context->scene->geometries).items[local_998].ptr;
                      if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar120 = 1;
                        }
                        else {
                          auVar132 = ZEXT416((uint)(fVar242 * 1.5 +
                                                   fVar159 * -0.5 * fVar242 * fVar242 * fVar242));
                          auVar132 = vshufps_avx(auVar132,auVar132,0);
                          auVar172._0_4_ = auVar132._0_4_ * (float)local_a20._0_4_;
                          auVar172._4_4_ = auVar132._4_4_ * (float)local_a20._4_4_;
                          auVar172._8_4_ = auVar132._8_4_ * fStack_a18;
                          auVar172._12_4_ = auVar132._12_4_ * fStack_a14;
                          auVar136._0_4_ = auVar351._0_4_ + auVar133._0_4_ * auVar172._0_4_;
                          auVar136._4_4_ = auVar351._4_4_ + auVar133._4_4_ * auVar172._4_4_;
                          auVar136._8_4_ = auVar351._8_4_ + auVar133._8_4_ * auVar172._8_4_;
                          auVar136._12_4_ = auVar351._12_4_ + auVar133._12_4_ * auVar172._12_4_;
                          auVar132 = vshufps_avx(auVar172,auVar172,0xc9);
                          auVar127 = vshufps_avx(auVar351,auVar351,0xc9);
                          auVar173._0_4_ = auVar127._0_4_ * auVar172._0_4_;
                          auVar173._4_4_ = auVar127._4_4_ * auVar172._4_4_;
                          auVar173._8_4_ = auVar127._8_4_ * auVar172._8_4_;
                          auVar173._12_4_ = auVar127._12_4_ * auVar172._12_4_;
                          auVar209._0_4_ = auVar351._0_4_ * auVar132._0_4_;
                          auVar209._4_4_ = auVar351._4_4_ * auVar132._4_4_;
                          auVar209._8_4_ = auVar351._8_4_ * auVar132._8_4_;
                          auVar209._12_4_ = auVar351._12_4_ * auVar132._12_4_;
                          auVar134 = vsubps_avx(auVar209,auVar173);
                          auVar132 = vshufps_avx(auVar134,auVar134,0xc9);
                          auVar127 = vshufps_avx(auVar136,auVar136,0xc9);
                          auVar210._0_4_ = auVar127._0_4_ * auVar132._0_4_;
                          auVar210._4_4_ = auVar127._4_4_ * auVar132._4_4_;
                          auVar210._8_4_ = auVar127._8_4_ * auVar132._8_4_;
                          auVar210._12_4_ = auVar127._12_4_ * auVar132._12_4_;
                          auVar132 = vshufps_avx(auVar134,auVar134,0xd2);
                          auVar137._0_4_ = auVar136._0_4_ * auVar132._0_4_;
                          auVar137._4_4_ = auVar136._4_4_ * auVar132._4_4_;
                          auVar137._8_4_ = auVar136._8_4_ * auVar132._8_4_;
                          auVar137._12_4_ = auVar136._12_4_ * auVar132._12_4_;
                          auVar132 = vsubps_avx(auVar210,auVar137);
                          local_6b0 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
                          local_6e0 = (RTCHitN  [16])vshufps_avx(auVar132,auVar132,0x55);
                          auStack_6d0 = vshufps_avx(auVar132,auVar132,0xaa);
                          local_6c0 = vshufps_avx(auVar132,auVar132,0);
                          local_6a0 = ZEXT816(0) << 0x20;
                          local_690 = local_700._0_8_;
                          uStack_688 = local_700._8_8_;
                          local_680 = local_6f0._0_8_;
                          uStack_678 = local_6f0._8_8_;
                          uVar110 = context->user->instID[0];
                          _local_670 = CONCAT44(uVar110,uVar110);
                          _uStack_668 = CONCAT44(uVar110,uVar110);
                          uVar110 = context->user->instPrimID[0];
                          _uStack_660 = CONCAT44(uVar110,uVar110);
                          _uStack_658 = CONCAT44(uVar110,uVar110);
                          *(float *)(ray + k * 4 + 0x80) = fVar195;
                          local_ae0 = *local_9a0;
                          uStack_ad8 = local_9a0[1];
                          local_990.valid = (int *)&local_ae0;
                          local_990.geometryUserPtr = pGVar28->userPtr;
                          local_990.context = context->user;
                          local_990.hit = local_6e0;
                          local_990.N = 4;
                          local_990.ray = (RTCRayN *)ray;
                          if (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar309 = ZEXT464((uint)fVar197);
                            auVar336 = ZEXT1664(auVar163);
                            auVar391 = ZEXT1664(auVar391._0_16_);
                            auVar415 = ZEXT1664(auVar415._0_16_);
                            (*pGVar28->occlusionFilterN)(&local_990);
                            auVar400 = ZEXT1664(ZEXT416((uint)fVar195));
                            auVar286 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar105._8_8_ = uStack_ad8;
                          auVar105._0_8_ = local_ae0;
                          if (auVar105 == (undefined1  [16])0x0) {
                            auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar163 = auVar163 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var32 = context->args->filter;
                            if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar309 = ZEXT1664(auVar309._0_16_);
                              auVar336 = ZEXT1664(auVar336._0_16_);
                              auVar391 = ZEXT1664(auVar391._0_16_);
                              auVar415 = ZEXT1664(auVar415._0_16_);
                              (*p_Var32)(&local_990);
                              auVar400 = ZEXT1664(ZEXT416((uint)fVar195));
                              auVar286 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar106._8_8_ = uStack_ad8;
                            auVar106._0_8_ = local_ae0;
                            auVar132 = vpcmpeqd_avx((undefined1  [16])0x0,auVar106);
                            auVar163 = auVar132 ^ _DAT_01febe20;
                            auVar211._8_4_ = 0xff800000;
                            auVar211._0_8_ = 0xff800000ff800000;
                            auVar211._12_4_ = 0xff800000;
                            auVar132 = vblendvps_avx(auVar211,*(undefined1 (*) [16])
                                                               (local_990.ray + 0x80),auVar132);
                            *(undefined1 (*) [16])(local_990.ray + 0x80) = auVar132;
                          }
                          auVar174._8_8_ = 0x100000001;
                          auVar174._0_8_ = 0x100000001;
                          bVar121 = (auVar174 & auVar163) != (undefined1  [16])0x0;
                          uVar120 = (ulong)bVar121;
                          if (!bVar121) {
                            *(float *)(ray + k * 4 + 0x80) = fVar241;
                          }
                        }
                        bVar121 = false;
                        goto LAB_0121df2a;
                      }
                    }
                    bVar121 = false;
                    uVar120 = 0;
                  }
                }
LAB_0121df2a:
                auVar379 = ZEXT464((uint)fVar243);
                bVar119 = (byte)uVar120;
                if (!bVar121) goto LAB_0121e234;
                lVar113 = lVar113 + -1;
              } while (lVar113 != 0);
              bVar119 = 0;
LAB_0121e234:
              uVar120 = (ulong)(bVar119 & 1);
              uVar117 = CONCAT71(local_780._1_7_,local_780[0] | bVar119 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar148._4_4_ = uVar8;
              auVar148._0_4_ = uVar8;
              auVar148._8_4_ = uVar8;
              auVar148._12_4_ = uVar8;
              auVar148._16_4_ = uVar8;
              auVar148._20_4_ = uVar8;
              auVar148._24_4_ = uVar8;
              auVar148._28_4_ = uVar8;
              auVar33 = vcmpps_avx(_local_760,auVar148,2);
              auVar145 = vandps_avx(auVar33,local_5c0);
              local_5c0 = local_5c0 & auVar33;
              uVar118 = local_5e0;
            } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                       (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                     (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5c0[0x1f] < '\0');
          }
          auVar145 = vandps_avx(local_540,local_520);
          auVar33 = vandps_avx(_local_7c0,_local_8e0);
          auVar219._0_4_ = (float)local_920._0_4_ + local_360._0_4_;
          auVar219._4_4_ = (float)local_920._4_4_ + local_360._4_4_;
          auVar219._8_4_ = fStack_918 + local_360._8_4_;
          auVar219._12_4_ = fStack_914 + local_360._12_4_;
          auVar219._16_4_ = fStack_910 + local_360._16_4_;
          auVar219._20_4_ = fStack_90c + local_360._20_4_;
          auVar219._24_4_ = fStack_908 + local_360._24_4_;
          auVar219._28_4_ = fStack_904 + local_360._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar262._4_4_ = uVar8;
          auVar262._0_4_ = uVar8;
          auVar262._8_4_ = uVar8;
          auVar262._12_4_ = uVar8;
          auVar262._16_4_ = uVar8;
          auVar262._20_4_ = uVar8;
          auVar262._24_4_ = uVar8;
          auVar262._28_4_ = uVar8;
          auVar34 = vcmpps_avx(auVar219,auVar262,2);
          auVar145 = vandps_avx(auVar34,auVar145);
          auVar284._0_4_ = (float)local_920._0_4_ + local_320._0_4_;
          auVar284._4_4_ = (float)local_920._4_4_ + local_320._4_4_;
          auVar284._8_4_ = fStack_918 + local_320._8_4_;
          auVar284._12_4_ = fStack_914 + local_320._12_4_;
          auVar284._16_4_ = fStack_910 + local_320._16_4_;
          auVar284._20_4_ = fStack_90c + local_320._20_4_;
          auVar284._24_4_ = fStack_908 + local_320._24_4_;
          auVar284._28_4_ = fStack_904 + local_320._28_4_;
          auVar286 = ZEXT3264(auVar284);
          auVar34 = vcmpps_avx(auVar284,auVar262,2);
          auVar33 = vandps_avx(auVar34,auVar33);
          auVar33 = vorps_avx(auVar145,auVar33);
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar33;
            auVar145 = vblendvps_avx(_local_320,_local_360,auVar145);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar145;
            uVar9 = vmovlps_avx(local_800);
            *(undefined8 *)(afStack_140 + uVar112 * 0x18) = uVar9;
            auStack_138[uVar112 * 0x18] = (int)uVar118 + 1;
            uVar112 = (ulong)((int)uVar112 + 1);
          }
        }
        auVar263 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      uVar110 = (uint)uVar112;
      if (uVar110 == 0) {
        if ((uVar117 & 1) != 0) {
          return local_ba9;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar152._4_4_ = uVar8;
        auVar152._0_4_ = uVar8;
        auVar152._8_4_ = uVar8;
        auVar152._12_4_ = uVar8;
        auVar152._16_4_ = uVar8;
        auVar152._20_4_ = uVar8;
        auVar152._24_4_ = uVar8;
        auVar152._28_4_ = uVar8;
        auVar145 = vcmpps_avx(local_2c0,auVar152,2);
        uVar110 = vmovmskps_avx(auVar145);
        uVar110 = (uint)local_7e8 - 1 & (uint)local_7e8 & uVar110;
        local_ba9 = uVar110 != 0;
        if (!local_ba9) {
          return local_ba9;
        }
        goto LAB_0121b8b8;
      }
      uVar112 = (ulong)(uVar110 - 1);
      lVar113 = uVar112 * 0x60;
      auVar145 = *(undefined1 (*) [32])(auStack_160 + lVar113);
      auVar149._0_4_ = (float)local_920._0_4_ + auVar145._0_4_;
      auVar149._4_4_ = (float)local_920._4_4_ + auVar145._4_4_;
      auVar149._8_4_ = fStack_918 + auVar145._8_4_;
      auVar149._12_4_ = fStack_914 + auVar145._12_4_;
      auVar149._16_4_ = fStack_910 + auVar145._16_4_;
      auVar149._20_4_ = fStack_90c + auVar145._20_4_;
      auVar149._24_4_ = fStack_908 + auVar145._24_4_;
      auVar149._28_4_ = fStack_904 + auVar145._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar240._4_4_ = uVar8;
      auVar240._0_4_ = uVar8;
      auVar240._8_4_ = uVar8;
      auVar240._12_4_ = uVar8;
      auVar240._16_4_ = uVar8;
      auVar240._20_4_ = uVar8;
      auVar240._24_4_ = uVar8;
      auVar240._28_4_ = uVar8;
      auVar33 = vcmpps_avx(auVar149,auVar240,2);
      _local_6e0 = vandps_avx(auVar33,*(undefined1 (*) [32])(auStack_180 + lVar113));
      auVar33 = *(undefined1 (*) [32])(auStack_180 + lVar113) & auVar33;
      bVar98 = (auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar99 = (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar97 = (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar96 = SUB321(auVar33 >> 0x7f,0) == '\0';
      bVar95 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar94 = SUB321(auVar33 >> 0xbf,0) == '\0';
      bVar93 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar121 = -1 < auVar33[0x1f];
      if (((((((!bVar98 || !bVar99) || !bVar97) || !bVar96) || !bVar95) || !bVar94) || !bVar93) ||
          !bVar121) {
        auVar220._8_4_ = 0x7f800000;
        auVar220._0_8_ = 0x7f8000007f800000;
        auVar220._12_4_ = 0x7f800000;
        auVar220._16_4_ = 0x7f800000;
        auVar220._20_4_ = 0x7f800000;
        auVar220._24_4_ = 0x7f800000;
        auVar220._28_4_ = 0x7f800000;
        auVar145 = vblendvps_avx(auVar220,auVar145,_local_6e0);
        auVar33 = vshufps_avx(auVar145,auVar145,0xb1);
        auVar33 = vminps_avx(auVar145,auVar33);
        auVar34 = vshufpd_avx(auVar33,auVar33,5);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar34 = vperm2f128_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar33 = vcmpps_avx(auVar145,auVar33,0);
        auVar34 = _local_6e0 & auVar33;
        auVar145 = _local_6e0;
        if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar34 >> 0x7f,0) != '\0') ||
              (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0xbf,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar34[0x1f] < '\0') {
          auVar145 = vandps_avx(auVar33,_local_6e0);
        }
        fVar159 = afStack_140[uVar112 * 0x18 + 1];
        uVar118 = (ulong)auStack_138[uVar112 * 0x18];
        uVar114 = vmovmskps_avx(auVar145);
        uVar111 = 0;
        if (uVar114 != 0) {
          for (; (uVar114 >> uVar111 & 1) == 0; uVar111 = uVar111 + 1) {
          }
        }
        fVar241 = afStack_140[uVar112 * 0x18];
        *(undefined4 *)(local_6e0 + (ulong)uVar111 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar113) = _local_6e0;
        uVar114 = uVar110 - 1;
        if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
              (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
            (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6e0[0x1f] < '\0') {
          uVar114 = uVar110;
        }
        auVar163 = vshufps_avx(ZEXT416((uint)(fVar159 - fVar241)),ZEXT416((uint)(fVar159 - fVar241))
                               ,0);
        local_360._4_4_ = fVar241 + auVar163._4_4_ * 0.14285715;
        local_360._0_4_ = fVar241 + auVar163._0_4_ * 0.0;
        fStack_358 = fVar241 + auVar163._8_4_ * 0.2857143;
        fStack_354 = fVar241 + auVar163._12_4_ * 0.42857146;
        fStack_350 = fVar241 + auVar163._0_4_ * 0.5714286;
        fStack_34c = fVar241 + auVar163._4_4_ * 0.71428573;
        fStack_348 = fVar241 + auVar163._8_4_ * 0.8571429;
        fStack_344 = fVar241 + auVar163._12_4_;
        local_800._8_8_ = 0;
        local_800._0_8_ = *(ulong *)(local_360 + (ulong)uVar111 * 4);
        uVar112 = (ulong)uVar114;
      }
    } while (((((((bVar98 && bVar99) && bVar97) && bVar96) && bVar95) && bVar94) && bVar93) &&
             bVar121);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }